

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [28];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Primitive PVar26;
  Geometry *pGVar27;
  __int_type_conflict _Var28;
  long lVar29;
  long lVar30;
  RTCRayQueryContext *pRVar31;
  RTCFilterFunctionN p_Var32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [12];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  uint uVar120;
  uint uVar121;
  ulong uVar122;
  undefined1 (*pauVar123) [32];
  uint uVar124;
  ulong uVar125;
  uint uVar126;
  long lVar127;
  long lVar128;
  long lVar129;
  uint uVar130;
  float fVar160;
  float fVar161;
  __m128 a;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar163;
  float fVar165;
  float fVar166;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar162;
  float fVar164;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar133 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar167;
  float fVar194;
  float fVar195;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar198;
  undefined1 auVar182 [32];
  float fVar168;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar196;
  float fVar197;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar205 [16];
  float fVar199;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar224;
  float fVar225;
  undefined1 auVar209 [32];
  float fVar227;
  undefined1 auVar210 [32];
  undefined1 auVar200 [16];
  undefined1 auVar211 [32];
  undefined1 auVar201 [16];
  float fVar226;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar204 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar228;
  float fVar251;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar389 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [28];
  float fVar250;
  float fVar252;
  float fVar253;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar254;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar255;
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar273;
  float fVar274;
  float fVar275;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  float fVar276;
  float fVar291;
  float fVar292;
  undefined1 auVar277 [16];
  float fVar293;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar294;
  float fVar295;
  float fVar297;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  float fVar296;
  float fVar298;
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [64];
  float fVar299;
  float fVar300;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar314;
  float fVar316;
  float fVar320;
  float fVar322;
  float fVar326;
  undefined1 auVar304 [32];
  float fVar318;
  float fVar323;
  float fVar324;
  float fVar327;
  float fVar328;
  float fVar330;
  undefined1 auVar305 [32];
  float fVar315;
  float fVar317;
  float fVar319;
  float fVar321;
  float fVar325;
  float fVar329;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [64];
  float fVar331;
  float fVar343;
  float fVar344;
  float fVar346;
  float fVar348;
  float fVar350;
  float fVar352;
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  float fVar345;
  float fVar347;
  float fVar349;
  float fVar351;
  float fVar353;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [64];
  float fVar354;
  float fVar355;
  float fVar356;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  float fVar368;
  float fVar371;
  float fVar377;
  float fVar380;
  float fVar383;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar369;
  float fVar370;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar378;
  float fVar379;
  float fVar381;
  float fVar382;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  float fVar397;
  float fVar398;
  float fVar399;
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  float fVar400;
  float fVar401;
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [64];
  float fVar402;
  float fVar411;
  float fVar412;
  float fVar413;
  float fVar414;
  float fVar415;
  float fVar416;
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  float fVar417;
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [64];
  undefined1 auVar418 [16];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  float fVar427;
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar429 [16];
  float fVar428;
  float fVar436;
  float fVar437;
  float fVar439;
  float fVar440;
  float fVar441;
  float in_register_0000151c;
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  float fVar438;
  undefined1 auVar434 [32];
  float fVar442;
  float fVar443;
  undefined1 auVar444 [16];
  float fVar449;
  float fVar451;
  float fVar455;
  float fVar457;
  float fVar459;
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  float fVar450;
  float fVar452;
  float fVar453;
  float fVar454;
  float fVar456;
  float fVar458;
  float fVar460;
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  float in_register_0000159c;
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  float in_register_000015dc;
  undefined1 auVar465 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_ce0;
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b70 [8];
  float fStack_b68;
  float fStack_b64;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  undefined1 local_b50 [8];
  float fStack_b48;
  float fStack_b44;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 (*local_aa0) [16];
  undefined1 (*local_a98) [16];
  uint *local_a90;
  ulong local_a88;
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [16];
  Primitive *local_990;
  ulong local_988;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_710 [16];
  RTCHitN local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [32];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  uint local_620;
  uint uStack_61c;
  uint uStack_618;
  uint uStack_614;
  uint uStack_610;
  uint uStack_60c;
  uint uStack_608;
  uint uStack_604;
  uint local_600;
  uint uStack_5fc;
  uint uStack_5f8;
  uint uStack_5f4;
  uint uStack_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar426 [64];
  undefined1 auVar435 [64];
  
  PVar26 = prim[1];
  uVar122 = (ulong)(byte)PVar26;
  lVar127 = uVar122 * 0x25;
  auVar172 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar172 = vinsertps_avx(auVar172,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar172 = vsubps_avx(auVar172,*(undefined1 (*) [16])(prim + lVar127 + 6));
  fVar228 = *(float *)(prim + lVar127 + 0x12);
  auVar169._0_4_ = fVar228 * auVar172._0_4_;
  auVar169._4_4_ = fVar228 * auVar172._4_4_;
  auVar169._8_4_ = fVar228 * auVar172._8_4_;
  auVar169._12_4_ = fVar228 * auVar172._12_4_;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 4 + 6)));
  auVar277._0_4_ = fVar228 * auVar38._0_4_;
  auVar277._4_4_ = fVar228 * auVar38._4_4_;
  auVar277._8_4_ = fVar228 * auVar38._8_4_;
  auVar277._12_4_ = fVar228 * auVar38._12_4_;
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 4 + 10)));
  auVar141._16_16_ = auVar38;
  auVar141._0_16_ = auVar172;
  auVar141 = vcvtdq2ps_avx(auVar141);
  lVar29 = uVar122 * 5;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar29 + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar29 + 10)));
  auVar209._16_16_ = auVar38;
  auVar209._0_16_ = auVar172;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 6 + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 6 + 10)));
  auVar193 = vcvtdq2ps_avx(auVar209);
  auVar243._16_16_ = auVar38;
  auVar243._0_16_ = auVar172;
  auVar33 = vcvtdq2ps_avx(auVar243);
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0xf + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0xf + 10)));
  auVar244._16_16_ = auVar38;
  auVar244._0_16_ = auVar172;
  auVar34 = vcvtdq2ps_avx(auVar244);
  lVar128 = (ulong)(byte)PVar26 * 0x10;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar128 + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar128 + 10)));
  auVar304._16_16_ = auVar38;
  auVar304._0_16_ = auVar172;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar128 + uVar122 + 6)));
  auVar35 = vcvtdq2ps_avx(auVar304);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar128 + uVar122 + 10)));
  auVar332._16_16_ = auVar38;
  auVar332._0_16_ = auVar172;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1a + 6)));
  auVar395 = vcvtdq2ps_avx(auVar332);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1a + 10)));
  auVar333._16_16_ = auVar38;
  auVar333._0_16_ = auVar172;
  auVar213 = vcvtdq2ps_avx(auVar333);
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1b + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1b + 10)));
  auVar390._16_16_ = auVar38;
  auVar390._0_16_ = auVar172;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1c + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1c + 10)));
  auVar36 = vcvtdq2ps_avx(auVar390);
  auVar403._16_16_ = auVar38;
  auVar403._0_16_ = auVar172;
  auVar37 = vcvtdq2ps_avx(auVar403);
  auVar172 = vshufps_avx(auVar277,auVar277,0);
  auVar38 = vshufps_avx(auVar277,auVar277,0x55);
  auVar239 = vshufps_avx(auVar277,auVar277,0xaa);
  fVar228 = auVar239._0_4_;
  fVar168 = auVar239._4_4_;
  fVar250 = auVar239._8_4_;
  fVar196 = auVar239._12_4_;
  fVar227 = auVar38._0_4_;
  fVar198 = auVar38._4_4_;
  fVar251 = auVar38._8_4_;
  fVar163 = auVar38._12_4_;
  fVar252 = auVar172._0_4_;
  fVar253 = auVar172._4_4_;
  fVar254 = auVar172._8_4_;
  fVar255 = auVar172._12_4_;
  auVar430._0_4_ = fVar252 * auVar141._0_4_ + fVar227 * auVar193._0_4_ + fVar228 * auVar33._0_4_;
  auVar430._4_4_ = fVar253 * auVar141._4_4_ + fVar198 * auVar193._4_4_ + fVar168 * auVar33._4_4_;
  auVar430._8_4_ = fVar254 * auVar141._8_4_ + fVar251 * auVar193._8_4_ + fVar250 * auVar33._8_4_;
  auVar430._12_4_ = fVar255 * auVar141._12_4_ + fVar163 * auVar193._12_4_ + fVar196 * auVar33._12_4_
  ;
  auVar430._16_4_ = fVar252 * auVar141._16_4_ + fVar227 * auVar193._16_4_ + fVar228 * auVar33._16_4_
  ;
  auVar430._20_4_ = fVar253 * auVar141._20_4_ + fVar198 * auVar193._20_4_ + fVar168 * auVar33._20_4_
  ;
  auVar430._24_4_ = fVar254 * auVar141._24_4_ + fVar251 * auVar193._24_4_ + fVar250 * auVar33._24_4_
  ;
  auVar430._28_4_ = fVar163 + in_register_000015dc + in_register_0000151c;
  auVar419._0_4_ = fVar252 * auVar34._0_4_ + fVar227 * auVar35._0_4_ + auVar395._0_4_ * fVar228;
  auVar419._4_4_ = fVar253 * auVar34._4_4_ + fVar198 * auVar35._4_4_ + auVar395._4_4_ * fVar168;
  auVar419._8_4_ = fVar254 * auVar34._8_4_ + fVar251 * auVar35._8_4_ + auVar395._8_4_ * fVar250;
  auVar419._12_4_ = fVar255 * auVar34._12_4_ + fVar163 * auVar35._12_4_ + auVar395._12_4_ * fVar196;
  auVar419._16_4_ = fVar252 * auVar34._16_4_ + fVar227 * auVar35._16_4_ + auVar395._16_4_ * fVar228;
  auVar419._20_4_ = fVar253 * auVar34._20_4_ + fVar198 * auVar35._20_4_ + auVar395._20_4_ * fVar168;
  auVar419._24_4_ = fVar254 * auVar34._24_4_ + fVar251 * auVar35._24_4_ + auVar395._24_4_ * fVar250;
  auVar419._28_4_ = fVar163 + in_register_000015dc + in_register_0000159c;
  auVar283._0_4_ = fVar252 * auVar213._0_4_ + fVar227 * auVar36._0_4_ + auVar37._0_4_ * fVar228;
  auVar283._4_4_ = fVar253 * auVar213._4_4_ + fVar198 * auVar36._4_4_ + auVar37._4_4_ * fVar168;
  auVar283._8_4_ = fVar254 * auVar213._8_4_ + fVar251 * auVar36._8_4_ + auVar37._8_4_ * fVar250;
  auVar283._12_4_ = fVar255 * auVar213._12_4_ + fVar163 * auVar36._12_4_ + auVar37._12_4_ * fVar196;
  auVar283._16_4_ = fVar252 * auVar213._16_4_ + fVar227 * auVar36._16_4_ + auVar37._16_4_ * fVar228;
  auVar283._20_4_ = fVar253 * auVar213._20_4_ + fVar198 * auVar36._20_4_ + auVar37._20_4_ * fVar168;
  auVar283._24_4_ = fVar254 * auVar213._24_4_ + fVar251 * auVar36._24_4_ + auVar37._24_4_ * fVar250;
  auVar283._28_4_ = fVar255 + fVar163 + fVar196;
  auVar172 = vshufps_avx(auVar169,auVar169,0);
  auVar38 = vshufps_avx(auVar169,auVar169,0x55);
  auVar239 = vshufps_avx(auVar169,auVar169,0xaa);
  fVar228 = auVar239._0_4_;
  fVar168 = auVar239._4_4_;
  fVar250 = auVar239._8_4_;
  fVar196 = auVar239._12_4_;
  fVar253 = auVar38._0_4_;
  fVar254 = auVar38._4_4_;
  fVar255 = auVar38._8_4_;
  fVar270 = auVar38._12_4_;
  fVar227 = auVar193._28_4_ + auVar33._28_4_;
  fVar198 = auVar172._0_4_;
  fVar251 = auVar172._4_4_;
  fVar163 = auVar172._8_4_;
  fVar252 = auVar172._12_4_;
  auVar182._0_4_ = fVar198 * auVar141._0_4_ + fVar253 * auVar193._0_4_ + fVar228 * auVar33._0_4_;
  auVar182._4_4_ = fVar251 * auVar141._4_4_ + fVar254 * auVar193._4_4_ + fVar168 * auVar33._4_4_;
  auVar182._8_4_ = fVar163 * auVar141._8_4_ + fVar255 * auVar193._8_4_ + fVar250 * auVar33._8_4_;
  auVar182._12_4_ = fVar252 * auVar141._12_4_ + fVar270 * auVar193._12_4_ + fVar196 * auVar33._12_4_
  ;
  auVar182._16_4_ = fVar198 * auVar141._16_4_ + fVar253 * auVar193._16_4_ + fVar228 * auVar33._16_4_
  ;
  auVar182._20_4_ = fVar251 * auVar141._20_4_ + fVar254 * auVar193._20_4_ + fVar168 * auVar33._20_4_
  ;
  auVar182._24_4_ = fVar163 * auVar141._24_4_ + fVar255 * auVar193._24_4_ + fVar250 * auVar33._24_4_
  ;
  auVar182._28_4_ = auVar141._28_4_ + fVar227;
  auVar142._0_4_ = fVar198 * auVar34._0_4_ + auVar395._0_4_ * fVar228 + fVar253 * auVar35._0_4_;
  auVar142._4_4_ = fVar251 * auVar34._4_4_ + auVar395._4_4_ * fVar168 + fVar254 * auVar35._4_4_;
  auVar142._8_4_ = fVar163 * auVar34._8_4_ + auVar395._8_4_ * fVar250 + fVar255 * auVar35._8_4_;
  auVar142._12_4_ = fVar252 * auVar34._12_4_ + auVar395._12_4_ * fVar196 + fVar270 * auVar35._12_4_;
  auVar142._16_4_ = fVar198 * auVar34._16_4_ + auVar395._16_4_ * fVar228 + fVar253 * auVar35._16_4_;
  auVar142._20_4_ = fVar251 * auVar34._20_4_ + auVar395._20_4_ * fVar168 + fVar254 * auVar35._20_4_;
  auVar142._24_4_ = fVar163 * auVar34._24_4_ + auVar395._24_4_ * fVar250 + fVar255 * auVar35._24_4_;
  auVar142._28_4_ = auVar141._28_4_ + auVar395._28_4_ + auVar33._28_4_;
  auVar334._8_4_ = 0x7fffffff;
  auVar334._0_8_ = 0x7fffffff7fffffff;
  auVar334._12_4_ = 0x7fffffff;
  auVar334._16_4_ = 0x7fffffff;
  auVar334._20_4_ = 0x7fffffff;
  auVar334._24_4_ = 0x7fffffff;
  auVar334._28_4_ = 0x7fffffff;
  auVar359._8_4_ = 0x219392ef;
  auVar359._0_8_ = 0x219392ef219392ef;
  auVar359._12_4_ = 0x219392ef;
  auVar359._16_4_ = 0x219392ef;
  auVar359._20_4_ = 0x219392ef;
  auVar359._24_4_ = 0x219392ef;
  auVar359._28_4_ = 0x219392ef;
  auVar141 = vandps_avx(auVar430,auVar334);
  auVar141 = vcmpps_avx(auVar141,auVar359,1);
  auVar193 = vblendvps_avx(auVar430,auVar359,auVar141);
  auVar141 = vandps_avx(auVar419,auVar334);
  auVar141 = vcmpps_avx(auVar141,auVar359,1);
  auVar33 = vblendvps_avx(auVar419,auVar359,auVar141);
  auVar141 = vandps_avx(auVar283,auVar334);
  auVar141 = vcmpps_avx(auVar141,auVar359,1);
  auVar141 = vblendvps_avx(auVar283,auVar359,auVar141);
  auVar210._0_4_ = fVar198 * auVar213._0_4_ + fVar253 * auVar36._0_4_ + auVar37._0_4_ * fVar228;
  auVar210._4_4_ = fVar251 * auVar213._4_4_ + fVar254 * auVar36._4_4_ + auVar37._4_4_ * fVar168;
  auVar210._8_4_ = fVar163 * auVar213._8_4_ + fVar255 * auVar36._8_4_ + auVar37._8_4_ * fVar250;
  auVar210._12_4_ = fVar252 * auVar213._12_4_ + fVar270 * auVar36._12_4_ + auVar37._12_4_ * fVar196;
  auVar210._16_4_ = fVar198 * auVar213._16_4_ + fVar253 * auVar36._16_4_ + auVar37._16_4_ * fVar228;
  auVar210._20_4_ = fVar251 * auVar213._20_4_ + fVar254 * auVar36._20_4_ + auVar37._20_4_ * fVar168;
  auVar210._24_4_ = fVar163 * auVar213._24_4_ + fVar255 * auVar36._24_4_ + auVar37._24_4_ * fVar250;
  auVar210._28_4_ = fVar227 + auVar35._28_4_ + fVar196;
  auVar34 = vrcpps_avx(auVar193);
  fVar228 = auVar34._0_4_;
  fVar250 = auVar34._4_4_;
  auVar35._4_4_ = auVar193._4_4_ * fVar250;
  auVar35._0_4_ = auVar193._0_4_ * fVar228;
  fVar227 = auVar34._8_4_;
  auVar35._8_4_ = auVar193._8_4_ * fVar227;
  fVar251 = auVar34._12_4_;
  auVar35._12_4_ = auVar193._12_4_ * fVar251;
  fVar252 = auVar34._16_4_;
  auVar35._16_4_ = auVar193._16_4_ * fVar252;
  fVar253 = auVar34._20_4_;
  auVar35._20_4_ = auVar193._20_4_ * fVar253;
  fVar254 = auVar34._24_4_;
  auVar35._24_4_ = auVar193._24_4_ * fVar254;
  auVar35._28_4_ = auVar193._28_4_;
  auVar360._8_4_ = 0x3f800000;
  auVar360._0_8_ = 0x3f8000003f800000;
  auVar360._12_4_ = 0x3f800000;
  auVar360._16_4_ = 0x3f800000;
  auVar360._20_4_ = 0x3f800000;
  auVar360._24_4_ = 0x3f800000;
  auVar360._28_4_ = 0x3f800000;
  auVar395 = vsubps_avx(auVar360,auVar35);
  auVar35 = vrcpps_avx(auVar33);
  fVar228 = fVar228 + fVar228 * auVar395._0_4_;
  fVar250 = fVar250 + fVar250 * auVar395._4_4_;
  fVar227 = fVar227 + fVar227 * auVar395._8_4_;
  fVar251 = fVar251 + fVar251 * auVar395._12_4_;
  fVar252 = fVar252 + fVar252 * auVar395._16_4_;
  fVar253 = fVar253 + fVar253 * auVar395._20_4_;
  fVar254 = fVar254 + fVar254 * auVar395._24_4_;
  fVar255 = auVar35._0_4_;
  fVar270 = auVar35._4_4_;
  auVar193._4_4_ = fVar270 * auVar33._4_4_;
  auVar193._0_4_ = fVar255 * auVar33._0_4_;
  fVar271 = auVar35._8_4_;
  auVar193._8_4_ = fVar271 * auVar33._8_4_;
  fVar272 = auVar35._12_4_;
  auVar193._12_4_ = fVar272 * auVar33._12_4_;
  fVar273 = auVar35._16_4_;
  auVar193._16_4_ = fVar273 * auVar33._16_4_;
  fVar274 = auVar35._20_4_;
  auVar193._20_4_ = fVar274 * auVar33._20_4_;
  fVar275 = auVar35._24_4_;
  auVar193._24_4_ = fVar275 * auVar33._24_4_;
  auVar193._28_4_ = auVar33._28_4_;
  auVar33 = vsubps_avx(auVar360,auVar193);
  fVar255 = fVar255 + fVar255 * auVar33._0_4_;
  fVar270 = fVar270 + fVar270 * auVar33._4_4_;
  fVar271 = fVar271 + fVar271 * auVar33._8_4_;
  fVar272 = fVar272 + fVar272 * auVar33._12_4_;
  fVar273 = fVar273 + fVar273 * auVar33._16_4_;
  fVar274 = fVar274 + fVar274 * auVar33._20_4_;
  fVar275 = fVar275 + fVar275 * auVar33._24_4_;
  auVar193 = vrcpps_avx(auVar141);
  fVar276 = auVar193._0_4_;
  fVar291 = auVar193._4_4_;
  auVar213._4_4_ = fVar291 * auVar141._4_4_;
  auVar213._0_4_ = fVar276 * auVar141._0_4_;
  fVar292 = auVar193._8_4_;
  auVar213._8_4_ = fVar292 * auVar141._8_4_;
  fVar293 = auVar193._12_4_;
  auVar213._12_4_ = fVar293 * auVar141._12_4_;
  fVar294 = auVar193._16_4_;
  auVar213._16_4_ = fVar294 * auVar141._16_4_;
  fVar295 = auVar193._20_4_;
  auVar213._20_4_ = fVar295 * auVar141._20_4_;
  fVar297 = auVar193._24_4_;
  auVar213._24_4_ = fVar297 * auVar141._24_4_;
  auVar213._28_4_ = auVar141._28_4_;
  auVar141 = vsubps_avx(auVar360,auVar213);
  fVar276 = fVar276 + fVar276 * auVar141._0_4_;
  fVar291 = fVar291 + fVar291 * auVar141._4_4_;
  fVar292 = fVar292 + fVar292 * auVar141._8_4_;
  fVar293 = fVar293 + fVar293 * auVar141._12_4_;
  fVar294 = fVar294 + fVar294 * auVar141._16_4_;
  fVar295 = fVar295 + fVar295 * auVar141._20_4_;
  fVar297 = fVar297 + fVar297 * auVar141._24_4_;
  auVar172 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar127 + 0x16)) *
                           *(float *)(prim + lVar127 + 0x1a)));
  auVar138 = vshufps_avx(auVar172,auVar172,0);
  auVar172._8_8_ = 0;
  auVar172._0_8_ = *(ulong *)(prim + uVar122 * 7 + 6);
  auVar172 = vpmovsxwd_avx(auVar172);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar122 * 7 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar38);
  auVar335._16_16_ = auVar38;
  auVar335._0_16_ = auVar172;
  auVar141 = vcvtdq2ps_avx(auVar335);
  auVar239._8_8_ = 0;
  auVar239._0_8_ = *(ulong *)(prim + uVar122 * 0xb + 6);
  auVar172 = vpmovsxwd_avx(auVar239);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar122 * 0xb + 0xe);
  auVar38 = vpmovsxwd_avx(auVar205);
  auVar361._16_16_ = auVar38;
  auVar361._0_16_ = auVar172;
  auVar193 = vcvtdq2ps_avx(auVar361);
  auVar193 = vsubps_avx(auVar193,auVar141);
  fVar168 = auVar138._0_4_;
  fVar196 = auVar138._4_4_;
  fVar198 = auVar138._8_4_;
  fVar163 = auVar138._12_4_;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar122 * 9 + 6);
  auVar172 = vpmovsxwd_avx(auVar138);
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *(ulong *)(prim + uVar122 * 9 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar177);
  auVar336._0_4_ = auVar193._0_4_ * fVar168 + auVar141._0_4_;
  auVar336._4_4_ = auVar193._4_4_ * fVar196 + auVar141._4_4_;
  auVar336._8_4_ = auVar193._8_4_ * fVar198 + auVar141._8_4_;
  auVar336._12_4_ = auVar193._12_4_ * fVar163 + auVar141._12_4_;
  auVar336._16_4_ = auVar193._16_4_ * fVar168 + auVar141._16_4_;
  auVar336._20_4_ = auVar193._20_4_ * fVar196 + auVar141._20_4_;
  auVar336._24_4_ = auVar193._24_4_ * fVar198 + auVar141._24_4_;
  auVar336._28_4_ = auVar193._28_4_ + auVar141._28_4_;
  auVar362._16_16_ = auVar38;
  auVar362._0_16_ = auVar172;
  auVar141 = vcvtdq2ps_avx(auVar362);
  auVar389._8_8_ = 0;
  auVar389._0_8_ = *(ulong *)(prim + uVar122 * 0xd + 6);
  auVar172 = vpmovsxwd_avx(auVar389);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *(ulong *)(prim + uVar122 * 0xd + 0xe);
  auVar38 = vpmovsxwd_avx(auVar137);
  auVar391._16_16_ = auVar38;
  auVar391._0_16_ = auVar172;
  auVar193 = vcvtdq2ps_avx(auVar391);
  auVar193 = vsubps_avx(auVar193,auVar141);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar122 * 0x12 + 6);
  auVar172 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar122 * 0x12 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar12);
  auVar363._0_4_ = auVar141._0_4_ + auVar193._0_4_ * fVar168;
  auVar363._4_4_ = auVar141._4_4_ + auVar193._4_4_ * fVar196;
  auVar363._8_4_ = auVar141._8_4_ + auVar193._8_4_ * fVar198;
  auVar363._12_4_ = auVar141._12_4_ + auVar193._12_4_ * fVar163;
  auVar363._16_4_ = auVar141._16_4_ + auVar193._16_4_ * fVar168;
  auVar363._20_4_ = auVar141._20_4_ + auVar193._20_4_ * fVar196;
  auVar363._24_4_ = auVar141._24_4_ + auVar193._24_4_ * fVar198;
  auVar363._28_4_ = auVar141._28_4_ + auVar193._28_4_;
  auVar392._16_16_ = auVar38;
  auVar392._0_16_ = auVar172;
  auVar141 = vcvtdq2ps_avx(auVar392);
  uVar125 = (ulong)(uint)((int)lVar29 << 2);
  lVar127 = uVar122 * 2 + uVar125;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + lVar127 + 6);
  auVar172 = vpmovsxwd_avx(auVar140);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar127 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar13);
  auVar404._16_16_ = auVar38;
  auVar404._0_16_ = auVar172;
  auVar193 = vcvtdq2ps_avx(auVar404);
  auVar193 = vsubps_avx(auVar193,auVar141);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar125 + 6);
  auVar172 = vpmovsxwd_avx(auVar14);
  auVar393._0_4_ = auVar141._0_4_ + auVar193._0_4_ * fVar168;
  auVar393._4_4_ = auVar141._4_4_ + auVar193._4_4_ * fVar196;
  auVar393._8_4_ = auVar141._8_4_ + auVar193._8_4_ * fVar198;
  auVar393._12_4_ = auVar141._12_4_ + auVar193._12_4_ * fVar163;
  auVar393._16_4_ = auVar141._16_4_ + auVar193._16_4_ * fVar168;
  auVar393._20_4_ = auVar141._20_4_ + auVar193._20_4_ * fVar196;
  auVar393._24_4_ = auVar141._24_4_ + auVar193._24_4_ * fVar198;
  auVar393._28_4_ = auVar141._28_4_ + auVar193._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar125 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar15);
  auVar405._16_16_ = auVar38;
  auVar405._0_16_ = auVar172;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar122 * 0x18 + 6);
  auVar172 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar122 * 0x18 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar17);
  auVar141 = vcvtdq2ps_avx(auVar405);
  auVar420._16_16_ = auVar38;
  auVar420._0_16_ = auVar172;
  auVar193 = vcvtdq2ps_avx(auVar420);
  auVar193 = vsubps_avx(auVar193,auVar141);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar122 * 0x1d + 6);
  auVar172 = vpmovsxwd_avx(auVar18);
  auVar406._0_4_ = auVar141._0_4_ + auVar193._0_4_ * fVar168;
  auVar406._4_4_ = auVar141._4_4_ + auVar193._4_4_ * fVar196;
  auVar406._8_4_ = auVar141._8_4_ + auVar193._8_4_ * fVar198;
  auVar406._12_4_ = auVar141._12_4_ + auVar193._12_4_ * fVar163;
  auVar406._16_4_ = auVar141._16_4_ + auVar193._16_4_ * fVar168;
  auVar406._20_4_ = auVar141._20_4_ + auVar193._20_4_ * fVar196;
  auVar406._24_4_ = auVar141._24_4_ + auVar193._24_4_ * fVar198;
  auVar406._28_4_ = auVar141._28_4_ + auVar193._28_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar122 * 0x1d + 0xe);
  auVar38 = vpmovsxwd_avx(auVar19);
  lVar127 = uVar122 + (ulong)(byte)PVar26 * 0x20;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar127 + 6);
  auVar239 = vpmovsxwd_avx(auVar20);
  auVar421._16_16_ = auVar38;
  auVar421._0_16_ = auVar172;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + lVar127 + 0xe);
  auVar172 = vpmovsxwd_avx(auVar21);
  auVar431._16_16_ = auVar172;
  auVar431._0_16_ = auVar239;
  auVar141 = vcvtdq2ps_avx(auVar421);
  auVar193 = vcvtdq2ps_avx(auVar431);
  auVar193 = vsubps_avx(auVar193,auVar141);
  auVar422._0_4_ = auVar141._0_4_ + auVar193._0_4_ * fVar168;
  auVar422._4_4_ = auVar141._4_4_ + auVar193._4_4_ * fVar196;
  auVar422._8_4_ = auVar141._8_4_ + auVar193._8_4_ * fVar198;
  auVar422._12_4_ = auVar141._12_4_ + auVar193._12_4_ * fVar163;
  auVar422._16_4_ = auVar141._16_4_ + auVar193._16_4_ * fVar168;
  auVar422._20_4_ = auVar141._20_4_ + auVar193._20_4_ * fVar196;
  auVar422._24_4_ = auVar141._24_4_ + auVar193._24_4_ * fVar198;
  auVar422._28_4_ = auVar141._28_4_ + auVar193._28_4_;
  lVar127 = (ulong)(byte)PVar26 * 0x20 - uVar122;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + lVar127 + 6);
  auVar172 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + lVar127 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar23);
  auVar432._16_16_ = auVar38;
  auVar432._0_16_ = auVar172;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar122 * 0x23 + 6);
  auVar172 = vpmovsxwd_avx(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar122 * 0x23 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar25);
  auVar445._16_16_ = auVar38;
  auVar445._0_16_ = auVar172;
  auVar141 = vcvtdq2ps_avx(auVar432);
  auVar193 = vcvtdq2ps_avx(auVar445);
  auVar193 = vsubps_avx(auVar193,auVar141);
  auVar433._0_4_ = auVar141._0_4_ + auVar193._0_4_ * fVar168;
  auVar433._4_4_ = auVar141._4_4_ + auVar193._4_4_ * fVar196;
  auVar433._8_4_ = auVar141._8_4_ + auVar193._8_4_ * fVar198;
  auVar433._12_4_ = auVar141._12_4_ + auVar193._12_4_ * fVar163;
  auVar433._16_4_ = auVar141._16_4_ + auVar193._16_4_ * fVar168;
  auVar433._20_4_ = auVar141._20_4_ + auVar193._20_4_ * fVar196;
  auVar433._24_4_ = auVar141._24_4_ + auVar193._24_4_ * fVar198;
  auVar433._28_4_ = auVar141._28_4_ + fVar163;
  auVar141 = vsubps_avx(auVar336,auVar182);
  auVar301._0_4_ = fVar228 * auVar141._0_4_;
  auVar301._4_4_ = fVar250 * auVar141._4_4_;
  auVar301._8_4_ = fVar227 * auVar141._8_4_;
  auVar301._12_4_ = fVar251 * auVar141._12_4_;
  auVar36._16_4_ = fVar252 * auVar141._16_4_;
  auVar36._0_16_ = auVar301;
  auVar36._20_4_ = fVar253 * auVar141._20_4_;
  auVar36._24_4_ = fVar254 * auVar141._24_4_;
  auVar36._28_4_ = auVar141._28_4_;
  auVar141 = vsubps_avx(auVar363,auVar182);
  auVar229._0_4_ = fVar228 * auVar141._0_4_;
  auVar229._4_4_ = fVar250 * auVar141._4_4_;
  auVar229._8_4_ = fVar227 * auVar141._8_4_;
  auVar229._12_4_ = fVar251 * auVar141._12_4_;
  auVar37._16_4_ = fVar252 * auVar141._16_4_;
  auVar37._0_16_ = auVar229;
  auVar37._20_4_ = fVar253 * auVar141._20_4_;
  auVar37._24_4_ = fVar254 * auVar141._24_4_;
  auVar37._28_4_ = auVar34._28_4_ + auVar395._28_4_;
  auVar141 = vsubps_avx(auVar393,auVar142);
  auVar170._0_4_ = fVar255 * auVar141._0_4_;
  auVar170._4_4_ = fVar270 * auVar141._4_4_;
  auVar170._8_4_ = fVar271 * auVar141._8_4_;
  auVar170._12_4_ = fVar272 * auVar141._12_4_;
  auVar34._16_4_ = fVar273 * auVar141._16_4_;
  auVar34._0_16_ = auVar170;
  auVar34._20_4_ = fVar274 * auVar141._20_4_;
  auVar34._24_4_ = fVar275 * auVar141._24_4_;
  auVar34._28_4_ = auVar141._28_4_;
  auVar141 = vsubps_avx(auVar406,auVar142);
  auVar256._0_4_ = fVar255 * auVar141._0_4_;
  auVar256._4_4_ = fVar270 * auVar141._4_4_;
  auVar256._8_4_ = fVar271 * auVar141._8_4_;
  auVar256._12_4_ = fVar272 * auVar141._12_4_;
  auVar395._16_4_ = fVar273 * auVar141._16_4_;
  auVar395._0_16_ = auVar256;
  auVar395._20_4_ = fVar274 * auVar141._20_4_;
  auVar395._24_4_ = fVar275 * auVar141._24_4_;
  auVar395._28_4_ = auVar35._28_4_ + auVar33._28_4_;
  auVar141 = vsubps_avx(auVar422,auVar210);
  auVar131._0_4_ = fVar276 * auVar141._0_4_;
  auVar131._4_4_ = fVar291 * auVar141._4_4_;
  auVar131._8_4_ = fVar292 * auVar141._8_4_;
  auVar131._12_4_ = fVar293 * auVar141._12_4_;
  auVar33._16_4_ = fVar294 * auVar141._16_4_;
  auVar33._0_16_ = auVar131;
  auVar33._20_4_ = fVar295 * auVar141._20_4_;
  auVar33._24_4_ = fVar297 * auVar141._24_4_;
  auVar33._28_4_ = auVar141._28_4_;
  auVar141 = vsubps_avx(auVar433,auVar210);
  auVar200._0_4_ = fVar276 * auVar141._0_4_;
  auVar200._4_4_ = fVar291 * auVar141._4_4_;
  auVar200._8_4_ = fVar292 * auVar141._8_4_;
  auVar200._12_4_ = fVar293 * auVar141._12_4_;
  auVar55._16_4_ = fVar294 * auVar141._16_4_;
  auVar55._0_16_ = auVar200;
  auVar55._20_4_ = fVar295 * auVar141._20_4_;
  auVar55._24_4_ = fVar297 * auVar141._24_4_;
  auVar55._28_4_ = auVar141._28_4_;
  auVar172 = vpminsd_avx(auVar36._16_16_,auVar37._16_16_);
  auVar38 = vpminsd_avx(auVar301,auVar229);
  auVar364._16_16_ = auVar172;
  auVar364._0_16_ = auVar38;
  auVar172 = vpminsd_avx(auVar34._16_16_,auVar395._16_16_);
  auVar38 = vpminsd_avx(auVar170,auVar256);
  auVar423._16_16_ = auVar172;
  auVar423._0_16_ = auVar38;
  auVar141 = vmaxps_avx(auVar364,auVar423);
  auVar172 = vpminsd_avx(auVar33._16_16_,auVar55._16_16_);
  auVar38 = vpminsd_avx(auVar131,auVar200);
  auVar446._16_16_ = auVar172;
  auVar446._0_16_ = auVar38;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar461._4_4_ = uVar8;
  auVar461._0_4_ = uVar8;
  auVar461._8_4_ = uVar8;
  auVar461._12_4_ = uVar8;
  auVar461._16_4_ = uVar8;
  auVar461._20_4_ = uVar8;
  auVar461._24_4_ = uVar8;
  auVar461._28_4_ = uVar8;
  auVar193 = vmaxps_avx(auVar446,auVar461);
  auVar141 = vmaxps_avx(auVar141,auVar193);
  local_300._4_4_ = auVar141._4_4_ * 0.99999964;
  local_300._0_4_ = auVar141._0_4_ * 0.99999964;
  local_300._8_4_ = auVar141._8_4_ * 0.99999964;
  local_300._12_4_ = auVar141._12_4_ * 0.99999964;
  local_300._16_4_ = auVar141._16_4_ * 0.99999964;
  local_300._20_4_ = auVar141._20_4_ * 0.99999964;
  local_300._24_4_ = auVar141._24_4_ * 0.99999964;
  local_300._28_4_ = auVar141._28_4_;
  auVar172 = vpmaxsd_avx(auVar36._16_16_,auVar37._16_16_);
  auVar38 = vpmaxsd_avx(auVar301,auVar229);
  auVar245._16_16_ = auVar172;
  auVar245._0_16_ = auVar38;
  auVar172 = vpmaxsd_avx(auVar34._16_16_,auVar395._16_16_);
  auVar38 = vpmaxsd_avx(auVar170,auVar256);
  auVar183._16_16_ = auVar172;
  auVar183._0_16_ = auVar38;
  auVar141 = vminps_avx(auVar245,auVar183);
  auVar172 = vpmaxsd_avx(auVar33._16_16_,auVar55._16_16_);
  auVar38 = vpmaxsd_avx(auVar131,auVar200);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar211._4_4_ = uVar8;
  auVar211._0_4_ = uVar8;
  auVar211._8_4_ = uVar8;
  auVar211._12_4_ = uVar8;
  auVar211._16_4_ = uVar8;
  auVar211._20_4_ = uVar8;
  auVar211._24_4_ = uVar8;
  auVar211._28_4_ = uVar8;
  auVar143._16_16_ = auVar172;
  auVar143._0_16_ = auVar38;
  auVar193 = vminps_avx(auVar143,auVar211);
  auVar141 = vminps_avx(auVar141,auVar193);
  auVar434._4_4_ = auVar141._4_4_ * 1.0000004;
  auVar434._0_4_ = auVar141._0_4_ * 1.0000004;
  auVar434._8_4_ = auVar141._8_4_ * 1.0000004;
  auVar434._12_4_ = auVar141._12_4_ * 1.0000004;
  auVar434._16_4_ = auVar141._16_4_ * 1.0000004;
  auVar434._20_4_ = auVar141._20_4_ * 1.0000004;
  auVar434._24_4_ = auVar141._24_4_ * 1.0000004;
  auVar434._28_4_ = auVar141._28_4_;
  auVar141 = vcmpps_avx(local_300,auVar434,2);
  auVar172 = vpshufd_avx(ZEXT116((byte)PVar26),0);
  auVar184._16_16_ = auVar172;
  auVar184._0_16_ = auVar172;
  auVar193 = vcvtdq2ps_avx(auVar184);
  auVar193 = vcmpps_avx(_DAT_01faff40,auVar193,1);
  auVar141 = vandps_avx(auVar141,auVar193);
  uVar120 = vmovmskps_avx(auVar141);
  if (uVar120 == 0) {
    return;
  }
  uVar120 = uVar120 & 0xff;
  auVar144._16_16_ = mm_lookupmask_ps._240_16_;
  auVar144._0_16_ = mm_lookupmask_ps._240_16_;
  local_520 = vblendps_avx(auVar144,ZEXT832(0) << 0x20,0x80);
  local_a90 = &local_620;
  uVar126 = 1 << ((byte)k & 0x1f);
  local_a98 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar126 & 0xf) << 4));
  local_aa0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar126 >> 4) * 0x10);
  local_990 = prim;
LAB_01146996:
  local_988 = (ulong)uVar120;
  lVar127 = 0;
  if (local_988 != 0) {
    for (; (uVar120 >> lVar127 & 1) == 0; lVar127 = lVar127 + 1) {
    }
  }
  uVar120 = *(uint *)(local_990 + 2);
  local_a88 = (ulong)*(uint *)(local_990 + lVar127 * 4 + 6);
  pGVar27 = (context->scene->geometries).items[uVar120].ptr;
  uVar122 = (ulong)*(uint *)(*(long *)&pGVar27->field_0x58 +
                            local_a88 *
                            pGVar27[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar228 = (pGVar27->time_range).lower;
  fVar228 = pGVar27->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar228) / ((pGVar27->time_range).upper - fVar228));
  auVar172 = vroundss_avx(ZEXT416((uint)fVar228),ZEXT416((uint)fVar228),9);
  auVar172 = vminss_avx(auVar172,ZEXT416((uint)(pGVar27->fnumTimeSegments + -1.0)));
  auVar172 = vmaxss_avx(ZEXT816(0) << 0x20,auVar172);
  fVar228 = fVar228 - auVar172._0_4_;
  _Var28 = pGVar27[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar129 = (long)(int)auVar172._0_4_ * 0x38;
  lVar29 = *(long *)(_Var28 + 0x10 + lVar129);
  lVar128 = *(long *)(_Var28 + 0x38 + lVar129);
  lVar30 = *(long *)(_Var28 + 0x48 + lVar129);
  auVar172 = vshufps_avx(ZEXT416((uint)fVar228),ZEXT416((uint)fVar228),0);
  pfVar1 = (float *)(lVar128 + uVar122 * lVar30);
  fVar198 = auVar172._0_4_;
  fVar251 = auVar172._4_4_;
  fVar163 = auVar172._8_4_;
  fVar252 = auVar172._12_4_;
  pfVar2 = (float *)(lVar128 + (uVar122 + 1) * lVar30);
  pfVar3 = (float *)(lVar128 + (uVar122 + 2) * lVar30);
  pfVar4 = (float *)(lVar128 + lVar30 * (uVar122 + 3));
  lVar128 = *(long *)(_Var28 + lVar129);
  auVar172 = vshufps_avx(ZEXT416((uint)(1.0 - fVar228)),ZEXT416((uint)(1.0 - fVar228)),0);
  pfVar5 = (float *)(lVar128 + lVar29 * uVar122);
  fVar168 = auVar172._0_4_;
  fVar250 = auVar172._4_4_;
  fVar196 = auVar172._8_4_;
  fVar227 = auVar172._12_4_;
  pfVar6 = (float *)(lVar128 + lVar29 * (uVar122 + 1));
  pfVar7 = (float *)(lVar128 + lVar29 * (uVar122 + 2));
  auVar201._0_4_ = fVar198 * *pfVar1 + fVar168 * *pfVar5;
  auVar201._4_4_ = fVar251 * pfVar1[1] + fVar250 * pfVar5[1];
  auVar201._8_4_ = fVar163 * pfVar1[2] + fVar196 * pfVar5[2];
  auVar201._12_4_ = fVar252 * pfVar1[3] + fVar227 * pfVar5[3];
  auVar171._0_4_ = fVar168 * *pfVar6 + fVar198 * *pfVar2;
  auVar171._4_4_ = fVar250 * pfVar6[1] + fVar251 * pfVar2[1];
  auVar171._8_4_ = fVar196 * pfVar6[2] + fVar163 * pfVar2[2];
  auVar171._12_4_ = fVar227 * pfVar6[3] + fVar252 * pfVar2[3];
  pfVar1 = (float *)(lVar128 + lVar29 * (uVar122 + 3));
  auVar230._0_4_ = fVar168 * *pfVar7 + fVar198 * *pfVar3;
  auVar230._4_4_ = fVar250 * pfVar7[1] + fVar251 * pfVar3[1];
  auVar230._8_4_ = fVar196 * pfVar7[2] + fVar163 * pfVar3[2];
  auVar230._12_4_ = fVar227 * pfVar7[3] + fVar252 * pfVar3[3];
  auVar172 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar38 = vinsertps_avx(auVar172,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar228 = *(float *)(ray + k * 4 + 0x80);
  auVar418._4_4_ = fVar228;
  auVar418._0_4_ = fVar228;
  auVar418._8_4_ = fVar228;
  auVar418._12_4_ = fVar228;
  fStack_8b0 = fVar228;
  _local_8c0 = auVar418;
  fStack_8ac = fVar228;
  fStack_8a8 = fVar228;
  fStack_8a4 = fVar228;
  auVar426 = ZEXT3264(_local_8c0);
  auVar278._0_4_ = fVar168 * *pfVar1 + fVar198 * *pfVar4;
  auVar278._4_4_ = fVar250 * pfVar1[1] + fVar251 * pfVar4[1];
  auVar278._8_4_ = fVar196 * pfVar1[2] + fVar163 * pfVar4[2];
  auVar278._12_4_ = fVar227 * pfVar1[3] + fVar252 * pfVar4[3];
  fVar168 = *(float *)(ray + k * 4 + 0xa0);
  auVar429._4_4_ = fVar168;
  auVar429._0_4_ = fVar168;
  auVar429._8_4_ = fVar168;
  auVar429._12_4_ = fVar168;
  fStack_910 = fVar168;
  _local_920 = auVar429;
  fStack_90c = fVar168;
  fStack_908 = fVar168;
  fStack_904 = fVar168;
  auVar435 = ZEXT3264(_local_920);
  auVar172 = vunpcklps_avx(auVar418,auVar429);
  fVar250 = *(float *)(ray + k * 4 + 0xc0);
  auVar444._4_4_ = fVar250;
  auVar444._0_4_ = fVar250;
  auVar444._8_4_ = fVar250;
  auVar444._12_4_ = fVar250;
  fStack_8d0 = fVar250;
  _local_8e0 = auVar444;
  fStack_8cc = fVar250;
  fStack_8c8 = fVar250;
  fStack_8c4 = fVar250;
  _local_a50 = vinsertps_avx(auVar172,auVar444,0x28);
  auVar396 = ZEXT1664(_local_a50);
  auVar132._0_4_ = (auVar201._0_4_ + auVar171._0_4_ + auVar230._0_4_ + auVar278._0_4_) * 0.25;
  auVar132._4_4_ = (auVar201._4_4_ + auVar171._4_4_ + auVar230._4_4_ + auVar278._4_4_) * 0.25;
  auVar132._8_4_ = (auVar201._8_4_ + auVar171._8_4_ + auVar230._8_4_ + auVar278._8_4_) * 0.25;
  auVar132._12_4_ = (auVar201._12_4_ + auVar171._12_4_ + auVar230._12_4_ + auVar278._12_4_) * 0.25;
  auVar172 = vsubps_avx(auVar132,auVar38);
  auVar172 = vdpps_avx(auVar172,_local_a50,0x7f);
  local_a60 = vdpps_avx(_local_a50,_local_a50,0x7f);
  auVar410 = ZEXT1664(local_a60);
  auVar239 = vrcpss_avx(local_a60,local_a60);
  fVar196 = auVar172._0_4_ * auVar239._0_4_ * (2.0 - local_a60._0_4_ * auVar239._0_4_);
  auVar342 = ZEXT464((uint)fVar196);
  auVar239 = vshufps_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),0);
  auVar257._0_4_ = auVar38._0_4_ + local_a50._0_4_ * auVar239._0_4_;
  auVar257._4_4_ = auVar38._4_4_ + local_a50._4_4_ * auVar239._4_4_;
  auVar257._8_4_ = auVar38._8_4_ + local_a50._8_4_ * auVar239._8_4_;
  auVar257._12_4_ = auVar38._12_4_ + local_a50._12_4_ * auVar239._12_4_;
  auVar172 = vblendps_avx(auVar257,_DAT_01f7aa10,8);
  _local_b40 = vsubps_avx(auVar201,auVar172);
  auVar313 = ZEXT1664(_local_b40);
  _local_b50 = vsubps_avx(auVar230,auVar172);
  _local_b60 = vsubps_avx(auVar171,auVar172);
  _local_b70 = vsubps_avx(auVar278,auVar172);
  auVar172 = vshufps_avx(_local_b40,_local_b40,0);
  register0x00001250 = auVar172;
  _local_1e0 = auVar172;
  auVar172 = vshufps_avx(_local_b40,_local_b40,0x55);
  register0x00001250 = auVar172;
  _local_200 = auVar172;
  auVar172 = vshufps_avx(_local_b40,_local_b40,0xaa);
  register0x00001250 = auVar172;
  _local_220 = auVar172;
  auVar172 = vshufps_avx(_local_b40,_local_b40,0xff);
  register0x00001290 = auVar172;
  _local_240 = auVar172;
  auVar172 = vshufps_avx(_local_b60,_local_b60,0);
  register0x00001290 = auVar172;
  _local_260 = auVar172;
  auVar172 = vshufps_avx(_local_b60,_local_b60,0x55);
  register0x00001290 = auVar172;
  _local_280 = auVar172;
  auVar172 = vshufps_avx(_local_b60,_local_b60,0xaa);
  register0x00001290 = auVar172;
  _local_2a0 = auVar172;
  auVar172 = vshufps_avx(_local_b60,_local_b60,0xff);
  register0x00001290 = auVar172;
  _local_400 = auVar172;
  auVar172 = vshufps_avx(_local_b50,_local_b50,0);
  register0x00001290 = auVar172;
  _local_420 = auVar172;
  auVar172 = vshufps_avx(_local_b50,_local_b50,0x55);
  register0x00001290 = auVar172;
  _local_440 = auVar172;
  auVar172 = vshufps_avx(_local_b50,_local_b50,0xaa);
  register0x00001290 = auVar172;
  _local_460 = auVar172;
  auVar172 = vshufps_avx(_local_b50,_local_b50,0xff);
  register0x00001290 = auVar172;
  _local_480 = auVar172;
  auVar172 = vshufps_avx(_local_b70,_local_b70,0);
  register0x00001290 = auVar172;
  _local_4a0 = auVar172;
  auVar172 = vshufps_avx(_local_b70,_local_b70,0x55);
  register0x00001290 = auVar172;
  _local_4c0 = auVar172;
  auVar172 = vshufps_avx(_local_b70,_local_b70,0xaa);
  register0x00001290 = auVar172;
  _local_4e0 = auVar172;
  auVar172 = vshufps_avx(_local_b70,_local_b70,0xff);
  local_500._16_16_ = auVar172;
  local_500._0_16_ = auVar172;
  auVar172 = ZEXT416((uint)(fVar228 * fVar228 + fVar168 * fVar168 + fVar250 * fVar250));
  auVar172 = vshufps_avx(auVar172,auVar172,0);
  local_2c0._16_16_ = auVar172;
  local_2c0._0_16_ = auVar172;
  auVar290 = ZEXT3264(local_2c0);
  fVar228 = *(float *)(ray + k * 4 + 0x60);
  local_9a0 = ZEXT416((uint)fVar196);
  auVar172 = vshufps_avx(ZEXT416((uint)(fVar228 - fVar196)),ZEXT416((uint)(fVar228 - fVar196)),0);
  local_2e0._16_16_ = auVar172;
  local_2e0._0_16_ = auVar172;
  auVar172 = vpshufd_avx(ZEXT416(uVar120),0);
  local_560._16_16_ = auVar172;
  local_560._0_16_ = auVar172;
  auVar172 = vpshufd_avx(ZEXT416(*(uint *)(local_990 + lVar127 * 4 + 6)),0);
  local_580._16_16_ = auVar172;
  local_580._0_16_ = auVar172;
  register0x00001210 = auVar239;
  _local_ae0 = auVar239;
  uVar130 = 0;
  uVar126 = 1;
  auVar145._8_4_ = 0x7fffffff;
  auVar145._0_8_ = 0x7fffffff7fffffff;
  auVar145._12_4_ = 0x7fffffff;
  auVar145._16_4_ = 0x7fffffff;
  auVar145._20_4_ = 0x7fffffff;
  auVar145._24_4_ = 0x7fffffff;
  auVar145._28_4_ = 0x7fffffff;
  local_540 = vandps_avx(local_2c0,auVar145);
  auVar172 = vsqrtss_avx(local_a60,local_a60);
  auVar38 = vsqrtss_avx(local_a60,local_a60);
  local_710 = ZEXT816(0x3f80000000000000);
  do {
    auVar266._8_4_ = 0x3f800000;
    auVar266._0_8_ = 0x3f8000003f800000;
    auVar266._12_4_ = 0x3f800000;
    auVar266._16_4_ = 0x3f800000;
    auVar266._20_4_ = 0x3f800000;
    auVar266._24_4_ = 0x3f800000;
    auVar266._28_4_ = 0x3f800000;
    auVar239 = vmovshdup_avx(local_710);
    auVar138 = vsubps_avx(auVar239,local_710);
    auVar239 = vshufps_avx(local_710,local_710,0);
    local_8a0._16_16_ = auVar239;
    local_8a0._0_16_ = auVar239;
    auVar205 = vshufps_avx(auVar138,auVar138,0);
    fVar167 = auVar205._0_4_;
    fVar194 = auVar205._4_4_;
    fVar195 = auVar205._8_4_;
    fVar197 = auVar205._12_4_;
    fVar199 = auVar239._0_4_;
    auVar246._0_4_ = fVar199 + fVar167 * 0.0;
    fVar224 = auVar239._4_4_;
    auVar246._4_4_ = fVar224 + fVar194 * 0.14285715;
    fVar225 = auVar239._8_4_;
    auVar246._8_4_ = fVar225 + fVar195 * 0.2857143;
    fVar226 = auVar239._12_4_;
    auVar246._12_4_ = fVar226 + fVar197 * 0.42857146;
    auVar246._16_4_ = fVar199 + fVar167 * 0.5714286;
    auVar246._20_4_ = fVar224 + fVar194 * 0.71428573;
    auVar246._24_4_ = fVar225 + fVar195 * 0.8571429;
    auVar246._28_4_ = fVar226 + fVar197;
    auVar141 = vsubps_avx(auVar266,auVar246);
    fVar168 = auVar141._0_4_;
    fVar250 = auVar141._4_4_;
    fVar196 = auVar141._8_4_;
    fVar227 = auVar141._12_4_;
    fVar198 = auVar141._16_4_;
    fVar251 = auVar141._20_4_;
    fVar163 = auVar141._24_4_;
    fVar254 = fVar168 * fVar168 * fVar168;
    fVar275 = fVar250 * fVar250 * fVar250;
    fVar291 = fVar196 * fVar196 * fVar196;
    fVar293 = fVar227 * fVar227 * fVar227;
    fVar295 = fVar198 * fVar198 * fVar198;
    fVar322 = fVar251 * fVar251 * fVar251;
    fVar326 = fVar163 * fVar163 * fVar163;
    fVar331 = auVar246._0_4_ * auVar246._0_4_ * auVar246._0_4_;
    fVar343 = auVar246._4_4_ * auVar246._4_4_ * auVar246._4_4_;
    fVar344 = auVar246._8_4_ * auVar246._8_4_ * auVar246._8_4_;
    fVar346 = auVar246._12_4_ * auVar246._12_4_ * auVar246._12_4_;
    fVar348 = auVar246._16_4_ * auVar246._16_4_ * auVar246._16_4_;
    fVar350 = auVar246._20_4_ * auVar246._20_4_ * auVar246._20_4_;
    fVar352 = auVar246._24_4_ * auVar246._24_4_ * auVar246._24_4_;
    fVar252 = auVar246._0_4_ * fVar168;
    fVar253 = auVar246._4_4_ * fVar250;
    fVar255 = auVar246._8_4_ * fVar196;
    fVar271 = auVar246._12_4_ * fVar227;
    fVar272 = auVar246._16_4_ * fVar198;
    fVar273 = auVar246._20_4_ * fVar251;
    fVar274 = auVar246._24_4_ * fVar163;
    fVar270 = auVar410._28_4_ + auVar435._28_4_;
    fVar386 = auVar342._28_4_ + auVar290._28_4_ + fVar270;
    fVar400 = fVar270 + auVar313._28_4_ + auVar426._28_4_ + auVar396._28_4_;
    fVar270 = fVar254 * 0.16666667;
    fVar276 = fVar275 * 0.16666667;
    fVar292 = fVar291 * 0.16666667;
    fVar294 = fVar293 * 0.16666667;
    fVar297 = fVar295 * 0.16666667;
    fVar323 = fVar322 * 0.16666667;
    fVar327 = fVar326 * 0.16666667;
    fVar354 = (fVar331 + fVar254 * 4.0 + fVar168 * fVar252 * 12.0 + auVar246._0_4_ * fVar252 * 6.0)
              * 0.16666667;
    fVar368 = (fVar343 + fVar275 * 4.0 + fVar250 * fVar253 * 12.0 + auVar246._4_4_ * fVar253 * 6.0)
              * 0.16666667;
    fVar371 = (fVar344 + fVar291 * 4.0 + fVar196 * fVar255 * 12.0 + auVar246._8_4_ * fVar255 * 6.0)
              * 0.16666667;
    fVar374 = (fVar346 + fVar293 * 4.0 + fVar227 * fVar271 * 12.0 + auVar246._12_4_ * fVar271 * 6.0)
              * 0.16666667;
    fVar377 = (fVar348 + fVar295 * 4.0 + fVar198 * fVar272 * 12.0 + auVar246._16_4_ * fVar272 * 6.0)
              * 0.16666667;
    fVar380 = (fVar350 + fVar322 * 4.0 + fVar251 * fVar273 * 12.0 + auVar246._20_4_ * fVar273 * 6.0)
              * 0.16666667;
    fVar383 = (fVar352 + fVar326 * 4.0 + fVar163 * fVar274 * 12.0 + auVar246._24_4_ * fVar274 * 6.0)
              * 0.16666667;
    fVar254 = (fVar331 * 4.0 + fVar254 + auVar246._0_4_ * fVar252 * 12.0 + fVar168 * fVar252 * 6.0)
              * 0.16666667;
    fVar275 = (fVar343 * 4.0 + fVar275 + auVar246._4_4_ * fVar253 * 12.0 + fVar250 * fVar253 * 6.0)
              * 0.16666667;
    fVar291 = (fVar344 * 4.0 + fVar291 + auVar246._8_4_ * fVar255 * 12.0 + fVar196 * fVar255 * 6.0)
              * 0.16666667;
    fVar293 = (fVar346 * 4.0 + fVar293 + auVar246._12_4_ * fVar271 * 12.0 + fVar227 * fVar271 * 6.0)
              * 0.16666667;
    fVar295 = (fVar348 * 4.0 + fVar295 + auVar246._16_4_ * fVar272 * 12.0 + fVar198 * fVar272 * 6.0)
              * 0.16666667;
    fVar322 = (fVar350 * 4.0 + fVar322 + auVar246._20_4_ * fVar273 * 12.0 + fVar251 * fVar273 * 6.0)
              * 0.16666667;
    fVar326 = (fVar352 * 4.0 + fVar326 + auVar246._24_4_ * fVar274 * 12.0 + fVar163 * fVar274 * 6.0)
              * 0.16666667;
    fVar331 = fVar331 * 0.16666667;
    fVar343 = fVar343 * 0.16666667;
    fVar344 = fVar344 * 0.16666667;
    fVar346 = fVar346 * 0.16666667;
    fVar348 = fVar348 * 0.16666667;
    fVar350 = fVar350 * 0.16666667;
    fVar352 = fVar352 * 0.16666667;
    fVar427 = auVar426._28_4_ + 12.0;
    fVar401 = fVar400 + 12.166667;
    fVar355 = (float)local_1e0._0_4_ * fVar270 +
              fVar354 * (float)local_260._0_4_ +
              fVar331 * (float)local_4a0._0_4_ + fVar254 * (float)local_420._0_4_;
    fVar369 = (float)local_1e0._4_4_ * fVar276 +
              fVar368 * (float)local_260._4_4_ +
              fVar343 * (float)local_4a0._4_4_ + fVar275 * (float)local_420._4_4_;
    fVar372 = fStack_1d8 * fVar292 +
              fVar371 * fStack_258 + fVar344 * fStack_498 + fVar291 * fStack_418;
    fVar375 = fStack_1d4 * fVar294 +
              fVar374 * fStack_254 + fVar346 * fStack_494 + fVar293 * fStack_414;
    fVar378 = fStack_1d0 * fVar297 +
              fVar377 * fStack_250 + fVar348 * fStack_490 + fVar295 * fStack_410;
    fVar381 = fStack_1cc * fVar323 +
              fVar380 * fStack_24c + fVar350 * fStack_48c + fVar322 * fStack_40c;
    fVar384 = fStack_1c8 * fVar327 +
              fVar383 * fStack_248 + fVar352 * fStack_488 + fVar326 * fStack_408;
    fVar387 = fVar386 + fVar401;
    fVar356 = (float)local_200._0_4_ * fVar270 +
              (float)local_280._0_4_ * fVar354 +
              fVar331 * (float)local_4c0._0_4_ + fVar254 * (float)local_440._0_4_;
    fVar370 = (float)local_200._4_4_ * fVar276 +
              (float)local_280._4_4_ * fVar368 +
              fVar343 * (float)local_4c0._4_4_ + fVar275 * (float)local_440._4_4_;
    fVar373 = fStack_1f8 * fVar292 +
              fStack_278 * fVar371 + fVar344 * fStack_4b8 + fVar291 * fStack_438;
    fVar376 = fStack_1f4 * fVar294 +
              fStack_274 * fVar374 + fVar346 * fStack_4b4 + fVar293 * fStack_434;
    fVar379 = fStack_1f0 * fVar297 +
              fStack_270 * fVar377 + fVar348 * fStack_4b0 + fVar295 * fStack_430;
    fVar382 = fStack_1ec * fVar323 +
              fStack_26c * fVar380 + fVar350 * fStack_4ac + fVar322 * fStack_42c;
    fVar385 = fStack_1e8 * fVar327 +
              fStack_268 * fVar383 + fVar352 * fStack_4a8 + fVar326 * fStack_428;
    fVar388 = fVar387 + fVar427 + 12.166667;
    local_9e0 = (float)local_220._0_4_ * fVar270 +
                (float)local_2a0._0_4_ * fVar354 +
                fVar331 * (float)local_4e0._0_4_ + fVar254 * (float)local_460._0_4_;
    fStack_9dc = (float)local_220._4_4_ * fVar276 +
                 (float)local_2a0._4_4_ * fVar368 +
                 fVar343 * (float)local_4e0._4_4_ + fVar275 * (float)local_460._4_4_;
    fStack_9d8 = fStack_218 * fVar292 +
                 fStack_298 * fVar371 + fVar344 * fStack_4d8 + fVar291 * fStack_458;
    fStack_9d4 = fStack_214 * fVar294 +
                 fStack_294 * fVar374 + fVar346 * fStack_4d4 + fVar293 * fStack_454;
    fStack_9d0 = fStack_210 * fVar297 +
                 fStack_290 * fVar377 + fVar348 * fStack_4d0 + fVar295 * fStack_450;
    fStack_9cc = fStack_20c * fVar323 +
                 fStack_28c * fVar380 + fVar350 * fStack_4cc + fVar322 * fStack_44c;
    fStack_9c8 = fStack_208 * fVar327 +
                 fStack_288 * fVar383 + fVar352 * fStack_4c8 + fVar326 * fStack_448;
    fStack_9c4 = fVar388 + fVar427 + auVar435._28_4_ + 12.0;
    local_ac0._0_4_ =
         (float)local_240._0_4_ * fVar270 +
         fVar354 * (float)local_400._0_4_ +
         fVar254 * (float)local_480._0_4_ + local_500._0_4_ * fVar331;
    local_ac0._4_4_ =
         (float)local_240._4_4_ * fVar276 +
         fVar368 * (float)local_400._4_4_ +
         fVar275 * (float)local_480._4_4_ + local_500._4_4_ * fVar343;
    fStack_ab8 = fStack_238 * fVar292 +
                 fVar371 * fStack_3f8 + fVar291 * fStack_478 + local_500._8_4_ * fVar344;
    fStack_ab4 = fStack_234 * fVar294 +
                 fVar374 * fStack_3f4 + fVar293 * fStack_474 + local_500._12_4_ * fVar346;
    fStack_ab0 = fStack_230 * fVar297 +
                 fVar377 * fStack_3f0 + fVar295 * fStack_470 + local_500._16_4_ * fVar348;
    fStack_aac = fStack_22c * fVar323 +
                 fVar380 * fStack_3ec + fVar322 * fStack_46c + local_500._20_4_ * fVar350;
    fStack_aa8 = fStack_228 * fVar327 +
                 fVar383 * fStack_3e8 + fVar326 * fStack_468 + local_500._24_4_ * fVar352;
    fStack_aa4 = auVar313._28_4_ + fVar386 + fVar400 + auVar342._28_4_;
    auVar56._4_4_ = auVar246._4_4_ * -auVar246._4_4_;
    auVar56._0_4_ = auVar246._0_4_ * -auVar246._0_4_;
    auVar56._8_4_ = auVar246._8_4_ * -auVar246._8_4_;
    auVar56._12_4_ = auVar246._12_4_ * -auVar246._12_4_;
    auVar56._16_4_ = auVar246._16_4_ * -auVar246._16_4_;
    auVar56._20_4_ = auVar246._20_4_ * -auVar246._20_4_;
    auVar56._24_4_ = auVar246._24_4_ * -auVar246._24_4_;
    auVar56._28_4_ = auVar246._28_4_;
    auVar57._4_4_ = fVar253 * 4.0;
    auVar57._0_4_ = fVar252 * 4.0;
    auVar57._8_4_ = fVar255 * 4.0;
    auVar57._12_4_ = fVar271 * 4.0;
    auVar57._16_4_ = fVar272 * 4.0;
    auVar57._20_4_ = fVar273 * 4.0;
    auVar57._24_4_ = fVar274 * 4.0;
    auVar57._28_4_ = auVar290._28_4_;
    auVar141 = vsubps_avx(auVar56,auVar57);
    fVar323 = fVar168 * -fVar168 * 0.5;
    fVar326 = fVar250 * -fVar250 * 0.5;
    fVar327 = fVar196 * -fVar196 * 0.5;
    fVar331 = fVar227 * -fVar227 * 0.5;
    fVar343 = fVar198 * -fVar198 * 0.5;
    fVar344 = fVar251 * -fVar251 * 0.5;
    fVar346 = fVar163 * -fVar163 * 0.5;
    fVar275 = auVar141._0_4_ * 0.5;
    fVar291 = auVar141._4_4_ * 0.5;
    fVar293 = auVar141._8_4_ * 0.5;
    fVar294 = auVar141._12_4_ * 0.5;
    fVar295 = auVar141._16_4_ * 0.5;
    fVar297 = auVar141._20_4_ * 0.5;
    fVar322 = auVar141._24_4_ * 0.5;
    fVar252 = (fVar168 * fVar168 + fVar252 * 4.0) * 0.5;
    fVar254 = (fVar250 * fVar250 + fVar253 * 4.0) * 0.5;
    fVar270 = (fVar196 * fVar196 + fVar255 * 4.0) * 0.5;
    fVar271 = (fVar227 * fVar227 + fVar271 * 4.0) * 0.5;
    fVar272 = (fVar198 * fVar198 + fVar272 * 4.0) * 0.5;
    fVar273 = (fVar251 * fVar251 + fVar273 * 4.0) * 0.5;
    fVar292 = (fVar163 * fVar163 + fVar274 * 4.0) * 0.5;
    fVar168 = auVar246._0_4_ * auVar246._0_4_ * 0.5;
    fVar250 = auVar246._4_4_ * auVar246._4_4_ * 0.5;
    fVar196 = auVar246._8_4_ * auVar246._8_4_ * 0.5;
    fVar227 = auVar246._12_4_ * auVar246._12_4_ * 0.5;
    fVar198 = auVar246._16_4_ * auVar246._16_4_ * 0.5;
    fVar251 = auVar246._20_4_ * auVar246._20_4_ * 0.5;
    fVar255 = auVar246._24_4_ * auVar246._24_4_ * 0.5;
    fVar330 = fStack_9c4 + fVar401 + fVar401 + 4.0;
    auVar239 = vpermilps_avx(ZEXT416((uint)(auVar138._0_4_ * 0.04761905)),0);
    fVar163 = auVar239._0_4_;
    fVar299 = fVar163 * ((float)local_1e0._0_4_ * fVar323 +
                        (float)local_260._0_4_ * fVar275 +
                        fVar252 * (float)local_420._0_4_ + fVar168 * (float)local_4a0._0_4_);
    fVar253 = auVar239._4_4_;
    fVar314 = fVar253 * ((float)local_1e0._4_4_ * fVar326 +
                        (float)local_260._4_4_ * fVar291 +
                        fVar254 * (float)local_420._4_4_ + fVar250 * (float)local_4a0._4_4_);
    auVar58._4_4_ = fVar314;
    auVar58._0_4_ = fVar299;
    fVar274 = auVar239._8_4_;
    fVar316 = fVar274 * (fStack_1d8 * fVar327 +
                        fStack_258 * fVar293 + fVar270 * fStack_418 + fVar196 * fStack_498);
    auVar58._8_4_ = fVar316;
    fVar276 = auVar239._12_4_;
    fVar318 = fVar276 * (fStack_1d4 * fVar331 +
                        fStack_254 * fVar294 + fVar271 * fStack_414 + fVar227 * fStack_494);
    auVar58._12_4_ = fVar318;
    fVar320 = fVar163 * (fStack_1d0 * fVar343 +
                        fStack_250 * fVar295 + fVar272 * fStack_410 + fVar198 * fStack_490);
    auVar58._16_4_ = fVar320;
    fVar324 = fVar253 * (fStack_1cc * fVar344 +
                        fStack_24c * fVar297 + fVar273 * fStack_40c + fVar251 * fStack_48c);
    auVar58._20_4_ = fVar324;
    fVar328 = fVar274 * (fStack_1c8 * fVar346 +
                        fStack_248 * fVar322 + fVar292 * fStack_408 + fVar255 * fStack_488);
    auVar58._24_4_ = fVar328;
    auVar58._28_4_ = fVar330;
    fVar428 = fVar163 * ((float)local_200._0_4_ * fVar323 +
                        (float)local_280._0_4_ * fVar275 +
                        fVar252 * (float)local_440._0_4_ + fVar168 * (float)local_4c0._0_4_);
    fVar436 = fVar253 * ((float)local_200._4_4_ * fVar326 +
                        (float)local_280._4_4_ * fVar291 +
                        fVar254 * (float)local_440._4_4_ + fVar250 * (float)local_4c0._4_4_);
    auVar59._4_4_ = fVar436;
    auVar59._0_4_ = fVar428;
    fVar437 = fVar274 * (fStack_1f8 * fVar327 +
                        fStack_278 * fVar293 + fVar270 * fStack_438 + fVar196 * fStack_4b8);
    auVar59._8_4_ = fVar437;
    fVar438 = fVar276 * (fStack_1f4 * fVar331 +
                        fStack_274 * fVar294 + fVar271 * fStack_434 + fVar227 * fStack_4b4);
    auVar59._12_4_ = fVar438;
    fVar439 = fVar163 * (fStack_1f0 * fVar343 +
                        fStack_270 * fVar295 + fVar272 * fStack_430 + fVar198 * fStack_4b0);
    auVar59._16_4_ = fVar439;
    fVar440 = fVar253 * (fStack_1ec * fVar344 +
                        fStack_26c * fVar297 + fVar273 * fStack_42c + fVar251 * fStack_4ac);
    auVar59._20_4_ = fVar440;
    fVar441 = fVar274 * (fStack_1e8 * fVar346 +
                        fStack_268 * fVar322 + fVar292 * fStack_428 + fVar255 * fStack_4a8);
    auVar59._24_4_ = fVar441;
    auVar59._28_4_ = uStack_1c4;
    fVar442 = fVar163 * ((float)local_220._0_4_ * fVar323 +
                        fVar168 * (float)local_4e0._0_4_ + fVar252 * (float)local_460._0_4_ +
                        (float)local_2a0._0_4_ * fVar275);
    fVar449 = fVar253 * ((float)local_220._4_4_ * fVar326 +
                        fVar250 * (float)local_4e0._4_4_ + fVar254 * (float)local_460._4_4_ +
                        (float)local_2a0._4_4_ * fVar291);
    auVar60._4_4_ = fVar449;
    auVar60._0_4_ = fVar442;
    fVar451 = fVar274 * (fStack_218 * fVar327 +
                        fVar196 * fStack_4d8 + fVar270 * fStack_458 + fStack_298 * fVar293);
    auVar60._8_4_ = fVar451;
    fVar453 = fVar276 * (fStack_214 * fVar331 +
                        fVar227 * fStack_4d4 + fVar271 * fStack_454 + fStack_294 * fVar294);
    auVar60._12_4_ = fVar453;
    fVar455 = fVar163 * (fStack_210 * fVar343 +
                        fVar198 * fStack_4d0 + fVar272 * fStack_450 + fStack_290 * fVar295);
    auVar60._16_4_ = fVar455;
    fVar457 = fVar253 * (fStack_20c * fVar344 +
                        fVar251 * fStack_4cc + fVar273 * fStack_44c + fStack_28c * fVar297);
    auVar60._20_4_ = fVar457;
    fVar459 = fVar274 * (fStack_208 * fVar346 +
                        fVar255 * fStack_4c8 + fVar292 * fStack_448 + fStack_288 * fVar322);
    auVar60._24_4_ = fVar459;
    auVar60._28_4_ = uStack_1e4;
    fVar252 = fVar163 * ((float)local_240._0_4_ * fVar323 +
                        fVar275 * (float)local_400._0_4_ +
                        fVar168 * local_500._0_4_ + fVar252 * (float)local_480._0_4_);
    fVar254 = fVar253 * ((float)local_240._4_4_ * fVar326 +
                        fVar291 * (float)local_400._4_4_ +
                        fVar250 * local_500._4_4_ + fVar254 * (float)local_480._4_4_);
    auVar61._4_4_ = fVar254;
    auVar61._0_4_ = fVar252;
    fVar275 = fVar274 * (fStack_238 * fVar327 +
                        fVar293 * fStack_3f8 + fVar196 * local_500._8_4_ + fVar270 * fStack_478);
    auVar61._8_4_ = fVar275;
    fVar291 = fVar276 * (fStack_234 * fVar331 +
                        fVar294 * fStack_3f4 + fVar227 * local_500._12_4_ + fVar271 * fStack_474);
    auVar61._12_4_ = fVar291;
    fVar163 = fVar163 * (fStack_230 * fVar343 +
                        fVar295 * fStack_3f0 + fVar198 * local_500._16_4_ + fVar272 * fStack_470);
    auVar61._16_4_ = fVar163;
    fVar253 = fVar253 * (fStack_22c * fVar344 +
                        fVar297 * fStack_3ec + fVar251 * local_500._20_4_ + fVar273 * fStack_46c);
    auVar61._20_4_ = fVar253;
    fVar274 = fVar274 * (fStack_228 * fVar346 +
                        fVar322 * fStack_3e8 + fVar255 * local_500._24_4_ + fVar292 * fStack_468);
    auVar61._24_4_ = fVar274;
    auVar61._28_4_ = fVar276;
    auVar111._4_4_ = fVar370;
    auVar111._0_4_ = fVar356;
    auVar111._8_4_ = fVar373;
    auVar111._12_4_ = fVar376;
    auVar111._16_4_ = fVar379;
    auVar111._20_4_ = fVar382;
    auVar111._24_4_ = fVar385;
    auVar111._28_4_ = fVar388;
    auVar141 = vperm2f128_avx(auVar111,auVar111,1);
    auVar141 = vshufps_avx(auVar141,auVar111,0x30);
    local_a00 = vshufps_avx(auVar111,auVar141,0x29);
    auVar117._4_4_ = fStack_9dc;
    auVar117._0_4_ = local_9e0;
    auVar117._8_4_ = fStack_9d8;
    auVar117._12_4_ = fStack_9d4;
    auVar117._16_4_ = fStack_9d0;
    auVar117._20_4_ = fStack_9cc;
    auVar117._24_4_ = fStack_9c8;
    auVar117._28_4_ = fStack_9c4;
    auVar141 = vperm2f128_avx(auVar117,auVar117,1);
    auVar141 = vshufps_avx(auVar141,auVar117,0x30);
    auVar34 = vshufps_avx(auVar117,auVar141,0x29);
    auVar193 = vsubps_avx(_local_ac0,auVar61);
    auVar141 = vperm2f128_avx(auVar193,auVar193,1);
    auVar141 = vshufps_avx(auVar141,auVar193,0x30);
    auVar35 = vshufps_avx(auVar193,auVar141,0x29);
    auVar33 = vsubps_avx(local_a00,auVar111);
    auVar36 = vsubps_avx(auVar34,auVar117);
    fVar250 = auVar33._0_4_;
    fVar255 = auVar33._4_4_;
    auVar62._4_4_ = fVar449 * fVar255;
    auVar62._0_4_ = fVar442 * fVar250;
    fVar292 = auVar33._8_4_;
    auVar62._8_4_ = fVar451 * fVar292;
    fVar331 = auVar33._12_4_;
    auVar62._12_4_ = fVar453 * fVar331;
    fVar371 = auVar33._16_4_;
    auVar62._16_4_ = fVar455 * fVar371;
    fVar39 = auVar33._20_4_;
    auVar62._20_4_ = fVar457 * fVar39;
    fVar47 = auVar33._24_4_;
    auVar62._24_4_ = fVar459 * fVar47;
    auVar62._28_4_ = auVar193._28_4_;
    fVar196 = auVar36._0_4_;
    fVar270 = auVar36._4_4_;
    auVar63._4_4_ = fVar436 * fVar270;
    auVar63._0_4_ = fVar428 * fVar196;
    fVar293 = auVar36._8_4_;
    auVar63._8_4_ = fVar437 * fVar293;
    fVar343 = auVar36._12_4_;
    auVar63._12_4_ = fVar438 * fVar343;
    fVar374 = auVar36._16_4_;
    auVar63._16_4_ = fVar439 * fVar374;
    fVar40 = auVar36._20_4_;
    auVar63._20_4_ = fVar440 * fVar40;
    fVar48 = auVar36._24_4_;
    auVar63._24_4_ = fVar441 * fVar48;
    auVar63._28_4_ = auVar141._28_4_;
    auVar33 = vsubps_avx(auVar63,auVar62);
    auVar113._4_4_ = fVar369;
    auVar113._0_4_ = fVar355;
    auVar113._8_4_ = fVar372;
    auVar113._12_4_ = fVar375;
    auVar113._16_4_ = fVar378;
    auVar113._20_4_ = fVar381;
    auVar113._24_4_ = fVar384;
    auVar113._28_4_ = fVar387;
    auVar141 = vperm2f128_avx(auVar113,auVar113,1);
    auVar141 = vshufps_avx(auVar141,auVar113,0x30);
    auVar395 = vshufps_avx(auVar113,auVar141,0x29);
    auVar37 = vsubps_avx(auVar395,auVar113);
    auVar64._4_4_ = fVar270 * fVar314;
    auVar64._0_4_ = fVar196 * fVar299;
    auVar64._8_4_ = fVar293 * fVar316;
    auVar64._12_4_ = fVar343 * fVar318;
    auVar64._16_4_ = fVar374 * fVar320;
    auVar64._20_4_ = fVar40 * fVar324;
    auVar64._24_4_ = fVar48 * fVar328;
    auVar64._28_4_ = auVar395._28_4_;
    fVar227 = auVar37._0_4_;
    fVar271 = auVar37._4_4_;
    auVar65._4_4_ = fVar449 * fVar271;
    auVar65._0_4_ = fVar442 * fVar227;
    fVar294 = auVar37._8_4_;
    auVar65._8_4_ = fVar451 * fVar294;
    fVar344 = auVar37._12_4_;
    auVar65._12_4_ = fVar453 * fVar344;
    fVar377 = auVar37._16_4_;
    auVar65._16_4_ = fVar455 * fVar377;
    fVar41 = auVar37._20_4_;
    auVar65._20_4_ = fVar457 * fVar41;
    fVar49 = auVar37._24_4_;
    auVar65._24_4_ = fVar459 * fVar49;
    auVar65._28_4_ = fVar387;
    auVar213 = vsubps_avx(auVar65,auVar64);
    auVar66._4_4_ = fVar436 * fVar271;
    auVar66._0_4_ = fVar428 * fVar227;
    auVar66._8_4_ = fVar437 * fVar294;
    auVar66._12_4_ = fVar438 * fVar344;
    auVar66._16_4_ = fVar439 * fVar377;
    auVar66._20_4_ = fVar440 * fVar41;
    auVar66._24_4_ = fVar441 * fVar49;
    auVar66._28_4_ = fVar387;
    auVar67._4_4_ = fVar255 * fVar314;
    auVar67._0_4_ = fVar250 * fVar299;
    auVar67._8_4_ = fVar292 * fVar316;
    auVar67._12_4_ = fVar331 * fVar318;
    auVar67._16_4_ = fVar371 * fVar320;
    auVar67._20_4_ = fVar39 * fVar324;
    auVar67._24_4_ = fVar47 * fVar328;
    auVar67._28_4_ = uStack_204;
    auVar55 = vsubps_avx(auVar67,auVar66);
    fVar168 = auVar55._28_4_;
    auVar185._0_4_ = fVar227 * fVar227 + fVar250 * fVar250 + fVar196 * fVar196;
    auVar185._4_4_ = fVar271 * fVar271 + fVar255 * fVar255 + fVar270 * fVar270;
    auVar185._8_4_ = fVar294 * fVar294 + fVar292 * fVar292 + fVar293 * fVar293;
    auVar185._12_4_ = fVar344 * fVar344 + fVar331 * fVar331 + fVar343 * fVar343;
    auVar185._16_4_ = fVar377 * fVar377 + fVar371 * fVar371 + fVar374 * fVar374;
    auVar185._20_4_ = fVar41 * fVar41 + fVar39 * fVar39 + fVar40 * fVar40;
    auVar185._24_4_ = fVar49 * fVar49 + fVar47 * fVar47 + fVar48 * fVar48;
    auVar185._28_4_ = fVar168 + fVar168 + auVar33._28_4_;
    auVar141 = vrcpps_avx(auVar185);
    fVar322 = auVar141._0_4_;
    fVar323 = auVar141._4_4_;
    auVar68._4_4_ = fVar323 * auVar185._4_4_;
    auVar68._0_4_ = fVar322 * auVar185._0_4_;
    fVar326 = auVar141._8_4_;
    auVar68._8_4_ = fVar326 * auVar185._8_4_;
    fVar327 = auVar141._12_4_;
    auVar68._12_4_ = fVar327 * auVar185._12_4_;
    fVar350 = auVar141._16_4_;
    auVar68._16_4_ = fVar350 * auVar185._16_4_;
    fVar352 = auVar141._20_4_;
    auVar68._20_4_ = fVar352 * auVar185._20_4_;
    fVar354 = auVar141._24_4_;
    auVar68._24_4_ = fVar354 * auVar185._24_4_;
    auVar68._28_4_ = uStack_204;
    auVar267._8_4_ = 0x3f800000;
    auVar267._0_8_ = 0x3f8000003f800000;
    auVar267._12_4_ = 0x3f800000;
    auVar267._16_4_ = 0x3f800000;
    auVar267._20_4_ = 0x3f800000;
    auVar267._24_4_ = 0x3f800000;
    auVar267._28_4_ = 0x3f800000;
    auVar434 = vsubps_avx(auVar267,auVar68);
    fVar322 = auVar434._0_4_ * fVar322 + fVar322;
    fVar323 = auVar434._4_4_ * fVar323 + fVar323;
    fVar326 = auVar434._8_4_ * fVar326 + fVar326;
    fVar327 = auVar434._12_4_ * fVar327 + fVar327;
    fVar350 = auVar434._16_4_ * fVar350 + fVar350;
    fVar352 = auVar434._20_4_ * fVar352 + fVar352;
    fVar354 = auVar434._24_4_ * fVar354 + fVar354;
    auVar193 = vperm2f128_avx(auVar59,auVar59,1);
    auVar193 = vshufps_avx(auVar193,auVar59,0x30);
    local_a80 = vshufps_avx(auVar59,auVar193,0x29);
    auVar193 = vperm2f128_avx(auVar60,auVar60,1);
    auVar193 = vshufps_avx(auVar193,auVar60,0x30);
    local_880 = vshufps_avx(auVar60,auVar193,0x29);
    fVar443 = local_880._0_4_;
    fVar450 = local_880._4_4_;
    auVar69._4_4_ = fVar450 * fVar255;
    auVar69._0_4_ = fVar443 * fVar250;
    fVar452 = local_880._8_4_;
    auVar69._8_4_ = fVar452 * fVar292;
    fVar454 = local_880._12_4_;
    auVar69._12_4_ = fVar454 * fVar331;
    fVar456 = local_880._16_4_;
    auVar69._16_4_ = fVar456 * fVar371;
    fVar458 = local_880._20_4_;
    auVar69._20_4_ = fVar458 * fVar39;
    fVar460 = local_880._24_4_;
    auVar69._24_4_ = fVar460 * fVar47;
    auVar69._28_4_ = auVar193._28_4_;
    fVar198 = local_a80._0_4_;
    fVar272 = local_a80._4_4_;
    auVar70._4_4_ = fVar270 * fVar272;
    auVar70._0_4_ = fVar196 * fVar198;
    fVar295 = local_a80._8_4_;
    auVar70._8_4_ = fVar293 * fVar295;
    fVar346 = local_a80._12_4_;
    auVar70._12_4_ = fVar343 * fVar346;
    fVar380 = local_a80._16_4_;
    auVar70._16_4_ = fVar374 * fVar380;
    fVar42 = local_a80._20_4_;
    auVar70._20_4_ = fVar40 * fVar42;
    fVar50 = local_a80._24_4_;
    auVar70._24_4_ = fVar48 * fVar50;
    auVar70._28_4_ = uStack_1c4;
    auVar142 = vsubps_avx(auVar70,auVar69);
    auVar193 = vperm2f128_avx(auVar58,auVar58,1);
    auVar193 = vshufps_avx(auVar193,auVar58,0x30);
    local_860 = vshufps_avx(auVar58,auVar193,0x29);
    fVar251 = local_860._0_4_;
    fVar273 = local_860._4_4_;
    auVar71._4_4_ = fVar270 * fVar273;
    auVar71._0_4_ = fVar196 * fVar251;
    fVar297 = local_860._8_4_;
    auVar71._8_4_ = fVar293 * fVar297;
    fVar348 = local_860._12_4_;
    auVar71._12_4_ = fVar343 * fVar348;
    fVar383 = local_860._16_4_;
    auVar71._16_4_ = fVar374 * fVar383;
    fVar43 = local_860._20_4_;
    auVar71._20_4_ = fVar40 * fVar43;
    fVar51 = local_860._24_4_;
    auVar71._24_4_ = fVar48 * fVar51;
    auVar71._28_4_ = auVar193._28_4_;
    auVar72._4_4_ = fVar450 * fVar271;
    auVar72._0_4_ = fVar443 * fVar227;
    auVar72._8_4_ = fVar452 * fVar294;
    auVar72._12_4_ = fVar454 * fVar344;
    auVar72._16_4_ = fVar456 * fVar377;
    auVar72._20_4_ = fVar458 * fVar41;
    uVar124 = local_880._28_4_;
    auVar72._24_4_ = fVar460 * fVar49;
    auVar72._28_4_ = uVar124;
    auVar193 = vsubps_avx(auVar72,auVar71);
    auVar73._4_4_ = fVar271 * fVar272;
    auVar73._0_4_ = fVar227 * fVar198;
    auVar73._8_4_ = fVar294 * fVar295;
    auVar73._12_4_ = fVar344 * fVar346;
    auVar73._16_4_ = fVar377 * fVar380;
    auVar73._20_4_ = fVar41 * fVar42;
    auVar73._24_4_ = fVar49 * fVar50;
    auVar73._28_4_ = uVar124;
    auVar74._4_4_ = fVar255 * fVar273;
    auVar74._0_4_ = fVar250 * fVar251;
    auVar74._8_4_ = fVar292 * fVar297;
    auVar74._12_4_ = fVar331 * fVar348;
    auVar74._16_4_ = fVar371 * fVar383;
    auVar74._20_4_ = fVar39 * fVar43;
    auVar74._24_4_ = fVar47 * fVar51;
    auVar74._28_4_ = fVar388;
    auVar143 = vsubps_avx(auVar74,auVar73);
    auVar75._4_4_ =
         (auVar33._4_4_ * auVar33._4_4_ +
         auVar213._4_4_ * auVar213._4_4_ + auVar55._4_4_ * auVar55._4_4_) * fVar323;
    auVar75._0_4_ =
         (auVar33._0_4_ * auVar33._0_4_ +
         auVar213._0_4_ * auVar213._0_4_ + auVar55._0_4_ * auVar55._0_4_) * fVar322;
    auVar75._8_4_ =
         (auVar33._8_4_ * auVar33._8_4_ +
         auVar213._8_4_ * auVar213._8_4_ + auVar55._8_4_ * auVar55._8_4_) * fVar326;
    auVar75._12_4_ =
         (auVar33._12_4_ * auVar33._12_4_ +
         auVar213._12_4_ * auVar213._12_4_ + auVar55._12_4_ * auVar55._12_4_) * fVar327;
    auVar75._16_4_ =
         (auVar33._16_4_ * auVar33._16_4_ +
         auVar213._16_4_ * auVar213._16_4_ + auVar55._16_4_ * auVar55._16_4_) * fVar350;
    auVar75._20_4_ =
         (auVar33._20_4_ * auVar33._20_4_ +
         auVar213._20_4_ * auVar213._20_4_ + auVar55._20_4_ * auVar55._20_4_) * fVar352;
    auVar75._24_4_ =
         (auVar33._24_4_ * auVar33._24_4_ +
         auVar213._24_4_ * auVar213._24_4_ + auVar55._24_4_ * auVar55._24_4_) * fVar354;
    auVar75._28_4_ = auVar33._28_4_ + auVar213._28_4_ + fVar168;
    auVar76._4_4_ =
         (auVar142._4_4_ * auVar142._4_4_ +
         auVar193._4_4_ * auVar193._4_4_ + auVar143._4_4_ * auVar143._4_4_) * fVar323;
    auVar76._0_4_ =
         (auVar142._0_4_ * auVar142._0_4_ +
         auVar193._0_4_ * auVar193._0_4_ + auVar143._0_4_ * auVar143._0_4_) * fVar322;
    auVar76._8_4_ =
         (auVar142._8_4_ * auVar142._8_4_ +
         auVar193._8_4_ * auVar193._8_4_ + auVar143._8_4_ * auVar143._8_4_) * fVar326;
    auVar76._12_4_ =
         (auVar142._12_4_ * auVar142._12_4_ +
         auVar193._12_4_ * auVar193._12_4_ + auVar143._12_4_ * auVar143._12_4_) * fVar327;
    auVar76._16_4_ =
         (auVar142._16_4_ * auVar142._16_4_ +
         auVar193._16_4_ * auVar193._16_4_ + auVar143._16_4_ * auVar143._16_4_) * fVar350;
    auVar76._20_4_ =
         (auVar142._20_4_ * auVar142._20_4_ +
         auVar193._20_4_ * auVar193._20_4_ + auVar143._20_4_ * auVar143._20_4_) * fVar352;
    auVar76._24_4_ =
         (auVar142._24_4_ * auVar142._24_4_ +
         auVar193._24_4_ * auVar193._24_4_ + auVar143._24_4_ * auVar143._24_4_) * fVar354;
    auVar76._28_4_ = auVar434._28_4_ + auVar141._28_4_;
    auVar141 = vmaxps_avx(auVar75,auVar76);
    auVar193 = vperm2f128_avx(_local_ac0,_local_ac0,1);
    auVar193 = vshufps_avx(auVar193,_local_ac0,0x30);
    auVar213 = vshufps_avx(_local_ac0,auVar193,0x29);
    auVar146._0_4_ = (float)local_ac0._0_4_ + fVar252;
    auVar146._4_4_ = (float)local_ac0._4_4_ + fVar254;
    auVar146._8_4_ = fStack_ab8 + fVar275;
    auVar146._12_4_ = fStack_ab4 + fVar291;
    auVar146._16_4_ = fStack_ab0 + fVar163;
    auVar146._20_4_ = fStack_aac + fVar253;
    auVar146._24_4_ = fStack_aa8 + fVar274;
    auVar146._28_4_ = fStack_aa4 + fVar276;
    auVar193 = vmaxps_avx(_local_ac0,auVar146);
    auVar33 = vmaxps_avx(auVar35,auVar213);
    auVar193 = vmaxps_avx(auVar193,auVar33);
    auVar33 = vrsqrtps_avx(auVar185);
    fVar168 = auVar33._0_4_;
    fVar163 = auVar33._4_4_;
    fVar252 = auVar33._8_4_;
    fVar253 = auVar33._12_4_;
    fVar254 = auVar33._16_4_;
    fVar274 = auVar33._20_4_;
    fVar275 = auVar33._24_4_;
    auVar77._4_4_ = fVar163 * fVar163 * fVar163 * auVar185._4_4_ * 0.5;
    auVar77._0_4_ = fVar168 * fVar168 * fVar168 * auVar185._0_4_ * 0.5;
    auVar77._8_4_ = fVar252 * fVar252 * fVar252 * auVar185._8_4_ * 0.5;
    auVar77._12_4_ = fVar253 * fVar253 * fVar253 * auVar185._12_4_ * 0.5;
    auVar77._16_4_ = fVar254 * fVar254 * fVar254 * auVar185._16_4_ * 0.5;
    auVar77._20_4_ = fVar274 * fVar274 * fVar274 * auVar185._20_4_ * 0.5;
    auVar77._24_4_ = fVar275 * fVar275 * fVar275 * auVar185._24_4_ * 0.5;
    auVar77._28_4_ = auVar185._28_4_;
    auVar78._4_4_ = fVar163 * 1.5;
    auVar78._0_4_ = fVar168 * 1.5;
    auVar78._8_4_ = fVar252 * 1.5;
    auVar78._12_4_ = fVar253 * 1.5;
    auVar78._16_4_ = fVar254 * 1.5;
    auVar78._20_4_ = fVar274 * 1.5;
    auVar78._24_4_ = fVar275 * 1.5;
    auVar78._28_4_ = auVar33._28_4_;
    local_5a0 = vsubps_avx(auVar78,auVar77);
    auVar112._4_4_ = fVar370;
    auVar112._0_4_ = fVar356;
    auVar112._8_4_ = fVar373;
    auVar112._12_4_ = fVar376;
    auVar112._16_4_ = fVar379;
    auVar112._20_4_ = fVar382;
    auVar112._24_4_ = fVar385;
    auVar112._28_4_ = fVar388;
    auVar434 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar55 = vsubps_avx(auVar434,auVar112);
    auVar434 = vsubps_avx(auVar434,auVar117);
    fVar163 = auVar434._0_4_;
    fVar274 = auVar434._4_4_;
    fVar322 = auVar434._8_4_;
    fVar350 = auVar434._12_4_;
    fVar386 = auVar434._16_4_;
    fVar44 = auVar434._20_4_;
    fVar52 = auVar434._24_4_;
    fVar252 = auVar55._0_4_;
    fVar275 = auVar55._4_4_;
    fVar323 = auVar55._8_4_;
    fVar352 = auVar55._12_4_;
    fVar400 = auVar55._16_4_;
    fVar45 = auVar55._20_4_;
    fVar53 = auVar55._24_4_;
    auVar114._4_4_ = fVar369;
    auVar114._0_4_ = fVar355;
    auVar114._8_4_ = fVar372;
    auVar114._12_4_ = fVar375;
    auVar114._16_4_ = fVar378;
    auVar114._20_4_ = fVar381;
    auVar114._24_4_ = fVar384;
    auVar114._28_4_ = fVar387;
    auVar183 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar142 = vsubps_avx(auVar183,auVar114);
    fVar253 = auVar142._0_4_;
    fVar276 = auVar142._4_4_;
    fVar326 = auVar142._8_4_;
    fVar354 = auVar142._12_4_;
    fVar401 = auVar142._16_4_;
    fVar46 = auVar142._20_4_;
    fVar54 = auVar142._24_4_;
    auVar447._0_4_ =
         (float)local_8c0._0_4_ * fVar253 +
         (float)local_920._0_4_ * fVar252 + (float)local_8e0._0_4_ * fVar163;
    auVar447._4_4_ =
         (float)local_8c0._4_4_ * fVar276 +
         (float)local_920._4_4_ * fVar275 + (float)local_8e0._4_4_ * fVar274;
    auVar447._8_4_ = fStack_8b8 * fVar326 + fStack_918 * fVar323 + fStack_8d8 * fVar322;
    auVar447._12_4_ = fStack_8b4 * fVar354 + fStack_914 * fVar352 + fStack_8d4 * fVar350;
    auVar447._16_4_ = fStack_8b0 * fVar401 + fStack_910 * fVar400 + fStack_8d0 * fVar386;
    auVar447._20_4_ = fStack_8ac * fVar46 + fStack_90c * fVar45 + fStack_8cc * fVar44;
    auVar447._24_4_ = fStack_8a8 * fVar54 + fStack_908 * fVar53 + fStack_8c8 * fVar52;
    auVar447._28_4_ = fVar388 + auVar143._28_4_ + auVar33._28_4_;
    auVar462._0_4_ = fVar253 * fVar253 + fVar252 * fVar252 + fVar163 * fVar163;
    auVar462._4_4_ = fVar276 * fVar276 + fVar275 * fVar275 + fVar274 * fVar274;
    auVar462._8_4_ = fVar326 * fVar326 + fVar323 * fVar323 + fVar322 * fVar322;
    auVar462._12_4_ = fVar354 * fVar354 + fVar352 * fVar352 + fVar350 * fVar350;
    auVar462._16_4_ = fVar401 * fVar401 + fVar400 * fVar400 + fVar386 * fVar386;
    auVar462._20_4_ = fVar46 * fVar46 + fVar45 * fVar45 + fVar44 * fVar44;
    auVar462._24_4_ = fVar54 * fVar54 + fVar53 * fVar53 + fVar52 * fVar52;
    auVar462._28_4_ = fStack_aa4 + fStack_aa4 + fVar388;
    fVar254 = local_5a0._0_4_;
    fVar291 = local_5a0._4_4_;
    fVar327 = local_5a0._8_4_;
    fVar368 = local_5a0._12_4_;
    fVar427 = local_5a0._16_4_;
    fVar296 = local_5a0._20_4_;
    fVar298 = local_5a0._24_4_;
    local_5e0 = (float)local_8c0._0_4_ * fVar227 * fVar254 +
                fVar250 * fVar254 * (float)local_920._0_4_ +
                fVar196 * fVar254 * (float)local_8e0._0_4_;
    fStack_5dc = (float)local_8c0._4_4_ * fVar271 * fVar291 +
                 fVar255 * fVar291 * (float)local_920._4_4_ +
                 fVar270 * fVar291 * (float)local_8e0._4_4_;
    fStack_5d8 = fStack_8b8 * fVar294 * fVar327 +
                 fVar292 * fVar327 * fStack_918 + fVar293 * fVar327 * fStack_8d8;
    fStack_5d4 = fStack_8b4 * fVar344 * fVar368 +
                 fVar331 * fVar368 * fStack_914 + fVar343 * fVar368 * fStack_8d4;
    fStack_5d0 = fStack_8b0 * fVar377 * fVar427 +
                 fVar371 * fVar427 * fStack_910 + fVar374 * fVar427 * fStack_8d0;
    fStack_5cc = fStack_8ac * fVar41 * fVar296 +
                 fVar39 * fVar296 * fStack_90c + fVar40 * fVar296 * fStack_8cc;
    fStack_5c8 = fStack_8a8 * fVar49 * fVar298 +
                 fVar47 * fVar298 * fStack_908 + fVar48 * fVar298 * fStack_8c8;
    fVar168 = fStack_8a4 + fStack_904 + fStack_8c4;
    fVar402 = fVar253 * fVar227 * fVar254 +
              fVar250 * fVar254 * fVar252 + fVar196 * fVar254 * fVar163;
    fVar411 = fVar276 * fVar271 * fVar291 +
              fVar255 * fVar291 * fVar275 + fVar270 * fVar291 * fVar274;
    fVar412 = fVar326 * fVar294 * fVar327 +
              fVar292 * fVar327 * fVar323 + fVar293 * fVar327 * fVar322;
    fVar413 = fVar354 * fVar344 * fVar368 +
              fVar331 * fVar368 * fVar352 + fVar343 * fVar368 * fVar350;
    fVar414 = fVar401 * fVar377 * fVar427 +
              fVar371 * fVar427 * fVar400 + fVar374 * fVar427 * fVar386;
    fVar415 = fVar46 * fVar41 * fVar296 + fVar39 * fVar296 * fVar45 + fVar40 * fVar296 * fVar44;
    fVar416 = fVar54 * fVar49 * fVar298 + fVar47 * fVar298 * fVar53 + fVar48 * fVar298 * fVar52;
    fVar417 = fStack_904 + fVar168;
    auVar79._4_4_ = fStack_5dc * fVar411;
    auVar79._0_4_ = local_5e0 * fVar402;
    auVar79._8_4_ = fStack_5d8 * fVar412;
    auVar79._12_4_ = fStack_5d4 * fVar413;
    auVar79._16_4_ = fStack_5d0 * fVar414;
    auVar79._20_4_ = fStack_5cc * fVar415;
    auVar79._24_4_ = fStack_5c8 * fVar416;
    auVar79._28_4_ = fVar168;
    auVar143 = vsubps_avx(auVar447,auVar79);
    auVar80._4_4_ = fVar411 * fVar411;
    auVar80._0_4_ = fVar402 * fVar402;
    auVar80._8_4_ = fVar412 * fVar412;
    auVar80._12_4_ = fVar413 * fVar413;
    auVar80._16_4_ = fVar414 * fVar414;
    auVar80._20_4_ = fVar415 * fVar415;
    auVar80._24_4_ = fVar416 * fVar416;
    auVar80._28_4_ = fStack_904;
    auVar182 = vsubps_avx(auVar462,auVar80);
    auVar33 = vsqrtps_avx(auVar141);
    fVar168 = (auVar33._0_4_ + auVar193._0_4_) * 1.0000002;
    fVar160 = (auVar33._4_4_ + auVar193._4_4_) * 1.0000002;
    fVar161 = (auVar33._8_4_ + auVar193._8_4_) * 1.0000002;
    fVar162 = (auVar33._12_4_ + auVar193._12_4_) * 1.0000002;
    fVar164 = (auVar33._16_4_ + auVar193._16_4_) * 1.0000002;
    fVar165 = (auVar33._20_4_ + auVar193._20_4_) * 1.0000002;
    fVar166 = (auVar33._24_4_ + auVar193._24_4_) * 1.0000002;
    auVar81._4_4_ = fVar160 * fVar160;
    auVar81._0_4_ = fVar168 * fVar168;
    auVar81._8_4_ = fVar161 * fVar161;
    auVar81._12_4_ = fVar162 * fVar162;
    auVar81._16_4_ = fVar164 * fVar164;
    auVar81._20_4_ = fVar165 * fVar165;
    auVar81._24_4_ = fVar166 * fVar166;
    auVar81._28_4_ = auVar33._28_4_ + auVar193._28_4_;
    fVar160 = auVar143._0_4_ + auVar143._0_4_;
    fVar161 = auVar143._4_4_ + auVar143._4_4_;
    local_a20._0_8_ = CONCAT44(fVar161,fVar160);
    local_a20._8_4_ = auVar143._8_4_ + auVar143._8_4_;
    local_a20._12_4_ = auVar143._12_4_ + auVar143._12_4_;
    local_a20._16_4_ = auVar143._16_4_ + auVar143._16_4_;
    local_a20._20_4_ = auVar143._20_4_ + auVar143._20_4_;
    local_a20._24_4_ = auVar143._24_4_ + auVar143._24_4_;
    fVar168 = auVar143._28_4_;
    local_a20._28_4_ = fVar168 + fVar168;
    auVar193 = vsubps_avx(auVar182,auVar81);
    local_360._4_4_ = fStack_5dc * fStack_5dc;
    local_360._0_4_ = local_5e0 * local_5e0;
    local_360._8_4_ = fStack_5d8 * fStack_5d8;
    local_360._12_4_ = fStack_5d4 * fStack_5d4;
    local_360._16_4_ = fStack_5d0 * fStack_5d0;
    local_360._20_4_ = fStack_5cc * fStack_5cc;
    local_360._24_4_ = fStack_5c8 * fStack_5c8;
    local_360._28_4_ = auVar36._28_4_;
    auVar426 = ZEXT3264(local_360);
    local_5c0 = vsubps_avx(local_2c0,local_360);
    auVar396 = ZEXT3264(local_5c0);
    auVar82._4_4_ = fVar161 * fVar161;
    auVar82._0_4_ = fVar160 * fVar160;
    auVar82._8_4_ = local_a20._8_4_ * local_a20._8_4_;
    auVar82._12_4_ = local_a20._12_4_ * local_a20._12_4_;
    auVar82._16_4_ = local_a20._16_4_ * local_a20._16_4_;
    auVar82._20_4_ = local_a20._20_4_ * local_a20._20_4_;
    auVar82._24_4_ = local_a20._24_4_ * local_a20._24_4_;
    auVar82._28_4_ = fVar168;
    fVar162 = local_5c0._0_4_;
    fVar164 = local_5c0._4_4_;
    fVar165 = local_5c0._8_4_;
    fVar166 = local_5c0._12_4_;
    fVar397 = local_5c0._16_4_;
    fVar398 = local_5c0._20_4_;
    fVar399 = local_5c0._24_4_;
    auVar83._4_4_ = auVar193._4_4_ * fVar164 * 4.0;
    auVar83._0_4_ = auVar193._0_4_ * fVar162 * 4.0;
    auVar83._8_4_ = auVar193._8_4_ * fVar165 * 4.0;
    auVar83._12_4_ = auVar193._12_4_ * fVar166 * 4.0;
    auVar83._16_4_ = auVar193._16_4_ * fVar397 * 4.0;
    auVar83._20_4_ = auVar193._20_4_ * fVar398 * 4.0;
    auVar83._24_4_ = auVar193._24_4_ * fVar399 * 4.0;
    auVar83._28_4_ = 0x40800000;
    auVar36 = vsubps_avx(auVar82,auVar83);
    auVar141 = vcmpps_avx(auVar36,auVar183,5);
    fVar168 = local_5c0._28_4_;
    if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar141 >> 0x7f,0) == '\0') &&
          (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar141 >> 0xbf,0) == '\0') &&
        (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar141[0x1f])
    {
      auVar435 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar463._8_4_ = 0xff800000;
      auVar463._0_8_ = 0xff800000ff800000;
      auVar463._12_4_ = 0xff800000;
      auVar463._16_4_ = 0xff800000;
      auVar463._20_4_ = 0xff800000;
      auVar463._24_4_ = 0xff800000;
      auVar463._28_4_ = 0xff800000;
    }
    else {
      auVar143 = vcmpps_avx(auVar36,auVar183,5);
      auVar183 = vsqrtps_avx(auVar36);
      auVar305._0_4_ = fVar162 + fVar162;
      auVar305._4_4_ = fVar164 + fVar164;
      auVar305._8_4_ = fVar165 + fVar165;
      auVar305._12_4_ = fVar166 + fVar166;
      auVar305._16_4_ = fVar397 + fVar397;
      auVar305._20_4_ = fVar398 + fVar398;
      auVar305._24_4_ = fVar399 + fVar399;
      auVar305._28_4_ = fVar168 + fVar168;
      auVar36 = vrcpps_avx(auVar305);
      fVar300 = auVar36._0_4_;
      fVar315 = auVar36._4_4_;
      auVar84._4_4_ = auVar305._4_4_ * fVar315;
      auVar84._0_4_ = auVar305._0_4_ * fVar300;
      fVar317 = auVar36._8_4_;
      auVar84._8_4_ = auVar305._8_4_ * fVar317;
      fVar319 = auVar36._12_4_;
      auVar84._12_4_ = auVar305._12_4_ * fVar319;
      fVar321 = auVar36._16_4_;
      auVar84._16_4_ = auVar305._16_4_ * fVar321;
      fVar325 = auVar36._20_4_;
      auVar84._20_4_ = auVar305._20_4_ * fVar325;
      fVar329 = auVar36._24_4_;
      auVar84._24_4_ = auVar305._24_4_ * fVar329;
      auVar84._28_4_ = auVar305._28_4_;
      auVar365._8_4_ = 0x3f800000;
      auVar365._0_8_ = 0x3f8000003f800000;
      auVar365._12_4_ = 0x3f800000;
      auVar365._16_4_ = 0x3f800000;
      auVar365._20_4_ = 0x3f800000;
      auVar365._24_4_ = 0x3f800000;
      auVar365._28_4_ = 0x3f800000;
      auVar184 = vsubps_avx(auVar365,auVar84);
      fVar300 = fVar300 + fVar300 * auVar184._0_4_;
      fVar315 = fVar315 + fVar315 * auVar184._4_4_;
      fVar317 = fVar317 + fVar317 * auVar184._8_4_;
      fVar319 = fVar319 + fVar319 * auVar184._12_4_;
      fVar321 = fVar321 + fVar321 * auVar184._16_4_;
      fVar325 = fVar325 + fVar325 * auVar184._20_4_;
      fVar329 = fVar329 + fVar329 * auVar184._24_4_;
      auVar337._0_8_ = CONCAT44(fVar161,fVar160) ^ 0x8000000080000000;
      auVar337._8_4_ = -local_a20._8_4_;
      auVar337._12_4_ = -local_a20._12_4_;
      auVar337._16_4_ = -local_a20._16_4_;
      auVar337._20_4_ = -local_a20._20_4_;
      auVar337._24_4_ = -local_a20._24_4_;
      auVar337._28_4_ = -local_a20._28_4_;
      auVar209 = vsubps_avx(auVar337,auVar183);
      fVar160 = auVar209._0_4_ * fVar300;
      fVar161 = auVar209._4_4_ * fVar315;
      auVar85._4_4_ = fVar161;
      auVar85._0_4_ = fVar160;
      fVar345 = auVar209._8_4_ * fVar317;
      auVar85._8_4_ = fVar345;
      fVar347 = auVar209._12_4_ * fVar319;
      auVar85._12_4_ = fVar347;
      fVar349 = auVar209._16_4_ * fVar321;
      auVar85._16_4_ = fVar349;
      fVar351 = auVar209._20_4_ * fVar325;
      auVar85._20_4_ = fVar351;
      fVar353 = auVar209._24_4_ * fVar329;
      auVar85._24_4_ = fVar353;
      auVar85._28_4_ = auVar209._28_4_;
      auVar183 = vsubps_avx(auVar183,local_a20);
      fVar300 = auVar183._0_4_ * fVar300;
      fVar315 = auVar183._4_4_ * fVar315;
      auVar86._4_4_ = fVar315;
      auVar86._0_4_ = fVar300;
      fVar317 = auVar183._8_4_ * fVar317;
      auVar86._8_4_ = fVar317;
      fVar319 = auVar183._12_4_ * fVar319;
      auVar86._12_4_ = fVar319;
      fVar321 = auVar183._16_4_ * fVar321;
      auVar86._16_4_ = fVar321;
      fVar325 = auVar183._20_4_ * fVar325;
      auVar86._20_4_ = fVar325;
      fVar329 = auVar183._24_4_ * fVar329;
      auVar86._24_4_ = fVar329;
      auVar86._28_4_ = auVar183._28_4_;
      local_320 = fVar254 * (fVar402 + local_5e0 * fVar160);
      fStack_31c = fVar291 * (fVar411 + fStack_5dc * fVar161);
      fStack_318 = fVar327 * (fVar412 + fStack_5d8 * fVar345);
      fStack_314 = fVar368 * (fVar413 + fStack_5d4 * fVar347);
      fStack_310 = fVar427 * (fVar414 + fStack_5d0 * fVar349);
      fStack_30c = fVar296 * (fVar415 + fStack_5cc * fVar351);
      fStack_308 = fVar298 * (fVar416 + fStack_5c8 * fVar353);
      fStack_304 = fVar417 + auVar36._28_4_ + auVar184._28_4_;
      auVar306._8_4_ = 0x7fffffff;
      auVar306._0_8_ = 0x7fffffff7fffffff;
      auVar306._12_4_ = 0x7fffffff;
      auVar306._16_4_ = 0x7fffffff;
      auVar306._20_4_ = 0x7fffffff;
      auVar306._24_4_ = 0x7fffffff;
      auVar306._28_4_ = 0x7fffffff;
      auVar36 = vandps_avx(local_360,auVar306);
      auVar184 = vmaxps_avx(local_540,auVar36);
      auVar87._4_4_ = auVar184._4_4_ * 1.9073486e-06;
      auVar87._0_4_ = auVar184._0_4_ * 1.9073486e-06;
      auVar87._8_4_ = auVar184._8_4_ * 1.9073486e-06;
      auVar87._12_4_ = auVar184._12_4_ * 1.9073486e-06;
      auVar87._16_4_ = auVar184._16_4_ * 1.9073486e-06;
      auVar87._20_4_ = auVar184._20_4_ * 1.9073486e-06;
      auVar87._24_4_ = auVar184._24_4_ * 1.9073486e-06;
      auVar87._28_4_ = auVar184._28_4_;
      auVar36 = vandps_avx(local_5c0,auVar306);
      auVar183 = vcmpps_avx(auVar36,auVar87,1);
      auVar366._8_4_ = 0x7f800000;
      auVar366._0_8_ = 0x7f8000007f800000;
      auVar366._12_4_ = 0x7f800000;
      auVar366._16_4_ = 0x7f800000;
      auVar366._20_4_ = 0x7f800000;
      auVar366._24_4_ = 0x7f800000;
      auVar366._28_4_ = 0x7f800000;
      auVar36 = vblendvps_avx(auVar366,auVar85,auVar143);
      auVar435 = ZEXT3264(auVar36);
      local_340 = fVar254 * (fVar402 + local_5e0 * fVar300);
      fStack_33c = fVar291 * (fVar411 + fStack_5dc * fVar315);
      fStack_338 = fVar327 * (fVar412 + fStack_5d8 * fVar317);
      fStack_334 = fVar368 * (fVar413 + fStack_5d4 * fVar319);
      fStack_330 = fVar427 * (fVar414 + fStack_5d0 * fVar321);
      fStack_32c = fVar296 * (fVar415 + fStack_5cc * fVar325);
      fStack_328 = fVar298 * (fVar416 + fStack_5c8 * fVar329);
      fStack_324 = fVar417 + auVar184._28_4_;
      auVar307._8_4_ = 0xff800000;
      auVar307._0_8_ = 0xff800000ff800000;
      auVar307._12_4_ = 0xff800000;
      auVar307._16_4_ = 0xff800000;
      auVar307._20_4_ = 0xff800000;
      auVar307._24_4_ = 0xff800000;
      auVar307._28_4_ = 0xff800000;
      auVar463 = vblendvps_avx(auVar307,auVar86,auVar143);
      auVar184 = auVar143 & auVar183;
      if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar184 >> 0x7f,0) != '\0') ||
            (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar184 >> 0xbf,0) != '\0') ||
          (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar184[0x1f] < '\0') {
        auVar141 = vandps_avx(auVar183,auVar143);
        auVar239 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
        auVar183 = vcmpps_avx(auVar193,ZEXT832(0) << 0x20,2);
        auVar465._8_4_ = 0xff800000;
        auVar465._0_8_ = 0xff800000ff800000;
        auVar465._12_4_ = 0xff800000;
        auVar465._16_4_ = 0xff800000;
        auVar465._20_4_ = 0xff800000;
        auVar465._24_4_ = 0xff800000;
        auVar465._28_4_ = 0xff800000;
        auVar340._8_4_ = 0x7f800000;
        auVar340._0_8_ = 0x7f8000007f800000;
        auVar340._12_4_ = 0x7f800000;
        auVar340._16_4_ = 0x7f800000;
        auVar340._20_4_ = 0x7f800000;
        auVar340._24_4_ = 0x7f800000;
        auVar340._28_4_ = 0x7f800000;
        auVar193 = vblendvps_avx(auVar340,auVar465,auVar183);
        auVar205 = vpmovsxwd_avx(auVar239);
        auVar239 = vpunpckhwd_avx(auVar239,auVar239);
        auVar289._16_16_ = auVar239;
        auVar289._0_16_ = auVar205;
        auVar193 = vblendvps_avx(auVar36,auVar193,auVar289);
        auVar435 = ZEXT3264(auVar193);
        auVar341._8_4_ = 0x7f800000;
        auVar341._0_8_ = 0x7f8000007f800000;
        auVar341._12_4_ = 0x7f800000;
        auVar341._16_4_ = 0x7f800000;
        auVar341._20_4_ = 0x7f800000;
        auVar341._24_4_ = 0x7f800000;
        auVar341._28_4_ = 0x7f800000;
        auVar193 = vblendvps_avx(auVar465,auVar341,auVar183);
        auVar463 = vblendvps_avx(auVar463,auVar193,auVar289);
        auVar193 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar157._0_4_ = auVar141._0_4_ ^ auVar193._0_4_;
        auVar157._4_4_ = auVar141._4_4_ ^ auVar193._4_4_;
        auVar157._8_4_ = auVar141._8_4_ ^ auVar193._8_4_;
        auVar157._12_4_ = auVar141._12_4_ ^ auVar193._12_4_;
        auVar157._16_4_ = auVar141._16_4_ ^ auVar193._16_4_;
        auVar157._20_4_ = auVar141._20_4_ ^ auVar193._20_4_;
        auVar157._24_4_ = auVar141._24_4_ ^ auVar193._24_4_;
        auVar157._28_4_ = auVar141._28_4_ ^ auVar193._28_4_;
        auVar141 = vorps_avx(auVar183,auVar157);
        auVar141 = vandps_avx(auVar143,auVar141);
      }
    }
    auVar410 = ZEXT3264(CONCAT428(fVar417,CONCAT424(fVar416,CONCAT420(fVar415,CONCAT416(fVar414,
                                                  CONCAT412(fVar413,CONCAT48(fVar412,CONCAT44(
                                                  fVar411,fVar402))))))));
    auVar342 = ZEXT3264(local_a20);
    auVar290 = ZEXT3264(local_520);
    auVar193 = local_520 & auVar141;
    auVar313 = ZEXT3264(_local_920);
    if ((((((((auVar193 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar193 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar193 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar193 >> 0x7f,0) == '\0') &&
          (auVar193 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar193 >> 0xbf,0) == '\0') &&
        (auVar193 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar193[0x1f])
    {
LAB_011477d7:
    }
    else {
      fStack_5c4 = fStack_8a4 + fStack_904 + fStack_8c4;
      auVar205 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x100));
      auVar239 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_9a0._0_4_));
      auVar239 = vshufps_avx(auVar239,auVar239,0);
      auVar284._16_16_ = auVar239;
      auVar284._0_16_ = auVar239;
      auVar143 = vminps_avx(auVar284,auVar463);
      fVar325 = auVar434._28_4_;
      auVar212._0_4_ =
           (float)local_8c0._0_4_ * fVar299 +
           (float)local_920._0_4_ * fVar428 + (float)local_8e0._0_4_ * fVar442;
      auVar212._4_4_ =
           (float)local_8c0._4_4_ * fVar314 +
           (float)local_920._4_4_ * fVar436 + (float)local_8e0._4_4_ * fVar449;
      auVar212._8_4_ = fStack_8b8 * fVar316 + fStack_918 * fVar437 + fStack_8d8 * fVar451;
      auVar212._12_4_ = fStack_8b4 * fVar318 + fStack_914 * fVar438 + fStack_8d4 * fVar453;
      auVar212._16_4_ = fStack_8b0 * fVar320 + fStack_910 * fVar439 + fStack_8d0 * fVar455;
      auVar212._20_4_ = fStack_8ac * fVar324 + fStack_90c * fVar440 + fStack_8cc * fVar457;
      auVar212._24_4_ = fStack_8a8 * fVar328 + fStack_908 * fVar441 + fStack_8c8 * fVar459;
      auVar212._28_4_ = fVar325 + fVar325 + auVar142._28_4_;
      auVar193 = vrcpps_avx(auVar212);
      fVar160 = auVar193._0_4_;
      fVar161 = auVar193._4_4_;
      auVar88._4_4_ = auVar212._4_4_ * fVar161;
      auVar88._0_4_ = auVar212._0_4_ * fVar160;
      fVar300 = auVar193._8_4_;
      auVar88._8_4_ = auVar212._8_4_ * fVar300;
      fVar315 = auVar193._12_4_;
      auVar88._12_4_ = auVar212._12_4_ * fVar315;
      fVar317 = auVar193._16_4_;
      auVar88._16_4_ = auVar212._16_4_ * fVar317;
      fVar319 = auVar193._20_4_;
      auVar88._20_4_ = auVar212._20_4_ * fVar319;
      fVar321 = auVar193._24_4_;
      auVar88._24_4_ = auVar212._24_4_ * fVar321;
      auVar88._28_4_ = fVar330;
      auVar407._8_4_ = 0x3f800000;
      auVar407._0_8_ = 0x3f8000003f800000;
      auVar407._12_4_ = 0x3f800000;
      auVar407._16_4_ = 0x3f800000;
      auVar407._20_4_ = 0x3f800000;
      auVar407._24_4_ = 0x3f800000;
      auVar407._28_4_ = 0x3f800000;
      auVar410 = ZEXT3264(auVar407);
      auVar434 = vsubps_avx(auVar407,auVar88);
      auVar338._8_4_ = 0x7fffffff;
      auVar338._0_8_ = 0x7fffffff7fffffff;
      auVar338._12_4_ = 0x7fffffff;
      auVar338._16_4_ = 0x7fffffff;
      auVar338._20_4_ = 0x7fffffff;
      auVar338._24_4_ = 0x7fffffff;
      auVar338._28_4_ = 0x7fffffff;
      auVar193 = vandps_avx(auVar212,auVar338);
      auVar394._8_4_ = 0x219392ef;
      auVar394._0_8_ = 0x219392ef219392ef;
      auVar394._12_4_ = 0x219392ef;
      auVar394._16_4_ = 0x219392ef;
      auVar394._20_4_ = 0x219392ef;
      auVar394._24_4_ = 0x219392ef;
      auVar394._28_4_ = 0x219392ef;
      auVar36 = vcmpps_avx(auVar193,auVar394,1);
      auVar89._4_4_ =
           (fVar161 + fVar161 * auVar434._4_4_) *
           -(fVar314 * fVar276 + fVar436 * fVar275 + fVar449 * fVar274);
      auVar89._0_4_ =
           (fVar160 + fVar160 * auVar434._0_4_) *
           -(fVar299 * fVar253 + fVar428 * fVar252 + fVar442 * fVar163);
      auVar89._8_4_ =
           (fVar300 + fVar300 * auVar434._8_4_) *
           -(fVar316 * fVar326 + fVar437 * fVar323 + fVar451 * fVar322);
      auVar89._12_4_ =
           (fVar315 + fVar315 * auVar434._12_4_) *
           -(fVar318 * fVar354 + fVar438 * fVar352 + fVar453 * fVar350);
      auVar89._16_4_ =
           (fVar317 + fVar317 * auVar434._16_4_) *
           -(fVar320 * fVar401 + fVar439 * fVar400 + fVar455 * fVar386);
      auVar89._20_4_ =
           (fVar319 + fVar319 * auVar434._20_4_) *
           -(fVar324 * fVar46 + fVar440 * fVar45 + fVar457 * fVar44);
      auVar89._24_4_ =
           (fVar321 + fVar321 * auVar434._24_4_) *
           -(fVar328 * fVar54 + fVar441 * fVar53 + fVar459 * fVar52);
      auVar89._28_4_ = -(auVar142._28_4_ + auVar55._28_4_ + fVar325);
      auVar110 = ZEXT812(0);
      auVar396 = ZEXT1264(auVar110) << 0x20;
      auVar193 = vcmpps_avx(auVar212,ZEXT1232(auVar110) << 0x20,1);
      auVar193 = vorps_avx(auVar36,auVar193);
      auVar367._8_4_ = 0xff800000;
      auVar367._0_8_ = 0xff800000ff800000;
      auVar367._12_4_ = 0xff800000;
      auVar367._16_4_ = 0xff800000;
      auVar367._20_4_ = 0xff800000;
      auVar367._24_4_ = 0xff800000;
      auVar367._28_4_ = 0xff800000;
      auVar193 = vblendvps_avx(auVar89,auVar367,auVar193);
      auVar55 = vcmpps_avx(auVar212,ZEXT1232(auVar110) << 0x20,6);
      auVar36 = vorps_avx(auVar36,auVar55);
      auVar424._8_4_ = 0x7f800000;
      auVar424._0_8_ = 0x7f8000007f800000;
      auVar424._12_4_ = 0x7f800000;
      auVar424._16_4_ = 0x7f800000;
      auVar424._20_4_ = 0x7f800000;
      auVar424._24_4_ = 0x7f800000;
      auVar424._28_4_ = 0x7f800000;
      auVar426 = ZEXT3264(auVar424);
      auVar36 = vblendvps_avx(auVar89,auVar424,auVar36);
      auVar55 = vmaxps_avx(local_2e0,auVar435._0_32_);
      auVar55 = vmaxps_avx(auVar55,auVar193);
      auVar36 = vminps_avx(auVar143,auVar36);
      auVar143 = ZEXT1232(auVar110) << 0x20;
      auVar193 = vsubps_avx(auVar143,local_a00);
      auVar34 = vsubps_avx(auVar143,auVar34);
      auVar90._4_4_ = auVar34._4_4_ * -fVar450;
      auVar90._0_4_ = auVar34._0_4_ * -fVar443;
      auVar90._8_4_ = auVar34._8_4_ * -fVar452;
      auVar90._12_4_ = auVar34._12_4_ * -fVar454;
      auVar90._16_4_ = auVar34._16_4_ * -fVar456;
      auVar90._20_4_ = auVar34._20_4_ * -fVar458;
      auVar90._24_4_ = auVar34._24_4_ * -fVar460;
      auVar90._28_4_ = auVar34._28_4_;
      auVar435 = ZEXT3264(local_a80);
      auVar91._4_4_ = fVar272 * auVar193._4_4_;
      auVar91._0_4_ = fVar198 * auVar193._0_4_;
      auVar91._8_4_ = fVar295 * auVar193._8_4_;
      auVar91._12_4_ = fVar346 * auVar193._12_4_;
      auVar91._16_4_ = fVar380 * auVar193._16_4_;
      auVar91._20_4_ = fVar42 * auVar193._20_4_;
      auVar91._24_4_ = fVar50 * auVar193._24_4_;
      auVar91._28_4_ = auVar193._28_4_;
      auVar193 = vsubps_avx(auVar90,auVar91);
      auVar34 = vsubps_avx(auVar143,auVar395);
      auVar92._4_4_ = fVar273 * auVar34._4_4_;
      auVar92._0_4_ = fVar251 * auVar34._0_4_;
      auVar92._8_4_ = fVar297 * auVar34._8_4_;
      auVar92._12_4_ = fVar348 * auVar34._12_4_;
      auVar92._16_4_ = fVar383 * auVar34._16_4_;
      auVar92._20_4_ = fVar43 * auVar34._20_4_;
      uVar8 = auVar34._28_4_;
      auVar92._24_4_ = fVar51 * auVar34._24_4_;
      auVar92._28_4_ = uVar8;
      auVar395 = vsubps_avx(auVar193,auVar92);
      auVar93._4_4_ = (float)local_8e0._4_4_ * -fVar450;
      auVar93._0_4_ = (float)local_8e0._0_4_ * -fVar443;
      auVar93._8_4_ = fStack_8d8 * -fVar452;
      auVar93._12_4_ = fStack_8d4 * -fVar454;
      auVar93._16_4_ = fStack_8d0 * -fVar456;
      auVar93._20_4_ = fStack_8cc * -fVar458;
      auVar93._24_4_ = fStack_8c8 * -fVar460;
      auVar93._28_4_ = uVar124 ^ 0x80000000;
      auVar94._4_4_ = fVar272 * (float)local_920._4_4_;
      auVar94._0_4_ = fVar198 * (float)local_920._0_4_;
      auVar94._8_4_ = fVar295 * fStack_918;
      auVar94._12_4_ = fVar346 * fStack_914;
      auVar94._16_4_ = fVar380 * fStack_910;
      auVar94._20_4_ = fVar42 * fStack_90c;
      auVar94._24_4_ = fVar50 * fStack_908;
      auVar94._28_4_ = uVar8;
      auVar193 = vsubps_avx(auVar93,auVar94);
      auVar95._4_4_ = fVar273 * (float)local_8c0._4_4_;
      auVar95._0_4_ = fVar251 * (float)local_8c0._0_4_;
      auVar95._8_4_ = fVar297 * fStack_8b8;
      auVar95._12_4_ = fVar348 * fStack_8b4;
      auVar95._16_4_ = fVar383 * fStack_8b0;
      auVar95._20_4_ = fVar43 * fStack_8ac;
      auVar95._24_4_ = fVar51 * fStack_8a8;
      auVar95._28_4_ = uVar8;
      auVar434 = vsubps_avx(auVar193,auVar95);
      auVar193 = vrcpps_avx(auVar434);
      fVar198 = auVar193._0_4_;
      fVar251 = auVar193._4_4_;
      auVar96._4_4_ = auVar434._4_4_ * fVar251;
      auVar96._0_4_ = auVar434._0_4_ * fVar198;
      fVar163 = auVar193._8_4_;
      auVar96._8_4_ = auVar434._8_4_ * fVar163;
      fVar252 = auVar193._12_4_;
      auVar96._12_4_ = auVar434._12_4_ * fVar252;
      fVar253 = auVar193._16_4_;
      auVar96._16_4_ = auVar434._16_4_ * fVar253;
      fVar272 = auVar193._20_4_;
      auVar96._20_4_ = auVar434._20_4_ * fVar272;
      fVar273 = auVar193._24_4_;
      auVar96._24_4_ = auVar434._24_4_ * fVar273;
      auVar96._28_4_ = fStack_8a4;
      auVar142 = vsubps_avx(auVar407,auVar96);
      auVar308._8_4_ = 0x7fffffff;
      auVar308._0_8_ = 0x7fffffff7fffffff;
      auVar308._12_4_ = 0x7fffffff;
      auVar308._16_4_ = 0x7fffffff;
      auVar308._20_4_ = 0x7fffffff;
      auVar308._24_4_ = 0x7fffffff;
      auVar308._28_4_ = 0x7fffffff;
      auVar193 = vandps_avx(auVar434,auVar308);
      auVar339._8_4_ = 0x219392ef;
      auVar339._0_8_ = 0x219392ef219392ef;
      auVar339._12_4_ = 0x219392ef;
      auVar339._16_4_ = 0x219392ef;
      auVar339._20_4_ = 0x219392ef;
      auVar339._24_4_ = 0x219392ef;
      auVar339._28_4_ = 0x219392ef;
      auVar34 = vcmpps_avx(auVar193,auVar339,1);
      auVar313 = ZEXT3264(auVar34);
      auVar97._4_4_ = (fVar251 + fVar251 * auVar142._4_4_) * -auVar395._4_4_;
      auVar97._0_4_ = (fVar198 + fVar198 * auVar142._0_4_) * -auVar395._0_4_;
      auVar97._8_4_ = (fVar163 + fVar163 * auVar142._8_4_) * -auVar395._8_4_;
      auVar97._12_4_ = (fVar252 + fVar252 * auVar142._12_4_) * -auVar395._12_4_;
      auVar97._16_4_ = (fVar253 + fVar253 * auVar142._16_4_) * -auVar395._16_4_;
      auVar97._20_4_ = (fVar272 + fVar272 * auVar142._20_4_) * -auVar395._20_4_;
      auVar97._24_4_ = (fVar273 + fVar273 * auVar142._24_4_) * -auVar395._24_4_;
      auVar97._28_4_ = auVar395._28_4_ ^ 0x80000000;
      auVar193 = vcmpps_avx(auVar434,auVar143,1);
      auVar193 = vorps_avx(auVar34,auVar193);
      auVar193 = vblendvps_avx(auVar97,auVar367,auVar193);
      _local_900 = vmaxps_avx(auVar55,auVar193);
      auVar342 = ZEXT3264(_local_900);
      auVar290 = ZEXT3264(local_520);
      auVar395 = ZEXT1232(auVar110) << 0x20;
      auVar193 = vcmpps_avx(auVar434,auVar395,6);
      auVar193 = vorps_avx(auVar34,auVar193);
      auVar193 = vblendvps_avx(auVar97,auVar424,auVar193);
      auVar141 = vandps_avx(auVar141,local_520);
      local_380 = vminps_avx(auVar36,auVar193);
      auVar193 = vcmpps_avx(_local_900,local_380,2);
      auVar34 = auVar141 & auVar193;
      if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar34 >> 0x7f,0) == '\0') &&
            (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar34 >> 0xbf,0) == '\0') &&
          (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar34[0x1f])
      goto LAB_011477d7;
      auVar34 = vminps_avx(_local_ac0,auVar146);
      auVar35 = vminps_avx(auVar35,auVar213);
      auVar34 = vminps_avx(auVar34,auVar35);
      auVar33 = vsubps_avx(auVar34,auVar33);
      auVar141 = vandps_avx(auVar193,auVar141);
      auVar119._4_4_ = fStack_31c;
      auVar119._0_4_ = local_320;
      auVar119._8_4_ = fStack_318;
      auVar119._12_4_ = fStack_314;
      auVar119._16_4_ = fStack_310;
      auVar119._20_4_ = fStack_30c;
      auVar119._24_4_ = fStack_308;
      auVar119._28_4_ = fStack_304;
      auVar193 = vminps_avx(auVar119,auVar407);
      auVar193 = vmaxps_avx(auVar193,ZEXT832(0) << 0x20);
      local_1a0[0] = fVar199 + fVar167 * (auVar193._0_4_ + 0.0) * 0.125;
      local_1a0[1] = fVar224 + fVar194 * (auVar193._4_4_ + 1.0) * 0.125;
      local_1a0[2] = fVar225 + fVar195 * (auVar193._8_4_ + 2.0) * 0.125;
      local_1a0[3] = fVar226 + fVar197 * (auVar193._12_4_ + 3.0) * 0.125;
      fStack_190 = fVar199 + fVar167 * (auVar193._16_4_ + 4.0) * 0.125;
      fStack_18c = fVar224 + fVar194 * (auVar193._20_4_ + 5.0) * 0.125;
      fStack_188 = fVar225 + fVar195 * (auVar193._24_4_ + 6.0) * 0.125;
      fStack_184 = fVar226 + auVar193._28_4_ + 7.0;
      auVar118._4_4_ = fStack_33c;
      auVar118._0_4_ = local_340;
      auVar118._8_4_ = fStack_338;
      auVar118._12_4_ = fStack_334;
      auVar118._16_4_ = fStack_330;
      auVar118._20_4_ = fStack_32c;
      auVar118._24_4_ = fStack_328;
      auVar118._28_4_ = fStack_324;
      auVar193 = vminps_avx(auVar118,auVar407);
      auVar193 = vmaxps_avx(auVar193,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar199 + fVar167 * (auVar193._0_4_ + 0.0) * 0.125;
      local_1c0[1] = fVar224 + fVar194 * (auVar193._4_4_ + 1.0) * 0.125;
      local_1c0[2] = fVar225 + fVar195 * (auVar193._8_4_ + 2.0) * 0.125;
      local_1c0[3] = fVar226 + fVar197 * (auVar193._12_4_ + 3.0) * 0.125;
      fStack_1b0 = fVar199 + fVar167 * (auVar193._16_4_ + 4.0) * 0.125;
      fStack_1ac = fVar224 + fVar194 * (auVar193._20_4_ + 5.0) * 0.125;
      fStack_1a8 = fVar225 + fVar195 * (auVar193._24_4_ + 6.0) * 0.125;
      fStack_1a4 = fVar226 + auVar193._28_4_ + 7.0;
      auVar98._4_4_ = auVar33._4_4_ * 0.99999976;
      auVar98._0_4_ = auVar33._0_4_ * 0.99999976;
      auVar98._8_4_ = auVar33._8_4_ * 0.99999976;
      auVar98._12_4_ = auVar33._12_4_ * 0.99999976;
      auVar98._16_4_ = auVar33._16_4_ * 0.99999976;
      auVar98._20_4_ = auVar33._20_4_ * 0.99999976;
      auVar98._24_4_ = auVar33._24_4_ * 0.99999976;
      auVar98._28_4_ = 0x3f7ffffc;
      auVar193 = vmaxps_avx(auVar395,auVar98);
      auVar99._4_4_ = auVar193._4_4_ * auVar193._4_4_;
      auVar99._0_4_ = auVar193._0_4_ * auVar193._0_4_;
      auVar99._8_4_ = auVar193._8_4_ * auVar193._8_4_;
      auVar99._12_4_ = auVar193._12_4_ * auVar193._12_4_;
      auVar99._16_4_ = auVar193._16_4_ * auVar193._16_4_;
      auVar99._20_4_ = auVar193._20_4_ * auVar193._20_4_;
      auVar99._24_4_ = auVar193._24_4_ * auVar193._24_4_;
      auVar99._28_4_ = auVar193._28_4_;
      auVar33 = vsubps_avx(auVar182,auVar99);
      auVar100._4_4_ = auVar33._4_4_ * fVar164 * 4.0;
      auVar100._0_4_ = auVar33._0_4_ * fVar162 * 4.0;
      auVar100._8_4_ = auVar33._8_4_ * fVar165 * 4.0;
      auVar100._12_4_ = auVar33._12_4_ * fVar166 * 4.0;
      auVar100._16_4_ = auVar33._16_4_ * fVar397 * 4.0;
      auVar100._20_4_ = auVar33._20_4_ * fVar398 * 4.0;
      auVar100._24_4_ = auVar33._24_4_ * fVar399 * 4.0;
      auVar100._28_4_ = auVar193._28_4_;
      auVar425 = vsubps_avx(auVar82,auVar100);
      local_9c0 = vcmpps_avx(auVar425,ZEXT832(0) << 0x20,5);
      auVar193 = local_9c0;
      if ((((((((local_9c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_9c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_9c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_9c0 >> 0x7f,0) == '\0') &&
            (local_9c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_9c0 >> 0xbf,0) == '\0') &&
          (local_9c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_9c0[0x1f]) {
        _local_960 = ZEXT832(0) << 0x20;
        _local_980 = ZEXT832(0) << 0x20;
        auVar213 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar410 = ZEXT864(0) << 0x20;
        auVar242 = ZEXT828(0) << 0x20;
        auVar285._8_4_ = 0x7f800000;
        auVar285._0_8_ = 0x7f8000007f800000;
        auVar285._12_4_ = 0x7f800000;
        auVar285._16_4_ = 0x7f800000;
        auVar285._20_4_ = 0x7f800000;
        auVar285._24_4_ = 0x7f800000;
        auVar285._28_4_ = 0x7f800000;
        auVar309._8_4_ = 0xff800000;
        auVar309._0_8_ = 0xff800000ff800000;
        auVar309._12_4_ = 0xff800000;
        auVar309._16_4_ = 0xff800000;
        auVar309._20_4_ = 0xff800000;
        auVar309._24_4_ = 0xff800000;
        auVar309._28_4_ = 0xff800000;
        local_9c0 = auVar58;
        _local_940 = _local_960;
      }
      else {
        auVar35 = vsqrtps_avx(auVar425);
        auVar214._0_4_ = fVar162 + fVar162;
        auVar214._4_4_ = fVar164 + fVar164;
        auVar214._8_4_ = fVar165 + fVar165;
        auVar214._12_4_ = fVar166 + fVar166;
        auVar214._16_4_ = fVar397 + fVar397;
        auVar214._20_4_ = fVar398 + fVar398;
        auVar214._24_4_ = fVar399 + fVar399;
        auVar214._28_4_ = fVar168 + fVar168;
        auVar34 = vrcpps_avx(auVar214);
        fVar168 = auVar34._0_4_;
        fVar198 = auVar34._4_4_;
        auVar101._4_4_ = auVar214._4_4_ * fVar198;
        auVar101._0_4_ = auVar214._0_4_ * fVar168;
        fVar251 = auVar34._8_4_;
        auVar101._8_4_ = auVar214._8_4_ * fVar251;
        fVar163 = auVar34._12_4_;
        auVar101._12_4_ = auVar214._12_4_ * fVar163;
        fVar252 = auVar34._16_4_;
        auVar101._16_4_ = auVar214._16_4_ * fVar252;
        fVar253 = auVar34._20_4_;
        auVar101._20_4_ = auVar214._20_4_ * fVar253;
        fVar272 = auVar34._24_4_;
        auVar101._24_4_ = auVar214._24_4_ * fVar272;
        auVar101._28_4_ = auVar214._28_4_;
        auVar213 = vsubps_avx(auVar407,auVar101);
        fVar168 = fVar168 + fVar168 * auVar213._0_4_;
        fVar198 = fVar198 + fVar198 * auVar213._4_4_;
        fVar251 = fVar251 + fVar251 * auVar213._8_4_;
        fVar163 = fVar163 + fVar163 * auVar213._12_4_;
        fVar252 = fVar252 + fVar252 * auVar213._16_4_;
        fVar253 = fVar253 + fVar253 * auVar213._20_4_;
        fVar272 = fVar272 + fVar272 * auVar213._24_4_;
        fVar273 = auVar34._28_4_ + auVar213._28_4_;
        auVar247._0_8_ = local_a20._0_8_ ^ 0x8000000080000000;
        auVar247._8_4_ = -local_a20._8_4_;
        auVar247._12_4_ = -local_a20._12_4_;
        auVar247._16_4_ = -local_a20._16_4_;
        auVar247._20_4_ = -local_a20._20_4_;
        auVar247._24_4_ = -local_a20._24_4_;
        auVar247._28_4_ = -local_a20._28_4_;
        auVar34 = vsubps_avx(auVar247,auVar35);
        fVar326 = auVar34._0_4_ * fVar168;
        fVar346 = auVar34._4_4_ * fVar198;
        auVar102._4_4_ = fVar346;
        auVar102._0_4_ = fVar326;
        fVar348 = auVar34._8_4_ * fVar251;
        auVar102._8_4_ = fVar348;
        fVar350 = auVar34._12_4_ * fVar163;
        auVar102._12_4_ = fVar350;
        fVar352 = auVar34._16_4_ * fVar252;
        auVar102._16_4_ = fVar352;
        fVar354 = auVar34._20_4_ * fVar253;
        auVar102._20_4_ = fVar354;
        fVar380 = auVar34._24_4_ * fVar272;
        auVar102._24_4_ = fVar380;
        auVar102._28_4_ = 0x80000000;
        auVar35 = vsubps_avx(auVar35,local_a20);
        fVar168 = auVar35._0_4_ * fVar168;
        fVar198 = auVar35._4_4_ * fVar198;
        auVar103._4_4_ = fVar198;
        auVar103._0_4_ = fVar168;
        fVar251 = auVar35._8_4_ * fVar251;
        auVar103._8_4_ = fVar251;
        fVar163 = auVar35._12_4_ * fVar163;
        auVar103._12_4_ = fVar163;
        fVar252 = auVar35._16_4_ * fVar252;
        auVar103._16_4_ = fVar252;
        fVar253 = auVar35._20_4_ * fVar253;
        auVar103._20_4_ = fVar253;
        fVar272 = auVar35._24_4_ * fVar272;
        auVar103._24_4_ = fVar272;
        auVar103._28_4_ = auVar141._28_4_;
        fVar274 = (fVar326 * local_5e0 + fVar402) * fVar254;
        fVar275 = (fVar346 * fStack_5dc + fVar411) * fVar291;
        fVar276 = (fVar348 * fStack_5d8 + fVar412) * fVar327;
        fVar295 = (fVar350 * fStack_5d4 + fVar413) * fVar368;
        fVar297 = (fVar352 * fStack_5d0 + fVar414) * fVar427;
        fVar322 = (fVar354 * fStack_5cc + fVar415) * fVar296;
        fVar323 = (fVar380 * fStack_5c8 + fVar416) * fVar298;
        auStack_810._12_4_ = auVar37._28_4_;
        auVar187._0_4_ = fVar355 + fVar227 * fVar274;
        auVar187._4_4_ = fVar369 + fVar271 * fVar275;
        auVar187._8_4_ = fVar372 + fVar294 * fVar276;
        auVar187._12_4_ = fVar375 + fVar344 * fVar295;
        auVar187._16_4_ = fVar378 + fVar377 * fVar297;
        auVar187._20_4_ = fVar381 + fVar41 * fVar322;
        auVar187._24_4_ = fVar384 + fVar49 * fVar323;
        auVar187._28_4_ = fVar387 + auVar35._28_4_ + fVar417;
        auVar104._4_4_ = (float)local_8c0._4_4_ * fVar346;
        auVar104._0_4_ = (float)local_8c0._0_4_ * fVar326;
        auVar104._8_4_ = fStack_8b8 * fVar348;
        auVar104._12_4_ = fStack_8b4 * fVar350;
        auVar104._16_4_ = fStack_8b0 * fVar352;
        auVar104._20_4_ = fStack_8ac * fVar354;
        auVar104._24_4_ = fStack_8a8 * fVar380;
        auVar104._28_4_ = fVar273;
        auVar213 = vsubps_avx(auVar104,auVar187);
        auVar215._0_4_ = fVar356 + fVar250 * fVar274;
        auVar215._4_4_ = fVar370 + fVar255 * fVar275;
        auVar215._8_4_ = fVar373 + fVar292 * fVar276;
        auVar215._12_4_ = fVar376 + fVar331 * fVar295;
        auVar215._16_4_ = fVar379 + fVar371 * fVar297;
        auVar215._20_4_ = fVar382 + fVar39 * fVar322;
        auVar215._24_4_ = fVar385 + fVar47 * fVar323;
        auVar215._28_4_ = fVar388 + fVar273;
        auVar286._0_4_ = (float)local_920._0_4_ * fVar326;
        auVar286._4_4_ = (float)local_920._4_4_ * fVar346;
        auVar286._8_4_ = fStack_918 * fVar348;
        auVar286._12_4_ = fStack_914 * fVar350;
        auVar286._16_4_ = fStack_910 * fVar352;
        auVar286._20_4_ = fStack_90c * fVar354;
        auVar286._24_4_ = fStack_908 * fVar380;
        auVar286._28_4_ = 0;
        auVar36 = vsubps_avx(auVar286,auVar215);
        auVar248._0_4_ = local_9e0 + fVar196 * fVar274;
        auVar248._4_4_ = fStack_9dc + fVar270 * fVar275;
        auVar248._8_4_ = fStack_9d8 + fVar293 * fVar276;
        auVar248._12_4_ = fStack_9d4 + fVar343 * fVar295;
        auVar248._16_4_ = fStack_9d0 + fVar374 * fVar297;
        auVar248._20_4_ = fStack_9cc + fVar40 * fVar322;
        auVar248._24_4_ = fStack_9c8 + fVar48 * fVar323;
        auVar248._28_4_ = fStack_9c4 + auVar34._28_4_;
        auVar105._4_4_ = fVar346 * (float)local_8e0._4_4_;
        auVar105._0_4_ = fVar326 * (float)local_8e0._0_4_;
        auVar105._8_4_ = fVar348 * fStack_8d8;
        auVar105._12_4_ = fVar350 * fStack_8d4;
        auVar105._16_4_ = fVar352 * fStack_8d0;
        auVar105._20_4_ = fVar354 * fStack_8cc;
        auVar105._24_4_ = fVar380 * fStack_8c8;
        auVar105._28_4_ = 0;
        auVar34 = vsubps_avx(auVar105,auVar248);
        auVar242 = auVar34._0_28_;
        fVar254 = (fVar168 * local_5e0 + fVar402) * fVar254;
        fVar291 = (fVar198 * fStack_5dc + fVar411) * fVar291;
        fVar327 = (fVar251 * fStack_5d8 + fVar412) * fVar327;
        fVar368 = (fVar163 * fStack_5d4 + fVar413) * fVar368;
        fVar427 = (fVar252 * fStack_5d0 + fVar414) * fVar427;
        fVar296 = (fVar253 * fStack_5cc + fVar415) * fVar296;
        fVar298 = (fVar272 * fStack_5c8 + fVar416) * fVar298;
        auVar310._0_4_ = fVar355 + fVar227 * fVar254;
        auVar310._4_4_ = fVar369 + fVar271 * fVar291;
        auVar310._8_4_ = fVar372 + fVar294 * fVar327;
        auVar310._12_4_ = fVar375 + fVar344 * fVar368;
        auVar310._16_4_ = fVar378 + fVar377 * fVar427;
        auVar310._20_4_ = fVar381 + fVar41 * fVar296;
        auVar310._24_4_ = fVar384 + fVar49 * fVar298;
        auVar310._28_4_ = fVar387 + (float)auStack_810._12_4_;
        auVar106._4_4_ = (float)local_8c0._4_4_ * fVar198;
        auVar106._0_4_ = (float)local_8c0._0_4_ * fVar168;
        auVar106._8_4_ = fStack_8b8 * fVar251;
        auVar106._12_4_ = fStack_8b4 * fVar163;
        auVar106._16_4_ = fStack_8b0 * fVar252;
        auVar106._20_4_ = fStack_8ac * fVar253;
        auVar106._24_4_ = fStack_8a8 * fVar272;
        auVar106._28_4_ = fStack_8a4;
        _local_940 = vsubps_avx(auVar106,auVar310);
        auVar311._0_4_ = fVar356 + fVar250 * fVar254;
        auVar311._4_4_ = fVar370 + fVar255 * fVar291;
        auVar311._8_4_ = fVar373 + fVar292 * fVar327;
        auVar311._12_4_ = fVar376 + fVar331 * fVar368;
        auVar311._16_4_ = fVar379 + fVar371 * fVar427;
        auVar311._20_4_ = fVar382 + fVar39 * fVar296;
        auVar311._24_4_ = fVar385 + fVar47 * fVar298;
        auVar311._28_4_ = fVar388 + local_940._28_4_;
        auVar107._4_4_ = (float)local_920._4_4_ * fVar198;
        auVar107._0_4_ = (float)local_920._0_4_ * fVar168;
        auVar107._8_4_ = fStack_918 * fVar251;
        auVar107._12_4_ = fStack_914 * fVar163;
        auVar107._16_4_ = fStack_910 * fVar252;
        auVar107._20_4_ = fStack_90c * fVar253;
        auVar107._24_4_ = fStack_908 * fVar272;
        auVar107._28_4_ = fStack_8a4;
        _local_960 = vsubps_avx(auVar107,auVar311);
        auVar287._0_4_ = local_9e0 + fVar196 * fVar254;
        auVar287._4_4_ = fStack_9dc + fVar270 * fVar291;
        auVar287._8_4_ = fStack_9d8 + fVar293 * fVar327;
        auVar287._12_4_ = fStack_9d4 + fVar343 * fVar368;
        auVar287._16_4_ = fStack_9d0 + fVar374 * fVar427;
        auVar287._20_4_ = fStack_9cc + fVar40 * fVar296;
        auVar287._24_4_ = fStack_9c8 + fVar48 * fVar298;
        auVar287._28_4_ = fStack_9c4 + fVar417 + 0.0;
        auVar108._4_4_ = fVar198 * (float)local_8e0._4_4_;
        auVar108._0_4_ = fVar168 * (float)local_8e0._0_4_;
        auVar108._8_4_ = fVar251 * fStack_8d8;
        auVar108._12_4_ = fVar163 * fStack_8d4;
        auVar108._16_4_ = fVar252 * fStack_8d0;
        auVar108._20_4_ = fVar253 * fStack_8cc;
        auVar108._24_4_ = fVar272 * fStack_8c8;
        auVar108._28_4_ = local_960._28_4_;
        _local_980 = vsubps_avx(auVar108,auVar287);
        auVar35 = vcmpps_avx(auVar425,auVar395,5);
        auVar288._8_4_ = 0x7f800000;
        auVar288._0_8_ = 0x7f8000007f800000;
        auVar288._12_4_ = 0x7f800000;
        auVar288._16_4_ = 0x7f800000;
        auVar288._20_4_ = 0x7f800000;
        auVar288._24_4_ = 0x7f800000;
        auVar288._28_4_ = 0x7f800000;
        auVar285 = vblendvps_avx(auVar288,auVar102,auVar35);
        auVar408._8_4_ = 0x7fffffff;
        auVar408._0_8_ = 0x7fffffff7fffffff;
        auVar408._12_4_ = 0x7fffffff;
        auVar408._16_4_ = 0x7fffffff;
        auVar408._20_4_ = 0x7fffffff;
        auVar408._24_4_ = 0x7fffffff;
        auVar408._28_4_ = 0x7fffffff;
        auVar34 = vandps_avx(auVar408,local_360);
        auVar34 = vmaxps_avx(local_540,auVar34);
        auVar425._8_4_ = 0x36000000;
        auVar425._0_8_ = 0x3600000036000000;
        auVar425._12_4_ = 0x36000000;
        auVar425._16_4_ = 0x36000000;
        auVar425._20_4_ = 0x36000000;
        auVar425._24_4_ = 0x36000000;
        auVar425._28_4_ = 0x36000000;
        auVar109._4_4_ = auVar34._4_4_ * 1.9073486e-06;
        auVar109._0_4_ = auVar34._0_4_ * 1.9073486e-06;
        auVar109._8_4_ = auVar34._8_4_ * 1.9073486e-06;
        auVar109._12_4_ = auVar34._12_4_ * 1.9073486e-06;
        auVar109._16_4_ = auVar34._16_4_ * 1.9073486e-06;
        auVar109._20_4_ = auVar34._20_4_ * 1.9073486e-06;
        auVar109._24_4_ = auVar34._24_4_ * 1.9073486e-06;
        auVar109._28_4_ = auVar34._28_4_;
        auVar34 = vandps_avx(auVar408,local_5c0);
        auVar34 = vcmpps_avx(auVar34,auVar109,1);
        auVar312._8_4_ = 0xff800000;
        auVar312._0_8_ = 0xff800000ff800000;
        auVar312._12_4_ = 0xff800000;
        auVar312._16_4_ = 0xff800000;
        auVar312._20_4_ = 0xff800000;
        auVar312._24_4_ = 0xff800000;
        auVar312._28_4_ = 0xff800000;
        auVar309 = vblendvps_avx(auVar312,auVar103,auVar35);
        auVar395 = auVar35 & auVar34;
        if ((((((((auVar395 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar395 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar395 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar395 >> 0x7f,0) != '\0') ||
              (auVar395 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar395 >> 0xbf,0) != '\0') ||
            (auVar395 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar395[0x1f] < '\0') {
          auVar193 = vandps_avx(auVar34,auVar35);
          auVar239 = vpackssdw_avx(auVar193._0_16_,auVar193._16_16_);
          auVar34 = vcmpps_avx(auVar33,ZEXT832(0) << 0x20,2);
          auVar464._8_4_ = 0xff800000;
          auVar464._0_8_ = 0xff800000ff800000;
          auVar464._12_4_ = 0xff800000;
          auVar464._16_4_ = 0xff800000;
          auVar464._20_4_ = 0xff800000;
          auVar464._24_4_ = 0xff800000;
          auVar464._28_4_ = 0xff800000;
          auVar448._8_4_ = 0x7f800000;
          auVar448._0_8_ = 0x7f8000007f800000;
          auVar448._12_4_ = 0x7f800000;
          auVar448._16_4_ = 0x7f800000;
          auVar448._20_4_ = 0x7f800000;
          auVar448._24_4_ = 0x7f800000;
          auVar448._28_4_ = 0x7f800000;
          auVar33 = vblendvps_avx(auVar448,auVar464,auVar34);
          auVar138 = vpmovsxwd_avx(auVar239);
          auVar239 = vpunpckhwd_avx(auVar239,auVar239);
          auVar409._16_16_ = auVar239;
          auVar409._0_16_ = auVar138;
          auVar285 = vblendvps_avx(auVar285,auVar33,auVar409);
          auVar425 = vblendvps_avx(auVar464,auVar448,auVar34);
          auVar309 = vblendvps_avx(auVar309,auVar425,auVar409);
          auVar33 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          auVar158._0_4_ = auVar33._0_4_ ^ auVar193._0_4_;
          auVar158._4_4_ = auVar33._4_4_ ^ auVar193._4_4_;
          auVar158._8_4_ = auVar33._8_4_ ^ auVar193._8_4_;
          auVar158._12_4_ = auVar33._12_4_ ^ auVar193._12_4_;
          auVar158._16_4_ = auVar33._16_4_ ^ auVar193._16_4_;
          auVar158._20_4_ = auVar33._20_4_ ^ auVar193._20_4_;
          auVar158._24_4_ = auVar33._24_4_ ^ auVar193._24_4_;
          auVar158._28_4_ = auVar33._28_4_ ^ auVar193._28_4_;
          auVar193 = vorps_avx(auVar34,auVar158);
          auVar193 = vandps_avx(auVar35,auVar193);
        }
        auVar410 = ZEXT3264(auVar36);
        _local_ac0 = auVar141;
        local_a00 = auVar213;
      }
      auVar426 = ZEXT3264(auVar425);
      auVar435 = ZEXT3264(auVar141);
      auVar396 = ZEXT1664(auVar205);
      _local_3e0 = _local_900;
      local_3c0 = vminps_avx(local_380,auVar285);
      _local_840 = vmaxps_avx(_local_900,auVar309);
      auVar313 = ZEXT3264(_local_840);
      local_3a0 = _local_840;
      auVar33 = vcmpps_avx(_local_900,local_3c0,2);
      local_780 = vandps_avx(auVar141,auVar33);
      auVar290 = ZEXT3264(local_780);
      auVar33 = vcmpps_avx(_local_840,local_380,2);
      local_7c0 = vandps_avx(auVar141,auVar33);
      auVar342 = ZEXT3264(local_7c0);
      auVar141 = vorps_avx(local_7c0,local_780);
      if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar141 >> 0x7f,0) != '\0') ||
            (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar141 >> 0xbf,0) != '\0') ||
          (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar141[0x1f] < '\0') {
        local_b00 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        local_7e0._0_4_ = auVar193._0_4_ ^ local_b00._0_4_;
        local_7e0._4_4_ = auVar193._4_4_ ^ local_b00._4_4_;
        local_7e0._8_4_ = auVar193._8_4_ ^ local_b00._8_4_;
        local_7e0._12_4_ = auVar193._12_4_ ^ local_b00._12_4_;
        local_7e0._16_4_ = auVar193._16_4_ ^ local_b00._16_4_;
        local_7e0._20_4_ = auVar193._20_4_ ^ local_b00._20_4_;
        local_7e0._24_4_ = auVar193._24_4_ ^ local_b00._24_4_;
        local_7e0._28_4_ = (uint)auVar193._28_4_ ^ (uint)local_b00._28_4_;
        auVar10 = local_8e0._0_28_;
        auVar290 = ZEXT3264(_local_8e0);
        auVar149._0_4_ =
             (float)local_8c0._0_4_ * auVar213._0_4_ +
             auVar410._0_4_ * (float)local_920._0_4_ + (float)local_8e0._0_4_ * auVar242._0_4_;
        auVar149._4_4_ =
             (float)local_8c0._4_4_ * auVar213._4_4_ +
             auVar410._4_4_ * (float)local_920._4_4_ + (float)local_8e0._4_4_ * auVar242._4_4_;
        auVar149._8_4_ =
             fStack_8b8 * auVar213._8_4_ + auVar410._8_4_ * fStack_918 + fStack_8d8 * auVar242._8_4_
        ;
        auVar149._12_4_ =
             fStack_8b4 * auVar213._12_4_ +
             auVar410._12_4_ * fStack_914 + fStack_8d4 * auVar242._12_4_;
        auVar149._16_4_ =
             fStack_8b0 * auVar213._16_4_ +
             auVar410._16_4_ * fStack_910 + fStack_8d0 * auVar242._16_4_;
        auVar149._20_4_ =
             fStack_8ac * auVar213._20_4_ +
             auVar410._20_4_ * fStack_90c + fStack_8cc * auVar242._20_4_;
        auVar149._24_4_ =
             fStack_8a8 * auVar213._24_4_ +
             auVar410._24_4_ * fStack_908 + fStack_8c8 * auVar242._24_4_;
        auVar149._28_4_ = auVar193._28_4_ + local_b00._28_4_ + auVar213._28_4_;
        auVar188._8_4_ = 0x7fffffff;
        auVar188._0_8_ = 0x7fffffff7fffffff;
        auVar188._12_4_ = 0x7fffffff;
        auVar188._16_4_ = 0x7fffffff;
        auVar188._20_4_ = 0x7fffffff;
        auVar188._24_4_ = 0x7fffffff;
        auVar188._28_4_ = 0x7fffffff;
        auVar141 = vandps_avx(auVar149,auVar188);
        auVar189._8_4_ = 0x3e99999a;
        auVar189._0_8_ = 0x3e99999a3e99999a;
        auVar189._12_4_ = 0x3e99999a;
        auVar189._16_4_ = 0x3e99999a;
        auVar189._20_4_ = 0x3e99999a;
        auVar189._24_4_ = 0x3e99999a;
        auVar189._28_4_ = 0x3e99999a;
        auVar141 = vcmpps_avx(auVar141,auVar189,1);
        auVar141 = vorps_avx(local_7e0,auVar141);
        auVar190._8_4_ = 3;
        auVar190._0_8_ = 0x300000003;
        auVar190._12_4_ = 3;
        auVar190._16_4_ = 3;
        auVar190._20_4_ = 3;
        auVar190._24_4_ = 3;
        auVar190._28_4_ = 3;
        auVar216._8_4_ = 2;
        auVar216._0_8_ = 0x200000002;
        auVar216._12_4_ = 2;
        auVar216._16_4_ = 2;
        auVar216._20_4_ = 2;
        auVar216._24_4_ = 2;
        auVar216._28_4_ = 2;
        auVar141 = vblendvps_avx(auVar216,auVar190,auVar141);
        local_800 = ZEXT432(uVar126);
        local_820 = vpshufd_avx(ZEXT416(uVar126),0);
        fVar168 = 0.0;
        auVar239 = vpcmpgtd_avx(auVar141._16_16_,local_820);
        auStack_810 = auVar37._16_16_;
        auVar138 = vpcmpgtd_avx(auVar141._0_16_,local_820);
        auVar191._16_16_ = auVar239;
        auVar191._0_16_ = auVar138;
        local_7a0 = vblendps_avx(ZEXT1632(auVar138),auVar191,0xf0);
        local_740 = vandnps_avx(local_7a0,local_780);
        auVar342 = ZEXT3264(local_740);
        auVar141 = local_780 & ~local_7a0;
        if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar141 >> 0x7f,0) == '\0') &&
              (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar141 >> 0xbf,0) == '\0') &&
            (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar141[0x1f]) {
          auVar239 = vshufps_avx(auVar205,auVar205,0);
          auVar150._16_16_ = auVar239;
          auVar150._0_16_ = auVar239;
        }
        else {
          local_a40._4_4_ = (float)local_900._4_4_ + (float)local_ae0._4_4_;
          local_a40._0_4_ = (float)local_900._0_4_ + (float)local_ae0._0_4_;
          fStack_a38 = fStack_8f8 + fStack_ad8;
          fStack_a34 = fStack_8f4 + fStack_ad4;
          fStack_a30 = fStack_8f0 + fStack_ad0;
          fStack_a2c = fStack_8ec + fStack_acc;
          fStack_a28 = fStack_8e8 + fStack_ac8;
          fStack_a24 = fStack_8e4 + fStack_ac4;
          do {
            auVar151._8_4_ = 0x7f800000;
            auVar151._0_8_ = 0x7f8000007f800000;
            auVar151._12_4_ = 0x7f800000;
            auVar151._16_4_ = 0x7f800000;
            auVar151._20_4_ = 0x7f800000;
            auVar151._24_4_ = 0x7f800000;
            auVar151._28_4_ = 0x7f800000;
            auVar141 = auVar342._0_32_;
            auVar193 = vblendvps_avx(auVar151,_local_900,auVar141);
            auVar33 = vshufps_avx(auVar193,auVar193,0xb1);
            auVar33 = vminps_avx(auVar193,auVar33);
            auVar34 = vshufpd_avx(auVar33,auVar33,5);
            auVar33 = vminps_avx(auVar33,auVar34);
            auVar34 = vperm2f128_avx(auVar33,auVar33,1);
            auVar33 = vminps_avx(auVar33,auVar34);
            auVar193 = vcmpps_avx(auVar193,auVar33,0);
            auVar33 = auVar141 & auVar193;
            if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar33 >> 0x7f,0) != '\0') ||
                  (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar33 >> 0xbf,0) != '\0') ||
                (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar33[0x1f] < '\0') {
              auVar141 = vandps_avx(auVar193,auVar141);
            }
            uVar121 = vmovmskps_avx(auVar141);
            uVar124 = 0;
            if (uVar121 != 0) {
              for (; (uVar121 >> uVar124 & 1) == 0; uVar124 = uVar124 + 1) {
              }
            }
            uVar122 = (ulong)uVar124;
            *(undefined4 *)(local_740 + uVar122 * 4) = 0;
            fVar168 = local_1a0[uVar122];
            uVar124 = *(uint *)(local_3e0 + uVar122 * 4);
            fVar250 = auVar172._0_4_;
            if ((float)local_a60._0_4_ < 0.0) {
              fVar250 = sqrtf((float)local_a60._0_4_);
            }
            auVar205 = vminps_avx(_local_b40,_local_b60);
            auVar239 = vmaxps_avx(_local_b40,_local_b60);
            auVar138 = vminps_avx(_local_b50,_local_b70);
            auVar177 = vminps_avx(auVar205,auVar138);
            auVar205 = vmaxps_avx(_local_b50,_local_b70);
            auVar138 = vmaxps_avx(auVar239,auVar205);
            auVar231._8_4_ = 0x7fffffff;
            auVar231._0_8_ = 0x7fffffff7fffffff;
            auVar231._12_4_ = 0x7fffffff;
            auVar239 = vandps_avx(auVar177,auVar231);
            auVar205 = vandps_avx(auVar138,auVar231);
            auVar239 = vmaxps_avx(auVar239,auVar205);
            auVar205 = vmovshdup_avx(auVar239);
            auVar205 = vmaxss_avx(auVar205,auVar239);
            auVar239 = vshufpd_avx(auVar239,auVar239,1);
            auVar239 = vmaxss_avx(auVar239,auVar205);
            local_ac0._0_4_ = auVar239._0_4_ * 1.9073486e-06;
            local_9c0._0_4_ = fVar250 * 1.9073486e-06;
            local_8a0._0_16_ = vshufps_avx(auVar138,auVar138,0xff);
            auVar239 = vinsertps_avx(ZEXT416(uVar124),ZEXT416((uint)fVar168),0x10);
            auVar396 = ZEXT1664(auVar239);
            lVar127 = 5;
            do {
              auVar389 = auVar396._0_16_;
              auVar239 = vmovshdup_avx(auVar389);
              fVar168 = auVar239._0_4_;
              fVar198 = 1.0 - fVar168;
              fVar250 = fVar198 * fVar198 * fVar198;
              fVar196 = fVar168 * fVar168 * fVar168;
              fVar227 = fVar168 * fVar198;
              auVar239 = vshufps_avx(ZEXT416((uint)(fVar196 * 0.16666667)),
                                     ZEXT416((uint)(fVar196 * 0.16666667)),0);
              auVar205 = ZEXT416((uint)((fVar196 * 4.0 + fVar250 +
                                        fVar168 * fVar227 * 12.0 + fVar198 * fVar227 * 6.0) *
                                       0.16666667));
              auVar205 = vshufps_avx(auVar205,auVar205,0);
              auVar138 = ZEXT416((uint)((fVar250 * 4.0 + fVar196 +
                                        fVar198 * fVar227 * 12.0 + fVar168 * fVar227 * 6.0) *
                                       0.16666667));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar177 = vshufps_avx(auVar389,auVar389,0);
              auVar202._0_4_ = auVar177._0_4_ * (float)local_a50._0_4_ + 0.0;
              auVar202._4_4_ = auVar177._4_4_ * (float)local_a50._4_4_ + 0.0;
              auVar202._8_4_ = auVar177._8_4_ * fStack_a48 + 0.0;
              auVar202._12_4_ = auVar177._12_4_ * fStack_a44 + 0.0;
              auVar177 = vshufps_avx(ZEXT416((uint)(fVar250 * 0.16666667)),
                                     ZEXT416((uint)(fVar250 * 0.16666667)),0);
              auVar134._0_4_ =
                   auVar177._0_4_ * (float)local_b40._0_4_ +
                   auVar138._0_4_ * (float)local_b60._0_4_ +
                   auVar239._0_4_ * (float)local_b70._0_4_ + auVar205._0_4_ * (float)local_b50._0_4_
              ;
              auVar134._4_4_ =
                   auVar177._4_4_ * (float)local_b40._4_4_ +
                   auVar138._4_4_ * (float)local_b60._4_4_ +
                   auVar239._4_4_ * (float)local_b70._4_4_ + auVar205._4_4_ * (float)local_b50._4_4_
              ;
              auVar134._8_4_ =
                   auVar177._8_4_ * fStack_b38 +
                   auVar138._8_4_ * fStack_b58 +
                   auVar239._8_4_ * fStack_b68 + auVar205._8_4_ * fStack_b48;
              auVar134._12_4_ =
                   auVar177._12_4_ * fStack_b34 +
                   auVar138._12_4_ * fStack_b54 +
                   auVar239._12_4_ * fStack_b64 + auVar205._12_4_ * fStack_b44;
              local_a00._0_16_ = auVar134;
              auVar239 = vsubps_avx(auVar202,auVar134);
              local_9e0 = auVar239._0_4_;
              fStack_9dc = auVar239._4_4_;
              fStack_9d8 = auVar239._8_4_;
              fStack_9d4 = auVar239._12_4_;
              auVar239 = vdpps_avx(auVar239,auVar239,0x7f);
              fVar250 = auVar239._0_4_;
              local_ce0 = auVar396._0_4_;
              if (fVar250 < 0.0) {
                fVar196 = sqrtf(fVar250);
              }
              else {
                auVar205 = vsqrtss_avx(auVar239,auVar239);
                fVar196 = auVar205._0_4_;
              }
              auVar205 = ZEXT416((uint)(fVar168 * fVar168 * 0.5));
              auVar205 = vshufps_avx(auVar205,auVar205,0);
              auVar138 = ZEXT416((uint)((fVar198 * fVar198 + fVar227 * 4.0) * 0.5));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar177 = ZEXT416((uint)((fVar168 * -fVar168 - fVar227 * 4.0) * 0.5));
              auVar177 = vshufps_avx(auVar177,auVar177,0);
              auVar137 = ZEXT416((uint)(fVar198 * -fVar198 * 0.5));
              auVar137 = vshufps_avx(auVar137,auVar137,0);
              auVar357._0_4_ =
                   (float)local_b40._0_4_ * auVar137._0_4_ +
                   (float)local_b60._0_4_ * auVar177._0_4_ +
                   (float)local_b70._0_4_ * auVar205._0_4_ + (float)local_b50._0_4_ * auVar138._0_4_
              ;
              auVar357._4_4_ =
                   (float)local_b40._4_4_ * auVar137._4_4_ +
                   (float)local_b60._4_4_ * auVar177._4_4_ +
                   (float)local_b70._4_4_ * auVar205._4_4_ + (float)local_b50._4_4_ * auVar138._4_4_
              ;
              auVar357._8_4_ =
                   fStack_b38 * auVar137._8_4_ +
                   fStack_b58 * auVar177._8_4_ +
                   fStack_b68 * auVar205._8_4_ + fStack_b48 * auVar138._8_4_;
              auVar357._12_4_ =
                   fStack_b34 * auVar137._12_4_ +
                   fStack_b54 * auVar177._12_4_ +
                   fStack_b64 * auVar205._12_4_ + fStack_b44 * auVar138._12_4_;
              auVar205 = vshufps_avx(auVar389,auVar389,0x55);
              auVar138 = ZEXT416((uint)(fVar198 - (fVar168 + fVar168)));
              auVar177 = vshufps_avx(auVar138,auVar138,0);
              auVar138 = ZEXT416((uint)(fVar168 - (fVar198 + fVar198)));
              auVar137 = vshufps_avx(auVar138,auVar138,0);
              auVar11 = vshufps_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar198),0);
              auVar138 = vdpps_avx(auVar357,auVar357,0x7f);
              auVar173._0_4_ =
                   (float)local_b40._0_4_ * auVar11._0_4_ +
                   (float)local_b60._0_4_ * auVar137._0_4_ +
                   (float)local_b70._0_4_ * auVar205._0_4_ + (float)local_b50._0_4_ * auVar177._0_4_
              ;
              auVar173._4_4_ =
                   (float)local_b40._4_4_ * auVar11._4_4_ +
                   (float)local_b60._4_4_ * auVar137._4_4_ +
                   (float)local_b70._4_4_ * auVar205._4_4_ + (float)local_b50._4_4_ * auVar177._4_4_
              ;
              auVar173._8_4_ =
                   fStack_b38 * auVar11._8_4_ +
                   fStack_b58 * auVar137._8_4_ +
                   fStack_b68 * auVar205._8_4_ + fStack_b48 * auVar177._8_4_;
              auVar173._12_4_ =
                   fStack_b34 * auVar11._12_4_ +
                   fStack_b54 * auVar137._12_4_ +
                   fStack_b64 * auVar205._12_4_ + fStack_b44 * auVar177._12_4_;
              auVar205 = vblendps_avx(auVar138,_DAT_01f7aa10,0xe);
              auVar177 = vrsqrtss_avx(auVar205,auVar205);
              fVar227 = auVar177._0_4_;
              fVar168 = auVar138._0_4_;
              auVar177 = vdpps_avx(auVar357,auVar173,0x7f);
              auVar137 = vshufps_avx(auVar138,auVar138,0);
              auVar174._0_4_ = auVar173._0_4_ * auVar137._0_4_;
              auVar174._4_4_ = auVar173._4_4_ * auVar137._4_4_;
              auVar174._8_4_ = auVar173._8_4_ * auVar137._8_4_;
              auVar174._12_4_ = auVar173._12_4_ * auVar137._12_4_;
              auVar177 = vshufps_avx(auVar177,auVar177,0);
              auVar258._0_4_ = auVar357._0_4_ * auVar177._0_4_;
              auVar258._4_4_ = auVar357._4_4_ * auVar177._4_4_;
              auVar258._8_4_ = auVar357._8_4_ * auVar177._8_4_;
              auVar258._12_4_ = auVar357._12_4_ * auVar177._12_4_;
              auVar11 = vsubps_avx(auVar174,auVar258);
              auVar177 = vrcpss_avx(auVar205,auVar205);
              auVar205 = vmaxss_avx(ZEXT416((uint)local_ac0._0_4_),
                                    ZEXT416((uint)(local_ce0 * (float)local_9c0._0_4_)));
              auVar410 = ZEXT1664(auVar205);
              auVar177 = ZEXT416((uint)(auVar177._0_4_ * (2.0 - fVar168 * auVar177._0_4_)));
              auVar177 = vshufps_avx(auVar177,auVar177,0);
              uVar122 = CONCAT44(auVar357._4_4_,auVar357._0_4_);
              auVar279._0_8_ = uVar122 ^ 0x8000000080000000;
              auVar279._8_4_ = -auVar357._8_4_;
              auVar279._12_4_ = -auVar357._12_4_;
              auVar137 = ZEXT416((uint)(fVar227 * 1.5 + fVar168 * -0.5 * fVar227 * fVar227 * fVar227
                                       ));
              auVar137 = vshufps_avx(auVar137,auVar137,0);
              auVar232._0_4_ = auVar137._0_4_ * auVar11._0_4_ * auVar177._0_4_;
              auVar232._4_4_ = auVar137._4_4_ * auVar11._4_4_ * auVar177._4_4_;
              auVar232._8_4_ = auVar137._8_4_ * auVar11._8_4_ * auVar177._8_4_;
              auVar232._12_4_ = auVar137._12_4_ * auVar11._12_4_ * auVar177._12_4_;
              auVar302._0_4_ = auVar357._0_4_ * auVar137._0_4_;
              auVar302._4_4_ = auVar357._4_4_ * auVar137._4_4_;
              auVar302._8_4_ = auVar357._8_4_ * auVar137._8_4_;
              auVar302._12_4_ = auVar357._12_4_ * auVar137._12_4_;
              if (fVar168 < 0.0) {
                local_a80._0_16_ = auVar232;
                fVar168 = sqrtf(fVar168);
                auVar410 = ZEXT464(auVar205._0_4_);
                auVar232 = local_a80._0_16_;
              }
              else {
                auVar138 = vsqrtss_avx(auVar138,auVar138);
                fVar168 = auVar138._0_4_;
              }
              auVar115._4_4_ = fStack_9dc;
              auVar115._0_4_ = local_9e0;
              auVar115._8_4_ = fStack_9d8;
              auVar115._12_4_ = fStack_9d4;
              auVar138 = vdpps_avx(auVar115,auVar302,0x7f);
              fVar168 = ((float)local_ac0._0_4_ / fVar168) * (fVar196 + 1.0) +
                        auVar410._0_4_ + fVar196 * (float)local_ac0._0_4_;
              auVar177 = vdpps_avx(auVar279,auVar302,0x7f);
              auVar137 = vdpps_avx(auVar115,auVar232,0x7f);
              auVar11 = vdpps_avx(_local_a50,auVar302,0x7f);
              auVar12 = vdpps_avx(auVar115,auVar279,0x7f);
              fVar196 = auVar177._0_4_ + auVar137._0_4_;
              fVar227 = auVar138._0_4_;
              auVar135._0_4_ = fVar227 * fVar227;
              auVar135._4_4_ = auVar138._4_4_ * auVar138._4_4_;
              auVar135._8_4_ = auVar138._8_4_ * auVar138._8_4_;
              auVar135._12_4_ = auVar138._12_4_ * auVar138._12_4_;
              auVar137 = vsubps_avx(auVar239,auVar135);
              auVar177 = vdpps_avx(auVar115,_local_a50,0x7f);
              fVar198 = auVar12._0_4_ - fVar227 * fVar196;
              fVar251 = auVar177._0_4_ - fVar227 * auVar11._0_4_;
              auVar177 = vrsqrtss_avx(auVar137,auVar137);
              fVar163 = auVar137._0_4_;
              fVar227 = auVar177._0_4_;
              fVar227 = fVar227 * 1.5 + fVar163 * -0.5 * fVar227 * fVar227 * fVar227;
              if (fVar163 < 0.0) {
                local_a80._0_16_ = ZEXT416((uint)fVar196);
                local_860._0_4_ = fVar198;
                local_880._0_4_ = fVar251;
                local_a20._0_4_ = fVar227;
                fVar163 = sqrtf(fVar163);
                auVar410 = ZEXT464(auVar205._0_4_);
                fVar227 = (float)local_a20._0_4_;
                fVar198 = (float)local_860._0_4_;
                fVar251 = (float)local_880._0_4_;
                auVar205 = local_a80._0_16_;
              }
              else {
                auVar205 = vsqrtss_avx(auVar137,auVar137);
                fVar163 = auVar205._0_4_;
                auVar205 = ZEXT416((uint)fVar196);
              }
              auVar435 = ZEXT1664(auVar138);
              auVar426 = ZEXT464((uint)fVar168);
              auVar140 = vpermilps_avx(local_a00._0_16_,0xff);
              auVar12 = vshufps_avx(auVar357,auVar357,0xff);
              fVar196 = fVar198 * fVar227 - auVar12._0_4_;
              auVar259._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
              auVar259._8_4_ = auVar11._8_4_ ^ 0x80000000;
              auVar259._12_4_ = auVar11._12_4_ ^ 0x80000000;
              auVar280._0_4_ = -fVar196;
              auVar280._4_4_ = 0x80000000;
              auVar280._8_4_ = 0x80000000;
              auVar280._12_4_ = 0x80000000;
              auVar290 = ZEXT1664(auVar280);
              auVar177 = vinsertps_avx(auVar280,ZEXT416((uint)(fVar251 * fVar227)),0x1c);
              auVar137 = vmovsldup_avx(ZEXT416((uint)(auVar205._0_4_ * fVar251 * fVar227 -
                                                     auVar11._0_4_ * fVar196)));
              auVar177 = vdivps_avx(auVar177,auVar137);
              auVar205 = vinsertps_avx(auVar205,auVar259,0x10);
              auVar205 = vdivps_avx(auVar205,auVar137);
              auVar137 = vmovsldup_avx(auVar138);
              auVar140 = ZEXT416((uint)(fVar163 - auVar140._0_4_));
              auVar11 = vmovsldup_avx(auVar140);
              auVar203._0_4_ = auVar137._0_4_ * auVar177._0_4_ + auVar11._0_4_ * auVar205._0_4_;
              auVar203._4_4_ = auVar137._4_4_ * auVar177._4_4_ + auVar11._4_4_ * auVar205._4_4_;
              auVar203._8_4_ = auVar137._8_4_ * auVar177._8_4_ + auVar11._8_4_ * auVar205._8_4_;
              auVar203._12_4_ = auVar137._12_4_ * auVar177._12_4_ + auVar11._12_4_ * auVar205._12_4_
              ;
              auVar177 = vsubps_avx(auVar389,auVar203);
              auVar396 = ZEXT1664(auVar177);
              auVar204._8_4_ = 0x7fffffff;
              auVar204._0_8_ = 0x7fffffff7fffffff;
              auVar204._12_4_ = 0x7fffffff;
              auVar205 = vandps_avx(auVar138,auVar204);
              if (auVar205._0_4_ < fVar168) {
                auVar233._8_4_ = 0x7fffffff;
                auVar233._0_8_ = 0x7fffffff7fffffff;
                auVar233._12_4_ = 0x7fffffff;
                auVar205 = vandps_avx(auVar140,auVar233);
                if (auVar205._0_4_ <
                    (float)local_8a0._0_4_ * 1.9073486e-06 + auVar410._0_4_ + fVar168) {
                  fVar196 = auVar177._0_4_ + (float)local_9a0._0_4_;
                  if ((fVar196 < fVar228) ||
                     (fVar227 = *(float *)(ray + k * 4 + 0x100), fVar227 < fVar196)) break;
                  auVar205 = vmovshdup_avx(auVar177);
                  fVar198 = auVar205._0_4_;
                  if ((fVar198 < 0.0) || (1.0 < fVar198)) break;
                  auVar239 = vrsqrtss_avx(auVar239,auVar239);
                  fVar251 = auVar239._0_4_;
                  auVar290 = ZEXT464((uint)(fVar250 * -0.5));
                  pGVar27 = (context->scene->geometries).items[uVar120].ptr;
                  if ((pGVar27->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  auVar239 = ZEXT416((uint)(fVar251 * 1.5 +
                                           fVar250 * -0.5 * fVar251 * fVar251 * fVar251));
                  auVar239 = vshufps_avx(auVar239,auVar239,0);
                  auVar234._0_4_ = auVar239._0_4_ * local_9e0;
                  auVar234._4_4_ = auVar239._4_4_ * fStack_9dc;
                  auVar234._8_4_ = auVar239._8_4_ * fStack_9d8;
                  auVar234._12_4_ = auVar239._12_4_ * fStack_9d4;
                  auVar175._0_4_ = auVar357._0_4_ + auVar12._0_4_ * auVar234._0_4_;
                  auVar175._4_4_ = auVar357._4_4_ + auVar12._4_4_ * auVar234._4_4_;
                  auVar175._8_4_ = auVar357._8_4_ + auVar12._8_4_ * auVar234._8_4_;
                  auVar175._12_4_ = auVar357._12_4_ + auVar12._12_4_ * auVar234._12_4_;
                  auVar239 = vshufps_avx(auVar234,auVar234,0xc9);
                  auVar205 = vshufps_avx(auVar357,auVar357,0xc9);
                  auVar235._0_4_ = auVar205._0_4_ * auVar234._0_4_;
                  auVar235._4_4_ = auVar205._4_4_ * auVar234._4_4_;
                  auVar235._8_4_ = auVar205._8_4_ * auVar234._8_4_;
                  auVar235._12_4_ = auVar205._12_4_ * auVar234._12_4_;
                  auVar260._0_4_ = auVar357._0_4_ * auVar239._0_4_;
                  auVar260._4_4_ = auVar357._4_4_ * auVar239._4_4_;
                  auVar260._8_4_ = auVar357._8_4_ * auVar239._8_4_;
                  auVar260._12_4_ = auVar357._12_4_ * auVar239._12_4_;
                  auVar389 = vsubps_avx(auVar260,auVar235);
                  auVar239 = vshufps_avx(auVar389,auVar389,0xc9);
                  auVar205 = vshufps_avx(auVar175,auVar175,0xc9);
                  auVar290 = ZEXT1664(auVar205);
                  auVar261._0_4_ = auVar205._0_4_ * auVar239._0_4_;
                  auVar261._4_4_ = auVar205._4_4_ * auVar239._4_4_;
                  auVar261._8_4_ = auVar205._8_4_ * auVar239._8_4_;
                  auVar261._12_4_ = auVar205._12_4_ * auVar239._12_4_;
                  auVar239 = vshufps_avx(auVar389,auVar389,0xd2);
                  auVar176._0_4_ = auVar175._0_4_ * auVar239._0_4_;
                  auVar176._4_4_ = auVar175._4_4_ * auVar239._4_4_;
                  auVar176._8_4_ = auVar175._8_4_ * auVar239._8_4_;
                  auVar176._12_4_ = auVar175._12_4_ * auVar239._12_4_;
                  auVar239 = vsubps_avx(auVar261,auVar176);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar27->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar196;
                    uVar8 = vextractps_avx(auVar239,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                    uVar8 = vextractps_avx(auVar239,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                    *(int *)(ray + k * 4 + 0x1c0) = auVar239._0_4_;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar198;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_a88;
                    *(uint *)(ray + k * 4 + 0x240) = uVar120;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar31 = context->user;
                  auStack_690 = vshufps_avx(auVar177,auVar177,0x55);
                  auStack_6f0 = vshufps_avx(auVar239,auVar239,0x55);
                  auStack_6d0 = vshufps_avx(auVar239,auVar239,0xaa);
                  auStack_6b0 = vshufps_avx(auVar239,auVar239,0);
                  local_700 = (RTCHitN  [16])auStack_6f0;
                  local_6e0 = auStack_6d0;
                  local_6c0 = auStack_6b0;
                  local_6a0 = auStack_690;
                  local_680 = ZEXT832(0) << 0x20;
                  local_660 = local_580._0_8_;
                  uStack_658 = local_580._8_8_;
                  uStack_650 = local_580._16_8_;
                  uStack_648 = local_580._24_8_;
                  local_640 = local_560._0_8_;
                  uStack_638 = local_560._8_8_;
                  uStack_630 = local_560._16_8_;
                  uStack_628 = local_560._24_8_;
                  *(undefined8 *)(local_a90 + 8) = local_b00._0_8_;
                  *(undefined8 *)(local_a90 + 10) = local_b00._8_8_;
                  *(undefined8 *)(local_a90 + 0xc) = local_b00._16_8_;
                  *(undefined8 *)(local_a90 + 0xe) = local_b00._24_8_;
                  *(undefined8 *)local_a90 = local_b00._0_8_;
                  *(undefined8 *)(local_a90 + 2) = local_b00._8_8_;
                  *(undefined8 *)(local_a90 + 4) = local_b00._16_8_;
                  *(undefined8 *)(local_a90 + 6) = local_b00._24_8_;
                  local_620 = pRVar31->instID[0];
                  uStack_61c = local_620;
                  uStack_618 = local_620;
                  uStack_614 = local_620;
                  uStack_610 = local_620;
                  uStack_60c = local_620;
                  uStack_608 = local_620;
                  uStack_604 = local_620;
                  local_600 = pRVar31->instPrimID[0];
                  uStack_5fc = local_600;
                  uStack_5f8 = local_600;
                  uStack_5f4 = local_600;
                  uStack_5f0 = local_600;
                  uStack_5ec = local_600;
                  uStack_5e8 = local_600;
                  uStack_5e4 = local_600;
                  *(float *)(ray + k * 4 + 0x100) = fVar196;
                  local_ba0 = *local_a98;
                  local_b90 = *local_aa0;
                  local_b30.valid = (int *)local_ba0;
                  local_b30.geometryUserPtr = pGVar27->userPtr;
                  local_b30.context = context->user;
                  local_b30.hit = local_700;
                  local_b30.N = 8;
                  local_b30.ray = (RTCRayN *)ray;
                  if (pGVar27->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar290 = ZEXT1664(auVar205);
                    auVar396 = ZEXT1664(auVar177);
                    auVar410 = ZEXT1664(auVar410._0_16_);
                    auVar426 = ZEXT464((uint)fVar168);
                    auVar435 = ZEXT1664(auVar138);
                    (*pGVar27->intersectionFilterN)(&local_b30);
                  }
                  auVar239 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                  auVar205 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                  auVar217._16_16_ = auVar205;
                  auVar217._0_16_ = auVar239;
                  auVar141 = local_b00 & ~auVar217;
                  if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar141 >> 0x7f,0) != '\0') ||
                        (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar141 >> 0xbf,0) != '\0') ||
                      (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar141[0x1f] < '\0') {
                    p_Var32 = context->args->filter;
                    if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar27->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar290 = ZEXT1664(auVar290._0_16_);
                      auVar396 = ZEXT1664(auVar396._0_16_);
                      auVar410 = ZEXT1664(auVar410._0_16_);
                      auVar426 = ZEXT1664(auVar426._0_16_);
                      auVar435 = ZEXT1664(auVar435._0_16_);
                      (*p_Var32)(&local_b30);
                    }
                    auVar239 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                    auVar205 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                    auVar152._16_16_ = auVar205;
                    auVar152._0_16_ = auVar239;
                    auVar141 = local_b00 & ~auVar152;
                    if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar141 >> 0x7f,0) != '\0') ||
                          (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar141 >> 0xbf,0) != '\0') ||
                        (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar141[0x1f] < '\0') {
                      auVar153._0_4_ = auVar239._0_4_ ^ local_b00._0_4_;
                      auVar153._4_4_ = auVar239._4_4_ ^ local_b00._4_4_;
                      auVar153._8_4_ = auVar239._8_4_ ^ local_b00._8_4_;
                      auVar153._12_4_ = auVar239._12_4_ ^ local_b00._12_4_;
                      auVar153._16_4_ = auVar205._0_4_ ^ local_b00._16_4_;
                      auVar153._20_4_ = auVar205._4_4_ ^ local_b00._20_4_;
                      auVar153._24_4_ = auVar205._8_4_ ^ local_b00._24_4_;
                      auVar153._28_4_ = auVar205._12_4_ ^ local_b00._28_4_;
                      auVar141 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])local_b30.hit);
                      *(undefined1 (*) [32])(local_b30.ray + 0x180) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0x20));
                      *(undefined1 (*) [32])(local_b30.ray + 0x1a0) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0x40));
                      *(undefined1 (*) [32])(local_b30.ray + 0x1c0) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0x60));
                      *(undefined1 (*) [32])(local_b30.ray + 0x1e0) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0x80));
                      *(undefined1 (*) [32])(local_b30.ray + 0x200) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0xa0));
                      *(undefined1 (*) [32])(local_b30.ray + 0x220) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0xc0));
                      *(undefined1 (*) [32])(local_b30.ray + 0x240) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0xe0));
                      *(undefined1 (*) [32])(local_b30.ray + 0x260) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0x100));
                      *(undefined1 (*) [32])(local_b30.ray + 0x280) = auVar141;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar227;
                  break;
                }
              }
              lVar127 = lVar127 + -1;
            } while (lVar127 != 0);
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar150._4_4_ = uVar8;
            auVar150._0_4_ = uVar8;
            auVar150._8_4_ = uVar8;
            auVar150._12_4_ = uVar8;
            auVar150._16_4_ = uVar8;
            auVar150._20_4_ = uVar8;
            auVar150._24_4_ = uVar8;
            auVar150._28_4_ = uVar8;
            auVar193 = vcmpps_avx(_local_a40,auVar150,2);
            fVar168 = auVar193._28_4_;
            auVar141 = vandps_avx(auVar193,local_740);
            auVar342 = ZEXT3264(auVar141);
            auVar193 = local_740 & auVar193;
            local_740 = auVar141;
          } while ((((((((auVar193 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar193 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar193 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar193 >> 0x7f,0) != '\0') ||
                     (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar193 >> 0xbf,0) != '\0') ||
                   (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar193[0x1f] < '\0');
          auVar342 = ZEXT3264(local_3a0);
          auVar10 = local_8e0._0_28_;
        }
        auVar313 = ZEXT3264(_local_920);
        auVar192._0_4_ =
             (float)local_8c0._0_4_ * (float)local_940._0_4_ +
             local_920._0_4_ * (float)local_960._0_4_ + auVar10._0_4_ * (float)local_980._0_4_;
        auVar192._4_4_ =
             (float)local_8c0._4_4_ * (float)local_940._4_4_ +
             local_920._4_4_ * (float)local_960._4_4_ + auVar10._4_4_ * (float)local_980._4_4_;
        auVar192._8_4_ =
             fStack_8b8 * fStack_938 + local_920._8_4_ * fStack_958 + auVar10._8_4_ * fStack_978;
        auVar192._12_4_ =
             fStack_8b4 * fStack_934 + local_920._12_4_ * fStack_954 + auVar10._12_4_ * fStack_974;
        auVar192._16_4_ =
             fStack_8b0 * fStack_930 + local_920._16_4_ * fStack_950 + auVar10._16_4_ * fStack_970;
        auVar192._20_4_ =
             fStack_8ac * fStack_92c + local_920._20_4_ * fStack_94c + auVar10._20_4_ * fStack_96c;
        auVar192._24_4_ =
             fStack_8a8 * fStack_928 + local_920._24_4_ * fStack_948 + auVar10._24_4_ * fStack_968;
        auVar192._28_4_ = fVar168 + fVar168 + auVar342._28_4_;
        auVar218._8_4_ = 0x7fffffff;
        auVar218._0_8_ = 0x7fffffff7fffffff;
        auVar218._12_4_ = 0x7fffffff;
        auVar218._16_4_ = 0x7fffffff;
        auVar218._20_4_ = 0x7fffffff;
        auVar218._24_4_ = 0x7fffffff;
        auVar218._28_4_ = 0x7fffffff;
        auVar141 = vandps_avx(auVar192,auVar218);
        auVar219._8_4_ = 0x3e99999a;
        auVar219._0_8_ = 0x3e99999a3e99999a;
        auVar219._12_4_ = 0x3e99999a;
        auVar219._16_4_ = 0x3e99999a;
        auVar219._20_4_ = 0x3e99999a;
        auVar219._24_4_ = 0x3e99999a;
        auVar219._28_4_ = 0x3e99999a;
        auVar141 = vcmpps_avx(auVar141,auVar219,1);
        auVar193 = vorps_avx(auVar141,local_7e0);
        auVar220._0_4_ = (float)local_ae0._0_4_ + (float)local_840._0_4_;
        auVar220._4_4_ = (float)local_ae0._4_4_ + (float)local_840._4_4_;
        auVar220._8_4_ = fStack_ad8 + fStack_838;
        auVar220._12_4_ = fStack_ad4 + fStack_834;
        auVar220._16_4_ = fStack_ad0 + fStack_830;
        auVar220._20_4_ = fStack_acc + fStack_82c;
        auVar220._24_4_ = fStack_ac8 + fStack_828;
        auVar220._28_4_ = fStack_ac4 + fStack_824;
        auVar141 = vcmpps_avx(auVar220,auVar150,2);
        _local_980 = vandps_avx(auVar141,local_7c0);
        auVar221._8_4_ = 3;
        auVar221._0_8_ = 0x300000003;
        auVar221._12_4_ = 3;
        auVar221._16_4_ = 3;
        auVar221._20_4_ = 3;
        auVar221._24_4_ = 3;
        auVar221._28_4_ = 3;
        auVar249._8_4_ = 2;
        auVar249._0_8_ = 0x200000002;
        auVar249._12_4_ = 2;
        auVar249._16_4_ = 2;
        auVar249._20_4_ = 2;
        auVar249._24_4_ = 2;
        auVar249._28_4_ = 2;
        auVar141 = vblendvps_avx(auVar249,auVar221,auVar193);
        auVar239 = vpcmpgtd_avx(auVar141._16_16_,local_820);
        auVar205 = vpshufd_avx(local_800._0_16_,0);
        auVar205 = vpcmpgtd_avx(auVar141._0_16_,auVar205);
        auVar222._16_16_ = auVar239;
        auVar222._0_16_ = auVar150._0_16_;
        _local_960 = vblendps_avx(ZEXT1632(auVar205),auVar222,0xf0);
        auVar141 = vandnps_avx(_local_960,_local_980);
        auVar193 = _local_980 & ~_local_960;
        local_760 = auVar141;
        if ((((((((auVar193 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar193 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar193 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar193 >> 0x7f,0) != '\0') ||
              (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar193 >> 0xbf,0) != '\0') ||
            (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar193[0x1f] < '\0') {
          local_940._4_4_ = (float)local_ae0._4_4_ + local_3a0._4_4_;
          local_940._0_4_ = (float)local_ae0._0_4_ + local_3a0._0_4_;
          fStack_938 = fStack_ad8 + local_3a0._8_4_;
          fStack_934 = fStack_ad4 + local_3a0._12_4_;
          fStack_930 = fStack_ad0 + local_3a0._16_4_;
          fStack_92c = fStack_acc + local_3a0._20_4_;
          fStack_928 = fStack_ac8 + local_3a0._24_4_;
          fStack_924 = fStack_ac4 + local_3a0._28_4_;
          _local_a40 = local_3a0;
          do {
            auVar154._8_4_ = 0x7f800000;
            auVar154._0_8_ = 0x7f8000007f800000;
            auVar154._12_4_ = 0x7f800000;
            auVar154._16_4_ = 0x7f800000;
            auVar154._20_4_ = 0x7f800000;
            auVar154._24_4_ = 0x7f800000;
            auVar154._28_4_ = 0x7f800000;
            auVar193 = vblendvps_avx(auVar154,_local_a40,auVar141);
            auVar33 = vshufps_avx(auVar193,auVar193,0xb1);
            auVar33 = vminps_avx(auVar193,auVar33);
            auVar34 = vshufpd_avx(auVar33,auVar33,5);
            auVar33 = vminps_avx(auVar33,auVar34);
            auVar34 = vperm2f128_avx(auVar33,auVar33,1);
            auVar33 = vminps_avx(auVar33,auVar34);
            auVar33 = vcmpps_avx(auVar193,auVar33,0);
            auVar34 = auVar141 & auVar33;
            auVar193 = auVar141;
            if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar34 >> 0x7f,0) != '\0') ||
                  (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar34 >> 0xbf,0) != '\0') ||
                (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar34[0x1f] < '\0') {
              auVar193 = vandps_avx(auVar33,auVar141);
            }
            uVar121 = vmovmskps_avx(auVar193);
            uVar124 = 0;
            if (uVar121 != 0) {
              for (; (uVar121 >> uVar124 & 1) == 0; uVar124 = uVar124 + 1) {
              }
            }
            uVar122 = (ulong)uVar124;
            local_760 = auVar141;
            *(undefined4 *)(local_760 + uVar122 * 4) = 0;
            fVar168 = local_1c0[uVar122];
            uVar124 = *(uint *)(local_380 + uVar122 * 4);
            fVar250 = auVar38._0_4_;
            if ((float)local_a60._0_4_ < 0.0) {
              fVar250 = sqrtf((float)local_a60._0_4_);
            }
            auVar205 = vminps_avx(_local_b40,_local_b60);
            auVar239 = vmaxps_avx(_local_b40,_local_b60);
            auVar138 = vminps_avx(_local_b50,_local_b70);
            auVar177 = vminps_avx(auVar205,auVar138);
            auVar205 = vmaxps_avx(_local_b50,_local_b70);
            auVar138 = vmaxps_avx(auVar239,auVar205);
            auVar236._8_4_ = 0x7fffffff;
            auVar236._0_8_ = 0x7fffffff7fffffff;
            auVar236._12_4_ = 0x7fffffff;
            auVar239 = vandps_avx(auVar177,auVar236);
            auVar205 = vandps_avx(auVar138,auVar236);
            auVar239 = vmaxps_avx(auVar239,auVar205);
            auVar205 = vmovshdup_avx(auVar239);
            auVar205 = vmaxss_avx(auVar205,auVar239);
            auVar239 = vshufpd_avx(auVar239,auVar239,1);
            auVar239 = vmaxss_avx(auVar239,auVar205);
            local_ac0._0_4_ = auVar239._0_4_ * 1.9073486e-06;
            local_9c0._0_4_ = fVar250 * 1.9073486e-06;
            local_8a0._0_16_ = vshufps_avx(auVar138,auVar138,0xff);
            auVar239 = vinsertps_avx(ZEXT416(uVar124),ZEXT416((uint)fVar168),0x10);
            auVar396 = ZEXT1664(auVar239);
            lVar127 = 5;
            do {
              auVar389 = auVar396._0_16_;
              auVar239 = vmovshdup_avx(auVar389);
              fVar168 = auVar239._0_4_;
              fVar198 = 1.0 - fVar168;
              fVar250 = fVar198 * fVar198 * fVar198;
              fVar196 = fVar168 * fVar168 * fVar168;
              fVar227 = fVar168 * fVar198;
              auVar239 = vshufps_avx(ZEXT416((uint)(fVar196 * 0.16666667)),
                                     ZEXT416((uint)(fVar196 * 0.16666667)),0);
              auVar205 = ZEXT416((uint)((fVar196 * 4.0 + fVar250 +
                                        fVar168 * fVar227 * 12.0 + fVar198 * fVar227 * 6.0) *
                                       0.16666667));
              auVar205 = vshufps_avx(auVar205,auVar205,0);
              auVar138 = ZEXT416((uint)((fVar250 * 4.0 + fVar196 +
                                        fVar198 * fVar227 * 12.0 + fVar168 * fVar227 * 6.0) *
                                       0.16666667));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar177 = vshufps_avx(auVar389,auVar389,0);
              auVar206._0_4_ = auVar177._0_4_ * (float)local_a50._0_4_ + 0.0;
              auVar206._4_4_ = auVar177._4_4_ * (float)local_a50._4_4_ + 0.0;
              auVar206._8_4_ = auVar177._8_4_ * fStack_a48 + 0.0;
              auVar206._12_4_ = auVar177._12_4_ * fStack_a44 + 0.0;
              auVar177 = vshufps_avx(ZEXT416((uint)(fVar250 * 0.16666667)),
                                     ZEXT416((uint)(fVar250 * 0.16666667)),0);
              auVar136._0_4_ =
                   auVar177._0_4_ * (float)local_b40._0_4_ +
                   auVar138._0_4_ * (float)local_b60._0_4_ +
                   auVar239._0_4_ * (float)local_b70._0_4_ + auVar205._0_4_ * (float)local_b50._0_4_
              ;
              auVar136._4_4_ =
                   auVar177._4_4_ * (float)local_b40._4_4_ +
                   auVar138._4_4_ * (float)local_b60._4_4_ +
                   auVar239._4_4_ * (float)local_b70._4_4_ + auVar205._4_4_ * (float)local_b50._4_4_
              ;
              auVar136._8_4_ =
                   auVar177._8_4_ * fStack_b38 +
                   auVar138._8_4_ * fStack_b58 +
                   auVar239._8_4_ * fStack_b68 + auVar205._8_4_ * fStack_b48;
              auVar136._12_4_ =
                   auVar177._12_4_ * fStack_b34 +
                   auVar138._12_4_ * fStack_b54 +
                   auVar239._12_4_ * fStack_b64 + auVar205._12_4_ * fStack_b44;
              local_a00._0_16_ = auVar136;
              auVar239 = vsubps_avx(auVar206,auVar136);
              local_9e0 = auVar239._0_4_;
              fStack_9dc = auVar239._4_4_;
              fStack_9d8 = auVar239._8_4_;
              fStack_9d4 = auVar239._12_4_;
              auVar239 = vdpps_avx(auVar239,auVar239,0x7f);
              fVar250 = auVar239._0_4_;
              local_ce0 = auVar396._0_4_;
              if (fVar250 < 0.0) {
                fVar196 = sqrtf(fVar250);
              }
              else {
                auVar205 = vsqrtss_avx(auVar239,auVar239);
                fVar196 = auVar205._0_4_;
              }
              auVar205 = ZEXT416((uint)(fVar168 * fVar168 * 0.5));
              auVar205 = vshufps_avx(auVar205,auVar205,0);
              auVar138 = ZEXT416((uint)((fVar198 * fVar198 + fVar227 * 4.0) * 0.5));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar177 = ZEXT416((uint)((fVar168 * -fVar168 - fVar227 * 4.0) * 0.5));
              auVar177 = vshufps_avx(auVar177,auVar177,0);
              auVar137 = ZEXT416((uint)(fVar198 * -fVar198 * 0.5));
              auVar137 = vshufps_avx(auVar137,auVar137,0);
              auVar358._0_4_ =
                   (float)local_b40._0_4_ * auVar137._0_4_ +
                   (float)local_b60._0_4_ * auVar177._0_4_ +
                   (float)local_b70._0_4_ * auVar205._0_4_ + (float)local_b50._0_4_ * auVar138._0_4_
              ;
              auVar358._4_4_ =
                   (float)local_b40._4_4_ * auVar137._4_4_ +
                   (float)local_b60._4_4_ * auVar177._4_4_ +
                   (float)local_b70._4_4_ * auVar205._4_4_ + (float)local_b50._4_4_ * auVar138._4_4_
              ;
              auVar358._8_4_ =
                   fStack_b38 * auVar137._8_4_ +
                   fStack_b58 * auVar177._8_4_ +
                   fStack_b68 * auVar205._8_4_ + fStack_b48 * auVar138._8_4_;
              auVar358._12_4_ =
                   fStack_b34 * auVar137._12_4_ +
                   fStack_b54 * auVar177._12_4_ +
                   fStack_b64 * auVar205._12_4_ + fStack_b44 * auVar138._12_4_;
              auVar205 = vshufps_avx(auVar389,auVar389,0x55);
              auVar138 = ZEXT416((uint)(fVar198 - (fVar168 + fVar168)));
              auVar177 = vshufps_avx(auVar138,auVar138,0);
              auVar138 = ZEXT416((uint)(fVar168 - (fVar198 + fVar198)));
              auVar137 = vshufps_avx(auVar138,auVar138,0);
              auVar11 = vshufps_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar198),0);
              auVar138 = vdpps_avx(auVar358,auVar358,0x7f);
              auVar178._0_4_ =
                   (float)local_b40._0_4_ * auVar11._0_4_ +
                   (float)local_b60._0_4_ * auVar137._0_4_ +
                   (float)local_b70._0_4_ * auVar205._0_4_ + (float)local_b50._0_4_ * auVar177._0_4_
              ;
              auVar178._4_4_ =
                   (float)local_b40._4_4_ * auVar11._4_4_ +
                   (float)local_b60._4_4_ * auVar137._4_4_ +
                   (float)local_b70._4_4_ * auVar205._4_4_ + (float)local_b50._4_4_ * auVar177._4_4_
              ;
              auVar178._8_4_ =
                   fStack_b38 * auVar11._8_4_ +
                   fStack_b58 * auVar137._8_4_ +
                   fStack_b68 * auVar205._8_4_ + fStack_b48 * auVar177._8_4_;
              auVar178._12_4_ =
                   fStack_b34 * auVar11._12_4_ +
                   fStack_b54 * auVar137._12_4_ +
                   fStack_b64 * auVar205._12_4_ + fStack_b44 * auVar177._12_4_;
              auVar205 = vblendps_avx(auVar138,_DAT_01f7aa10,0xe);
              auVar177 = vrsqrtss_avx(auVar205,auVar205);
              fVar227 = auVar177._0_4_;
              fVar168 = auVar138._0_4_;
              auVar177 = vdpps_avx(auVar358,auVar178,0x7f);
              auVar137 = vshufps_avx(auVar138,auVar138,0);
              auVar179._0_4_ = auVar178._0_4_ * auVar137._0_4_;
              auVar179._4_4_ = auVar178._4_4_ * auVar137._4_4_;
              auVar179._8_4_ = auVar178._8_4_ * auVar137._8_4_;
              auVar179._12_4_ = auVar178._12_4_ * auVar137._12_4_;
              auVar177 = vshufps_avx(auVar177,auVar177,0);
              auVar262._0_4_ = auVar358._0_4_ * auVar177._0_4_;
              auVar262._4_4_ = auVar358._4_4_ * auVar177._4_4_;
              auVar262._8_4_ = auVar358._8_4_ * auVar177._8_4_;
              auVar262._12_4_ = auVar358._12_4_ * auVar177._12_4_;
              auVar11 = vsubps_avx(auVar179,auVar262);
              auVar177 = vrcpss_avx(auVar205,auVar205);
              auVar205 = vmaxss_avx(ZEXT416((uint)local_ac0._0_4_),
                                    ZEXT416((uint)(local_ce0 * (float)local_9c0._0_4_)));
              auVar410 = ZEXT1664(auVar205);
              auVar177 = ZEXT416((uint)(auVar177._0_4_ * (2.0 - fVar168 * auVar177._0_4_)));
              auVar177 = vshufps_avx(auVar177,auVar177,0);
              uVar122 = CONCAT44(auVar358._4_4_,auVar358._0_4_);
              auVar281._0_8_ = uVar122 ^ 0x8000000080000000;
              auVar281._8_4_ = -auVar358._8_4_;
              auVar281._12_4_ = -auVar358._12_4_;
              auVar137 = ZEXT416((uint)(fVar227 * 1.5 + fVar168 * -0.5 * fVar227 * fVar227 * fVar227
                                       ));
              auVar137 = vshufps_avx(auVar137,auVar137,0);
              auVar237._0_4_ = auVar137._0_4_ * auVar11._0_4_ * auVar177._0_4_;
              auVar237._4_4_ = auVar137._4_4_ * auVar11._4_4_ * auVar177._4_4_;
              auVar237._8_4_ = auVar137._8_4_ * auVar11._8_4_ * auVar177._8_4_;
              auVar237._12_4_ = auVar137._12_4_ * auVar11._12_4_ * auVar177._12_4_;
              auVar303._0_4_ = auVar358._0_4_ * auVar137._0_4_;
              auVar303._4_4_ = auVar358._4_4_ * auVar137._4_4_;
              auVar303._8_4_ = auVar358._8_4_ * auVar137._8_4_;
              auVar303._12_4_ = auVar358._12_4_ * auVar137._12_4_;
              if (fVar168 < 0.0) {
                local_a80._0_16_ = auVar237;
                fVar168 = sqrtf(fVar168);
                auVar410 = ZEXT464(auVar205._0_4_);
                auVar237 = local_a80._0_16_;
              }
              else {
                auVar138 = vsqrtss_avx(auVar138,auVar138);
                fVar168 = auVar138._0_4_;
              }
              auVar116._4_4_ = fStack_9dc;
              auVar116._0_4_ = local_9e0;
              auVar116._8_4_ = fStack_9d8;
              auVar116._12_4_ = fStack_9d4;
              auVar138 = vdpps_avx(auVar116,auVar303,0x7f);
              fVar168 = ((float)local_ac0._0_4_ / fVar168) * (fVar196 + 1.0) +
                        auVar410._0_4_ + fVar196 * (float)local_ac0._0_4_;
              auVar177 = vdpps_avx(auVar281,auVar303,0x7f);
              auVar137 = vdpps_avx(auVar116,auVar237,0x7f);
              auVar11 = vdpps_avx(_local_a50,auVar303,0x7f);
              auVar12 = vdpps_avx(auVar116,auVar281,0x7f);
              fVar196 = auVar177._0_4_ + auVar137._0_4_;
              fVar227 = auVar138._0_4_;
              auVar139._0_4_ = fVar227 * fVar227;
              auVar139._4_4_ = auVar138._4_4_ * auVar138._4_4_;
              auVar139._8_4_ = auVar138._8_4_ * auVar138._8_4_;
              auVar139._12_4_ = auVar138._12_4_ * auVar138._12_4_;
              auVar137 = vsubps_avx(auVar239,auVar139);
              auVar177 = vdpps_avx(auVar116,_local_a50,0x7f);
              fVar198 = auVar12._0_4_ - fVar227 * fVar196;
              fVar251 = auVar177._0_4_ - fVar227 * auVar11._0_4_;
              auVar177 = vrsqrtss_avx(auVar137,auVar137);
              fVar163 = auVar137._0_4_;
              fVar227 = auVar177._0_4_;
              fVar227 = fVar227 * 1.5 + fVar163 * -0.5 * fVar227 * fVar227 * fVar227;
              if (fVar163 < 0.0) {
                local_a80._0_16_ = ZEXT416((uint)fVar196);
                local_860._0_4_ = fVar198;
                local_880._0_4_ = fVar251;
                local_a20._0_4_ = fVar227;
                fVar163 = sqrtf(fVar163);
                auVar410 = ZEXT464(auVar205._0_4_);
                fVar227 = (float)local_a20._0_4_;
                fVar198 = (float)local_860._0_4_;
                fVar251 = (float)local_880._0_4_;
                auVar205 = local_a80._0_16_;
              }
              else {
                auVar205 = vsqrtss_avx(auVar137,auVar137);
                fVar163 = auVar205._0_4_;
                auVar205 = ZEXT416((uint)fVar196);
              }
              auVar435 = ZEXT1664(auVar138);
              auVar426 = ZEXT464((uint)fVar168);
              auVar140 = vpermilps_avx(local_a00._0_16_,0xff);
              auVar12 = vshufps_avx(auVar358,auVar358,0xff);
              fVar198 = fVar198 * fVar227 - auVar12._0_4_;
              auVar263._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
              auVar263._8_4_ = auVar11._8_4_ ^ 0x80000000;
              auVar263._12_4_ = auVar11._12_4_ ^ 0x80000000;
              auVar282._0_4_ = -fVar198;
              auVar282._4_4_ = 0x80000000;
              auVar282._8_4_ = 0x80000000;
              auVar282._12_4_ = 0x80000000;
              auVar290 = ZEXT1664(auVar282);
              fVar196 = auVar205._0_4_ * fVar251 * fVar227;
              auVar313 = ZEXT464((uint)fVar196);
              auVar177 = vinsertps_avx(auVar282,ZEXT416((uint)(fVar251 * fVar227)),0x1c);
              auVar137 = vmovsldup_avx(ZEXT416((uint)(fVar196 - auVar11._0_4_ * fVar198)));
              auVar177 = vdivps_avx(auVar177,auVar137);
              auVar205 = vinsertps_avx(auVar205,auVar263,0x10);
              auVar205 = vdivps_avx(auVar205,auVar137);
              auVar137 = vmovsldup_avx(auVar138);
              auVar140 = ZEXT416((uint)(fVar163 - auVar140._0_4_));
              auVar11 = vmovsldup_avx(auVar140);
              auVar207._0_4_ = auVar137._0_4_ * auVar177._0_4_ + auVar11._0_4_ * auVar205._0_4_;
              auVar207._4_4_ = auVar137._4_4_ * auVar177._4_4_ + auVar11._4_4_ * auVar205._4_4_;
              auVar207._8_4_ = auVar137._8_4_ * auVar177._8_4_ + auVar11._8_4_ * auVar205._8_4_;
              auVar207._12_4_ = auVar137._12_4_ * auVar177._12_4_ + auVar11._12_4_ * auVar205._12_4_
              ;
              auVar177 = vsubps_avx(auVar389,auVar207);
              auVar396 = ZEXT1664(auVar177);
              auVar208._8_4_ = 0x7fffffff;
              auVar208._0_8_ = 0x7fffffff7fffffff;
              auVar208._12_4_ = 0x7fffffff;
              auVar205 = vandps_avx(auVar138,auVar208);
              if (auVar205._0_4_ < fVar168) {
                auVar238._8_4_ = 0x7fffffff;
                auVar238._0_8_ = 0x7fffffff7fffffff;
                auVar238._12_4_ = 0x7fffffff;
                auVar205 = vandps_avx(auVar140,auVar238);
                if (auVar205._0_4_ <
                    (float)local_8a0._0_4_ * 1.9073486e-06 + auVar410._0_4_ + fVar168) {
                  fVar196 = auVar177._0_4_ + (float)local_9a0._0_4_;
                  if (fVar196 < fVar228) break;
                  fVar227 = *(float *)(ray + k * 4 + 0x100);
                  auVar313 = ZEXT464((uint)fVar227);
                  if (fVar227 < fVar196) break;
                  auVar205 = vmovshdup_avx(auVar177);
                  fVar198 = auVar205._0_4_;
                  if ((fVar198 < 0.0) || (1.0 < fVar198)) break;
                  auVar239 = vrsqrtss_avx(auVar239,auVar239);
                  fVar251 = auVar239._0_4_;
                  auVar290 = ZEXT464((uint)(fVar250 * -0.5));
                  pGVar27 = (context->scene->geometries).items[uVar120].ptr;
                  if ((pGVar27->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  auVar239 = ZEXT416((uint)(fVar251 * 1.5 +
                                           fVar250 * -0.5 * fVar251 * fVar251 * fVar251));
                  auVar239 = vshufps_avx(auVar239,auVar239,0);
                  auVar240._0_4_ = auVar239._0_4_ * local_9e0;
                  auVar240._4_4_ = auVar239._4_4_ * fStack_9dc;
                  auVar240._8_4_ = auVar239._8_4_ * fStack_9d8;
                  auVar240._12_4_ = auVar239._12_4_ * fStack_9d4;
                  auVar180._0_4_ = auVar358._0_4_ + auVar12._0_4_ * auVar240._0_4_;
                  auVar180._4_4_ = auVar358._4_4_ + auVar12._4_4_ * auVar240._4_4_;
                  auVar180._8_4_ = auVar358._8_4_ + auVar12._8_4_ * auVar240._8_4_;
                  auVar180._12_4_ = auVar358._12_4_ + auVar12._12_4_ * auVar240._12_4_;
                  auVar239 = vshufps_avx(auVar240,auVar240,0xc9);
                  auVar205 = vshufps_avx(auVar358,auVar358,0xc9);
                  auVar241._0_4_ = auVar205._0_4_ * auVar240._0_4_;
                  auVar241._4_4_ = auVar205._4_4_ * auVar240._4_4_;
                  auVar241._8_4_ = auVar205._8_4_ * auVar240._8_4_;
                  auVar241._12_4_ = auVar205._12_4_ * auVar240._12_4_;
                  auVar264._0_4_ = auVar358._0_4_ * auVar239._0_4_;
                  auVar264._4_4_ = auVar358._4_4_ * auVar239._4_4_;
                  auVar264._8_4_ = auVar358._8_4_ * auVar239._8_4_;
                  auVar264._12_4_ = auVar358._12_4_ * auVar239._12_4_;
                  auVar389 = vsubps_avx(auVar264,auVar241);
                  auVar239 = vshufps_avx(auVar389,auVar389,0xc9);
                  auVar205 = vshufps_avx(auVar180,auVar180,0xc9);
                  auVar290 = ZEXT1664(auVar205);
                  auVar265._0_4_ = auVar205._0_4_ * auVar239._0_4_;
                  auVar265._4_4_ = auVar205._4_4_ * auVar239._4_4_;
                  auVar265._8_4_ = auVar205._8_4_ * auVar239._8_4_;
                  auVar265._12_4_ = auVar205._12_4_ * auVar239._12_4_;
                  auVar239 = vshufps_avx(auVar389,auVar389,0xd2);
                  auVar181._0_4_ = auVar180._0_4_ * auVar239._0_4_;
                  auVar181._4_4_ = auVar180._4_4_ * auVar239._4_4_;
                  auVar181._8_4_ = auVar180._8_4_ * auVar239._8_4_;
                  auVar181._12_4_ = auVar180._12_4_ * auVar239._12_4_;
                  auVar239 = vsubps_avx(auVar265,auVar181);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar27->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar196;
                    uVar8 = vextractps_avx(auVar239,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                    uVar8 = vextractps_avx(auVar239,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                    *(int *)(ray + k * 4 + 0x1c0) = auVar239._0_4_;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar198;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_a88;
                    *(uint *)(ray + k * 4 + 0x240) = uVar120;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar31 = context->user;
                  auStack_690 = vshufps_avx(auVar177,auVar177,0x55);
                  auStack_6f0 = vshufps_avx(auVar239,auVar239,0x55);
                  auStack_6d0 = vshufps_avx(auVar239,auVar239,0xaa);
                  auStack_6b0 = vshufps_avx(auVar239,auVar239,0);
                  local_700 = (RTCHitN  [16])auStack_6f0;
                  local_6e0 = auStack_6d0;
                  local_6c0 = auStack_6b0;
                  local_6a0 = auStack_690;
                  local_680 = ZEXT832(0) << 0x20;
                  local_660 = local_580._0_8_;
                  uStack_658 = local_580._8_8_;
                  uStack_650 = local_580._16_8_;
                  uStack_648 = local_580._24_8_;
                  local_640 = local_560._0_8_;
                  uStack_638 = local_560._8_8_;
                  uStack_630 = local_560._16_8_;
                  uStack_628 = local_560._24_8_;
                  *(undefined8 *)(local_a90 + 8) = local_b00._0_8_;
                  *(undefined8 *)(local_a90 + 10) = local_b00._8_8_;
                  *(undefined8 *)(local_a90 + 0xc) = local_b00._16_8_;
                  *(undefined8 *)(local_a90 + 0xe) = local_b00._24_8_;
                  *(undefined8 *)local_a90 = local_b00._0_8_;
                  *(undefined8 *)(local_a90 + 2) = local_b00._8_8_;
                  *(undefined8 *)(local_a90 + 4) = local_b00._16_8_;
                  *(undefined8 *)(local_a90 + 6) = local_b00._24_8_;
                  local_620 = pRVar31->instID[0];
                  uStack_61c = local_620;
                  uStack_618 = local_620;
                  uStack_614 = local_620;
                  uStack_610 = local_620;
                  uStack_60c = local_620;
                  uStack_608 = local_620;
                  uStack_604 = local_620;
                  local_600 = pRVar31->instPrimID[0];
                  uStack_5fc = local_600;
                  uStack_5f8 = local_600;
                  uStack_5f4 = local_600;
                  uStack_5f0 = local_600;
                  uStack_5ec = local_600;
                  uStack_5e8 = local_600;
                  uStack_5e4 = local_600;
                  *(float *)(ray + k * 4 + 0x100) = fVar196;
                  local_ba0 = *local_a98;
                  local_b90 = *local_aa0;
                  local_b30.valid = (int *)local_ba0;
                  local_b30.geometryUserPtr = pGVar27->userPtr;
                  local_b30.context = context->user;
                  local_b30.hit = local_700;
                  local_b30.N = 8;
                  local_b30.ray = (RTCRayN *)ray;
                  if (pGVar27->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar290 = ZEXT1664(auVar205);
                    auVar396 = ZEXT1664(auVar177);
                    auVar410 = ZEXT1664(auVar410._0_16_);
                    auVar426 = ZEXT464((uint)fVar168);
                    auVar435 = ZEXT1664(auVar138);
                    (*pGVar27->intersectionFilterN)(&local_b30);
                  }
                  auVar239 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                  auVar205 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                  auVar223._16_16_ = auVar205;
                  auVar223._0_16_ = auVar239;
                  auVar141 = local_b00 & ~auVar223;
                  if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar141 >> 0x7f,0) != '\0') ||
                        (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar141 >> 0xbf,0) != '\0') ||
                      (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar141[0x1f] < '\0') {
                    p_Var32 = context->args->filter;
                    if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar27->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar290 = ZEXT1664(auVar290._0_16_);
                      auVar396 = ZEXT1664(auVar396._0_16_);
                      auVar410 = ZEXT1664(auVar410._0_16_);
                      auVar426 = ZEXT1664(auVar426._0_16_);
                      auVar435 = ZEXT1664(auVar435._0_16_);
                      (*p_Var32)(&local_b30);
                    }
                    auVar313 = ZEXT464((uint)fVar227);
                    auVar239 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                    auVar205 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                    auVar155._16_16_ = auVar205;
                    auVar155._0_16_ = auVar239;
                    auVar141 = local_b00 & ~auVar155;
                    if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar141 >> 0x7f,0) != '\0') ||
                          (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar141 >> 0xbf,0) != '\0') ||
                        (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar141[0x1f] < '\0') {
                      auVar156._0_4_ = auVar239._0_4_ ^ local_b00._0_4_;
                      auVar156._4_4_ = auVar239._4_4_ ^ local_b00._4_4_;
                      auVar156._8_4_ = auVar239._8_4_ ^ local_b00._8_4_;
                      auVar156._12_4_ = auVar239._12_4_ ^ local_b00._12_4_;
                      auVar156._16_4_ = auVar205._0_4_ ^ local_b00._16_4_;
                      auVar156._20_4_ = auVar205._4_4_ ^ local_b00._20_4_;
                      auVar156._24_4_ = auVar205._8_4_ ^ local_b00._24_4_;
                      auVar156._28_4_ = auVar205._12_4_ ^ local_b00._28_4_;
                      auVar141 = vmaskmovps_avx(auVar156,*(undefined1 (*) [32])local_b30.hit);
                      *(undefined1 (*) [32])(local_b30.ray + 0x180) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar156,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0x20));
                      *(undefined1 (*) [32])(local_b30.ray + 0x1a0) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar156,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0x40));
                      *(undefined1 (*) [32])(local_b30.ray + 0x1c0) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar156,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0x60));
                      *(undefined1 (*) [32])(local_b30.ray + 0x1e0) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar156,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0x80));
                      *(undefined1 (*) [32])(local_b30.ray + 0x200) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar156,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0xa0));
                      *(undefined1 (*) [32])(local_b30.ray + 0x220) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar156,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0xc0));
                      *(undefined1 (*) [32])(local_b30.ray + 0x240) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar156,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0xe0));
                      *(undefined1 (*) [32])(local_b30.ray + 0x260) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar156,*(undefined1 (*) [32])
                                                          (local_b30.hit + 0x100));
                      *(undefined1 (*) [32])(local_b30.ray + 0x280) = auVar141;
                      break;
                    }
                  }
                  auVar313 = ZEXT464((uint)fVar227);
                  *(float *)(ray + k * 4 + 0x100) = fVar227;
                  break;
                }
              }
              lVar127 = lVar127 + -1;
            } while (lVar127 != 0);
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar150._4_4_ = uVar8;
            auVar150._0_4_ = uVar8;
            auVar150._8_4_ = uVar8;
            auVar150._12_4_ = uVar8;
            auVar150._16_4_ = uVar8;
            auVar150._20_4_ = uVar8;
            auVar150._24_4_ = uVar8;
            auVar150._28_4_ = uVar8;
            auVar193 = vcmpps_avx(_local_940,auVar150,2);
            auVar141 = vandps_avx(auVar193,local_760);
            auVar193 = local_760 & auVar193;
            local_760 = auVar141;
          } while ((((((((auVar193 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar193 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar193 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar193 >> 0x7f,0) != '\0') ||
                     (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar193 >> 0xbf,0) != '\0') ||
                   (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar193[0x1f] < '\0');
        }
        auVar141 = vandps_avx(local_7a0,local_780);
        auVar193 = vandps_avx(_local_980,_local_960);
        auVar342 = ZEXT3264(_local_ae0);
        auVar268._0_4_ = local_ae0._0_4_ + local_3e0._0_4_;
        auVar268._4_4_ = local_ae0._4_4_ + local_3e0._4_4_;
        auVar268._8_4_ = local_ae0._8_4_ + local_3e0._8_4_;
        auVar268._12_4_ = local_ae0._12_4_ + local_3e0._12_4_;
        auVar268._16_4_ = local_ae0._16_4_ + local_3e0._16_4_;
        auVar268._20_4_ = local_ae0._20_4_ + local_3e0._20_4_;
        auVar268._24_4_ = local_ae0._24_4_ + local_3e0._24_4_;
        auVar268._28_4_ = local_ae0._28_4_ + local_3e0._28_4_;
        auVar33 = vcmpps_avx(auVar268,auVar150,2);
        auVar141 = vandps_avx(auVar33,auVar141);
        auVar269._0_4_ = local_3a0._0_4_ + local_ae0._0_4_;
        auVar269._4_4_ = local_3a0._4_4_ + local_ae0._4_4_;
        auVar269._8_4_ = local_3a0._8_4_ + local_ae0._8_4_;
        auVar269._12_4_ = local_3a0._12_4_ + local_ae0._12_4_;
        auVar269._16_4_ = local_3a0._16_4_ + local_ae0._16_4_;
        auVar269._20_4_ = local_3a0._20_4_ + local_ae0._20_4_;
        auVar269._24_4_ = local_3a0._24_4_ + local_ae0._24_4_;
        auVar269._28_4_ = local_3a0._28_4_ + local_ae0._28_4_;
        auVar33 = vcmpps_avx(auVar269,auVar150,2);
        auVar193 = vandps_avx(auVar33,auVar193);
        auVar193 = vorps_avx(auVar141,auVar193);
        if ((((((((auVar193 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar193 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar193 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar193 >> 0x7f,0) != '\0') ||
              (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar193 >> 0xbf,0) != '\0') ||
            (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar193[0x1f] < '\0') {
          uVar122 = (ulong)uVar130;
          *(undefined1 (*) [32])(auStack_180 + uVar122 * 0x60) = auVar193;
          auVar141 = vblendvps_avx(local_3a0,_local_3e0,auVar141);
          *(undefined1 (*) [32])(auStack_160 + uVar122 * 0x60) = auVar141;
          uVar9 = vmovlps_avx(local_710);
          (&uStack_140)[uVar122 * 0xc] = uVar9;
          aiStack_138[uVar122 * 0x18] = uVar126 + 1;
          uVar130 = uVar130 + 1;
        }
        goto LAB_011477d7;
      }
    }
    if (uVar130 == 0) break;
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar147._4_4_ = uVar8;
    auVar147._0_4_ = uVar8;
    auVar147._8_4_ = uVar8;
    auVar147._12_4_ = uVar8;
    auVar147._16_4_ = uVar8;
    auVar147._20_4_ = uVar8;
    auVar147._24_4_ = uVar8;
    auVar147._28_4_ = uVar8;
    uVar124 = -uVar130;
    pauVar123 = (undefined1 (*) [32])(auStack_180 + (ulong)(uVar130 - 1) * 0x60);
    fVar168 = (float)local_ae0._0_4_;
    fVar250 = (float)local_ae0._4_4_;
    fVar196 = fStack_ad8;
    fVar227 = fStack_ad4;
    fVar198 = fStack_ad0;
    fVar251 = fStack_acc;
    fVar163 = fStack_ac8;
    fVar252 = fStack_ac4;
    while( true ) {
      auVar141 = pauVar123[1];
      auVar186._0_4_ = fVar168 + auVar141._0_4_;
      auVar186._4_4_ = fVar250 + auVar141._4_4_;
      auVar186._8_4_ = fVar196 + auVar141._8_4_;
      auVar186._12_4_ = fVar227 + auVar141._12_4_;
      auVar186._16_4_ = fVar198 + auVar141._16_4_;
      auVar186._20_4_ = fVar251 + auVar141._20_4_;
      auVar186._24_4_ = fVar163 + auVar141._24_4_;
      auVar186._28_4_ = fVar252 + auVar141._28_4_;
      auVar33 = vcmpps_avx(auVar186,auVar147,2);
      auVar193 = vandps_avx(auVar33,*pauVar123);
      _local_700 = auVar193;
      auVar33 = *pauVar123 & auVar33;
      if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar33 >> 0x7f,0) != '\0') ||
            (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar33 >> 0xbf,0) != '\0') ||
          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar33[0x1f] < '\0') break;
      pauVar123 = pauVar123 + -3;
      uVar124 = uVar124 + 1;
      fVar168 = (float)local_ae0._0_4_;
      fVar250 = (float)local_ae0._4_4_;
      fVar196 = fStack_ad8;
      fVar227 = fStack_ad4;
      fVar198 = fStack_ad0;
      fVar251 = fStack_acc;
      fVar163 = fStack_ac8;
      fVar252 = fStack_ac4;
      if (uVar124 == 0) goto LAB_011497c1;
    }
    auVar148._8_4_ = 0x7f800000;
    auVar148._0_8_ = 0x7f8000007f800000;
    auVar148._12_4_ = 0x7f800000;
    auVar148._16_4_ = 0x7f800000;
    auVar148._20_4_ = 0x7f800000;
    auVar148._24_4_ = 0x7f800000;
    auVar148._28_4_ = 0x7f800000;
    auVar141 = vblendvps_avx(auVar148,auVar141,auVar193);
    auVar33 = vshufps_avx(auVar141,auVar141,0xb1);
    auVar33 = vminps_avx(auVar141,auVar33);
    auVar34 = vshufpd_avx(auVar33,auVar33,5);
    auVar33 = vminps_avx(auVar33,auVar34);
    auVar34 = vperm2f128_avx(auVar33,auVar33,1);
    auVar33 = vminps_avx(auVar33,auVar34);
    auVar141 = vcmpps_avx(auVar141,auVar33,0);
    auVar33 = auVar193 & auVar141;
    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar33 >> 0x7f,0) != '\0') ||
          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar33 >> 0xbf,0) != '\0') ||
        (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar33[0x1f] < '\0')
    {
      auVar193 = vandps_avx(auVar141,auVar193);
    }
    auVar133._8_8_ = 0;
    auVar133._0_8_ = *(ulong *)pauVar123[2];
    uVar126 = *(uint *)(pauVar123[2] + 8);
    uVar130 = vmovmskps_avx(auVar193);
    uVar121 = 0;
    if (uVar130 != 0) {
      for (; (uVar130 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
      }
    }
    *(undefined4 *)(local_700 + (ulong)uVar121 * 4) = 0;
    *pauVar123 = _local_700;
    uVar130 = ~uVar124;
    if ((((((((_local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_700 >> 0x7f,0) != '\0') ||
          (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_700 >> 0xbf,0) != '\0') ||
        (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_700[0x1f] < '\0') {
      uVar130 = -uVar124;
    }
    auVar239 = vshufps_avx(auVar133,auVar133,0);
    auVar205 = vshufps_avx(auVar133,auVar133,0x55);
    auVar205 = vsubps_avx(auVar205,auVar239);
    local_3e0._4_4_ = auVar239._4_4_ + auVar205._4_4_ * 0.14285715;
    local_3e0._0_4_ = auVar239._0_4_ + auVar205._0_4_ * 0.0;
    fStack_3d8 = auVar239._8_4_ + auVar205._8_4_ * 0.2857143;
    fStack_3d4 = auVar239._12_4_ + auVar205._12_4_ * 0.42857146;
    fStack_3d0 = auVar239._0_4_ + auVar205._0_4_ * 0.5714286;
    fStack_3cc = auVar239._4_4_ + auVar205._4_4_ * 0.71428573;
    fStack_3c8 = auVar239._8_4_ + auVar205._8_4_ * 0.8571429;
    fStack_3c4 = auVar239._12_4_ + auVar205._12_4_;
    local_710._8_8_ = 0;
    local_710._0_8_ = *(ulong *)(local_3e0 + (ulong)uVar121 * 4);
  } while( true );
LAB_011497c1:
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar159._4_4_ = uVar8;
  auVar159._0_4_ = uVar8;
  auVar159._8_4_ = uVar8;
  auVar159._12_4_ = uVar8;
  auVar159._16_4_ = uVar8;
  auVar159._20_4_ = uVar8;
  auVar159._24_4_ = uVar8;
  auVar159._28_4_ = uVar8;
  auVar141 = vcmpps_avx(local_300,auVar159,2);
  uVar120 = vmovmskps_avx(auVar141);
  uVar120 = (uint)local_988 - 1 & (uint)local_988 & uVar120;
  if (uVar120 == 0) {
    return;
  }
  goto LAB_01146996;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }